

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [24];
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  ulong uVar143;
  long lVar144;
  ulong uVar145;
  long lVar146;
  long lVar147;
  undefined1 auVar148 [8];
  undefined4 uVar149;
  undefined8 unaff_R13;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar151;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar150;
  float fVar172;
  float fVar174;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar177;
  undefined1 auVar158 [32];
  float fVar175;
  float fVar178;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar173;
  float fVar176;
  float fVar179;
  float fVar181;
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar187;
  float fVar206;
  float fVar207;
  float fVar209;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar208;
  float fVar210;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar211;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar233 [32];
  float fVar245;
  undefined1 auVar234 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar246;
  float fVar260;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar258;
  float fVar259;
  float fVar261;
  float fVar262;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar263;
  float fVar264;
  undefined1 auVar257 [32];
  float fVar265;
  float fVar274;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  float fVar278;
  float fVar279;
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar296;
  float fVar298;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar288;
  float fVar290;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar285 [32];
  undefined1 auVar286 [64];
  float fVar302;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar330;
  float fVar331;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar351;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [16];
  float fVar366;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar367;
  float fVar378;
  float fVar379;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [64];
  float fVar387;
  float fVar392;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar393;
  float fVar394;
  float fVar401;
  float fVar403;
  float fVar404;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar402;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 uStack_858;
  undefined8 uStack_848;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  ulong local_730;
  undefined8 uStack_728;
  undefined1 *local_720;
  undefined1 (*local_718) [16];
  undefined1 (*local_710) [32];
  Precalculations *local_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_610;
  Primitive *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar303 [16];
  undefined1 auVar368 [16];
  undefined1 auVar388 [16];
  undefined1 auVar395 [16];
  
  PVar18 = prim[1];
  uVar143 = (ulong)(byte)PVar18;
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 4 + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 4 + 10)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 5 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 5 + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 6 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 6 + 10)));
  lVar144 = uVar143 * 0x25;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0xf + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0xf + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x11 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x11 + 10)));
  fVar246 = *(float *)(prim + lVar144 + 0x12);
  auVar267 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar267 = vinsertps_avx(auVar267,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar267 = vsubps_avx(auVar267,*(undefined1 (*) [16])(prim + lVar144 + 6));
  auVar352._0_4_ = fVar246 * auVar267._0_4_;
  auVar352._4_4_ = fVar246 * auVar267._4_4_;
  auVar352._8_4_ = fVar246 * auVar267._8_4_;
  auVar352._12_4_ = fVar246 * auVar267._12_4_;
  auVar361._0_4_ = fVar246 * auVar216._0_4_;
  auVar361._4_4_ = fVar246 * auVar216._4_4_;
  auVar361._8_4_ = fVar246 * auVar216._8_4_;
  auVar361._12_4_ = fVar246 * auVar216._12_4_;
  auVar268._16_16_ = auVar231;
  auVar268._0_16_ = auVar218;
  auVar251._16_16_ = auVar32;
  auVar251._0_16_ = auVar232;
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1a + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1a + 10)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1b + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1b + 10)));
  auVar163 = vcvtdq2ps_avx(auVar251);
  auVar192._16_16_ = auVar34;
  auVar192._0_16_ = auVar33;
  auVar320 = vcvtdq2ps_avx(auVar192);
  auVar280._16_16_ = auVar36;
  auVar280._0_16_ = auVar35;
  auVar221._16_16_ = auVar38;
  auVar221._0_16_ = auVar37;
  auVar26 = vcvtdq2ps_avx(auVar221);
  auVar233._16_16_ = auVar40;
  auVar233._0_16_ = auVar39;
  auVar322 = vcvtdq2ps_avx(auVar233);
  auVar304._16_16_ = auVar216;
  auVar304._0_16_ = auVar267;
  auVar317._16_16_ = auVar231;
  auVar317._0_16_ = auVar218;
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1c + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar143 * 0x1c + 10)));
  auVar380._16_16_ = auVar216;
  auVar380._0_16_ = auVar267;
  auVar267 = vshufps_avx(auVar361,auVar361,0x55);
  auVar216 = vshufps_avx(auVar361,auVar361,0xaa);
  fVar246 = auVar216._0_4_;
  fVar278 = auVar216._4_4_;
  fVar258 = auVar216._8_4_;
  fVar287 = auVar216._12_4_;
  fVar259 = auVar267._0_4_;
  fVar289 = auVar267._4_4_;
  fVar260 = auVar267._8_4_;
  fVar291 = auVar267._12_4_;
  auVar27 = vcvtdq2ps_avx(auVar268);
  auVar28 = vcvtdq2ps_avx(auVar280);
  auVar29 = vcvtdq2ps_avx(auVar304);
  auVar30 = vcvtdq2ps_avx(auVar317);
  auVar31 = vcvtdq2ps_avx(auVar380);
  auVar267 = vshufps_avx(auVar361,auVar361,0);
  fVar245 = auVar267._0_4_;
  fVar293 = auVar267._4_4_;
  fVar261 = auVar267._8_4_;
  fVar296 = auVar267._12_4_;
  auVar396._0_4_ = fVar245 * auVar27._0_4_ + fVar259 * auVar163._0_4_ + fVar246 * auVar320._0_4_;
  auVar396._4_4_ = fVar293 * auVar27._4_4_ + fVar289 * auVar163._4_4_ + fVar278 * auVar320._4_4_;
  auVar396._8_4_ = fVar261 * auVar27._8_4_ + fVar260 * auVar163._8_4_ + fVar258 * auVar320._8_4_;
  auVar396._12_4_ = fVar296 * auVar27._12_4_ + fVar291 * auVar163._12_4_ + fVar287 * auVar320._12_4_
  ;
  auVar396._16_4_ = fVar245 * auVar27._16_4_ + fVar259 * auVar163._16_4_ + fVar246 * auVar320._16_4_
  ;
  auVar396._20_4_ = fVar293 * auVar27._20_4_ + fVar289 * auVar163._20_4_ + fVar278 * auVar320._20_4_
  ;
  auVar396._24_4_ = fVar261 * auVar27._24_4_ + fVar260 * auVar163._24_4_ + fVar258 * auVar320._24_4_
  ;
  auVar396._28_4_ = fVar291 + 0.0;
  auVar389._0_4_ = fVar245 * auVar28._0_4_ + fVar259 * auVar26._0_4_ + fVar246 * auVar322._0_4_;
  auVar389._4_4_ = fVar293 * auVar28._4_4_ + fVar289 * auVar26._4_4_ + fVar278 * auVar322._4_4_;
  auVar389._8_4_ = fVar261 * auVar28._8_4_ + fVar260 * auVar26._8_4_ + fVar258 * auVar322._8_4_;
  auVar389._12_4_ = fVar296 * auVar28._12_4_ + fVar291 * auVar26._12_4_ + fVar287 * auVar322._12_4_;
  auVar389._16_4_ = fVar245 * auVar28._16_4_ + fVar259 * auVar26._16_4_ + fVar246 * auVar322._16_4_;
  auVar389._20_4_ = fVar293 * auVar28._20_4_ + fVar289 * auVar26._20_4_ + fVar278 * auVar322._20_4_;
  auVar389._24_4_ = fVar261 * auVar28._24_4_ + fVar260 * auVar26._24_4_ + fVar258 * auVar322._24_4_;
  auVar389._28_4_ = fVar291 + 0.0;
  auVar381._0_4_ = fVar245 * auVar29._0_4_ + fVar259 * auVar30._0_4_ + fVar246 * auVar31._0_4_;
  auVar381._4_4_ = fVar293 * auVar29._4_4_ + fVar289 * auVar30._4_4_ + fVar278 * auVar31._4_4_;
  auVar381._8_4_ = fVar261 * auVar29._8_4_ + fVar260 * auVar30._8_4_ + fVar258 * auVar31._8_4_;
  auVar381._12_4_ = fVar296 * auVar29._12_4_ + fVar291 * auVar30._12_4_ + fVar287 * auVar31._12_4_;
  auVar381._16_4_ = fVar245 * auVar29._16_4_ + fVar259 * auVar30._16_4_ + fVar246 * auVar31._16_4_;
  auVar381._20_4_ = fVar293 * auVar29._20_4_ + fVar289 * auVar30._20_4_ + fVar278 * auVar31._20_4_;
  auVar381._24_4_ = fVar261 * auVar29._24_4_ + fVar260 * auVar30._24_4_ + fVar258 * auVar31._24_4_;
  auVar381._28_4_ = fVar291 + fVar291 + fVar287;
  auVar267 = vshufps_avx(auVar352,auVar352,0x55);
  auVar216 = vshufps_avx(auVar352,auVar352,0xaa);
  fVar293 = auVar216._0_4_;
  fVar261 = auVar216._4_4_;
  fVar296 = auVar216._8_4_;
  fVar262 = auVar216._12_4_;
  fVar259 = auVar267._0_4_;
  fVar289 = auVar267._4_4_;
  fVar260 = auVar267._8_4_;
  fVar291 = auVar267._12_4_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar143 * 7 + 6);
  auVar267 = vpmovsxwd_avx(auVar267);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar143 * 7 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar216);
  fVar245 = auVar163._28_4_ + auVar322._28_4_;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar143 * 0xb + 6);
  auVar218 = vpmovsxwd_avx(auVar218);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar143 * 0xb + 0xe);
  auVar231 = vpmovsxwd_avx(auVar231);
  auVar232 = vshufps_avx(auVar352,auVar352,0);
  fVar246 = auVar232._0_4_;
  fVar278 = auVar232._4_4_;
  fVar258 = auVar232._8_4_;
  fVar287 = auVar232._12_4_;
  auVar193._0_4_ = auVar27._0_4_ * fVar246 + fVar259 * auVar163._0_4_ + fVar293 * auVar320._0_4_;
  auVar193._4_4_ = auVar27._4_4_ * fVar278 + fVar289 * auVar163._4_4_ + fVar261 * auVar320._4_4_;
  auVar193._8_4_ = auVar27._8_4_ * fVar258 + fVar260 * auVar163._8_4_ + fVar296 * auVar320._8_4_;
  auVar193._12_4_ = auVar27._12_4_ * fVar287 + fVar291 * auVar163._12_4_ + fVar262 * auVar320._12_4_
  ;
  auVar193._16_4_ = auVar27._16_4_ * fVar246 + fVar259 * auVar163._16_4_ + fVar293 * auVar320._16_4_
  ;
  auVar193._20_4_ = auVar27._20_4_ * fVar278 + fVar289 * auVar163._20_4_ + fVar261 * auVar320._20_4_
  ;
  auVar193._24_4_ = auVar27._24_4_ * fVar258 + fVar260 * auVar163._24_4_ + fVar296 * auVar320._24_4_
  ;
  auVar193._28_4_ = fVar291 + auVar163._28_4_ + auVar320._28_4_;
  auVar156._0_4_ = fVar246 * auVar28._0_4_ + fVar259 * auVar26._0_4_ + fVar293 * auVar322._0_4_;
  auVar156._4_4_ = fVar278 * auVar28._4_4_ + fVar289 * auVar26._4_4_ + fVar261 * auVar322._4_4_;
  auVar156._8_4_ = fVar258 * auVar28._8_4_ + fVar260 * auVar26._8_4_ + fVar296 * auVar322._8_4_;
  auVar156._12_4_ = fVar287 * auVar28._12_4_ + fVar291 * auVar26._12_4_ + fVar262 * auVar322._12_4_;
  auVar156._16_4_ = fVar246 * auVar28._16_4_ + fVar259 * auVar26._16_4_ + fVar293 * auVar322._16_4_;
  auVar156._20_4_ = fVar278 * auVar28._20_4_ + fVar289 * auVar26._20_4_ + fVar261 * auVar322._20_4_;
  auVar156._24_4_ = fVar258 * auVar28._24_4_ + fVar260 * auVar26._24_4_ + fVar296 * auVar322._24_4_;
  auVar156._28_4_ = fVar291 + fVar245;
  auVar353._8_4_ = 0x7fffffff;
  auVar353._0_8_ = 0x7fffffff7fffffff;
  auVar353._12_4_ = 0x7fffffff;
  auVar353._16_4_ = 0x7fffffff;
  auVar353._20_4_ = 0x7fffffff;
  auVar353._24_4_ = 0x7fffffff;
  auVar353._28_4_ = 0x7fffffff;
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar252._16_4_ = 0x219392ef;
  auVar252._20_4_ = 0x219392ef;
  auVar252._24_4_ = 0x219392ef;
  auVar252._28_4_ = 0x219392ef;
  auVar163 = vandps_avx(auVar396,auVar353);
  auVar163 = vcmpps_avx(auVar163,auVar252,1);
  auVar320 = vblendvps_avx(auVar396,auVar252,auVar163);
  auVar163 = vandps_avx(auVar389,auVar353);
  auVar163 = vcmpps_avx(auVar163,auVar252,1);
  auVar26 = vblendvps_avx(auVar389,auVar252,auVar163);
  auVar163 = vandps_avx(auVar381,auVar353);
  auVar163 = vcmpps_avx(auVar163,auVar252,1);
  auVar163 = vblendvps_avx(auVar381,auVar252,auVar163);
  auVar234._0_4_ = fVar246 * auVar29._0_4_ + auVar30._0_4_ * fVar259 + fVar293 * auVar31._0_4_;
  auVar234._4_4_ = fVar278 * auVar29._4_4_ + auVar30._4_4_ * fVar289 + fVar261 * auVar31._4_4_;
  auVar234._8_4_ = fVar258 * auVar29._8_4_ + auVar30._8_4_ * fVar260 + fVar296 * auVar31._8_4_;
  auVar234._12_4_ = fVar287 * auVar29._12_4_ + auVar30._12_4_ * fVar291 + fVar262 * auVar31._12_4_;
  auVar234._16_4_ = fVar246 * auVar29._16_4_ + auVar30._16_4_ * fVar259 + fVar293 * auVar31._16_4_;
  auVar234._20_4_ = fVar278 * auVar29._20_4_ + auVar30._20_4_ * fVar289 + fVar261 * auVar31._20_4_;
  auVar234._24_4_ = fVar258 * auVar29._24_4_ + auVar30._24_4_ * fVar260 + fVar296 * auVar31._24_4_;
  auVar234._28_4_ = fVar245 + fVar291 + 0.0;
  auVar322 = vrcpps_avx(auVar320);
  fVar246 = auVar322._0_4_;
  fVar258 = auVar322._4_4_;
  auVar27._4_4_ = auVar320._4_4_ * fVar258;
  auVar27._0_4_ = auVar320._0_4_ * fVar246;
  fVar259 = auVar322._8_4_;
  auVar27._8_4_ = auVar320._8_4_ * fVar259;
  fVar260 = auVar322._12_4_;
  auVar27._12_4_ = auVar320._12_4_ * fVar260;
  fVar245 = auVar322._16_4_;
  auVar27._16_4_ = auVar320._16_4_ * fVar245;
  fVar261 = auVar322._20_4_;
  auVar27._20_4_ = auVar320._20_4_ * fVar261;
  fVar262 = auVar322._24_4_;
  auVar27._24_4_ = auVar320._24_4_ * fVar262;
  auVar27._28_4_ = 0x219392ef;
  auVar390._8_4_ = 0x3f800000;
  auVar390._0_8_ = 0x3f8000003f800000;
  auVar390._12_4_ = 0x3f800000;
  auVar390._16_4_ = 0x3f800000;
  auVar390._20_4_ = 0x3f800000;
  auVar390._24_4_ = 0x3f800000;
  auVar390._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar390,auVar27);
  auVar27 = vrcpps_avx(auVar26);
  fVar246 = fVar246 + fVar246 * auVar28._0_4_;
  fVar258 = fVar258 + fVar258 * auVar28._4_4_;
  fVar259 = fVar259 + fVar259 * auVar28._8_4_;
  fVar260 = fVar260 + fVar260 * auVar28._12_4_;
  fVar245 = fVar245 + fVar245 * auVar28._16_4_;
  fVar261 = fVar261 + fVar261 * auVar28._20_4_;
  fVar262 = fVar262 + fVar262 * auVar28._24_4_;
  fVar265 = auVar27._0_4_;
  fVar272 = auVar27._4_4_;
  auVar320._4_4_ = fVar272 * auVar26._4_4_;
  auVar320._0_4_ = fVar265 * auVar26._0_4_;
  fVar273 = auVar27._8_4_;
  auVar320._8_4_ = fVar273 * auVar26._8_4_;
  fVar274 = auVar27._12_4_;
  auVar320._12_4_ = fVar274 * auVar26._12_4_;
  fVar275 = auVar27._16_4_;
  auVar320._16_4_ = fVar275 * auVar26._16_4_;
  fVar276 = auVar27._20_4_;
  auVar320._20_4_ = fVar276 * auVar26._20_4_;
  fVar277 = auVar27._24_4_;
  auVar320._24_4_ = fVar277 * auVar26._24_4_;
  auVar320._28_4_ = auVar322._28_4_;
  auVar29 = vsubps_avx(auVar390,auVar320);
  fVar265 = fVar265 + fVar265 * auVar29._0_4_;
  fVar272 = fVar272 + fVar272 * auVar29._4_4_;
  fVar273 = fVar273 + fVar273 * auVar29._8_4_;
  fVar274 = fVar274 + fVar274 * auVar29._12_4_;
  fVar275 = fVar275 + fVar275 * auVar29._16_4_;
  fVar276 = fVar276 + fVar276 * auVar29._20_4_;
  fVar277 = fVar277 + fVar277 * auVar29._24_4_;
  auVar320 = vrcpps_avx(auVar163);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar143 * 9 + 6);
  auVar232 = vpmovsxwd_avx(auVar232);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar143 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  fVar278 = auVar320._0_4_;
  fVar287 = auVar320._4_4_;
  auVar30._4_4_ = auVar163._4_4_ * fVar287;
  auVar30._0_4_ = auVar163._0_4_ * fVar278;
  fVar289 = auVar320._8_4_;
  auVar30._8_4_ = auVar163._8_4_ * fVar289;
  fVar291 = auVar320._12_4_;
  auVar30._12_4_ = auVar163._12_4_ * fVar291;
  fVar293 = auVar320._16_4_;
  auVar30._16_4_ = auVar163._16_4_ * fVar293;
  fVar296 = auVar320._20_4_;
  auVar30._20_4_ = auVar163._20_4_ * fVar296;
  fVar298 = auVar320._24_4_;
  auVar30._24_4_ = auVar163._24_4_ * fVar298;
  auVar30._28_4_ = auVar26._28_4_;
  auVar163 = vsubps_avx(auVar390,auVar30);
  fVar278 = fVar278 + fVar278 * auVar163._0_4_;
  fVar287 = fVar287 + fVar287 * auVar163._4_4_;
  fVar289 = fVar289 + fVar289 * auVar163._8_4_;
  fVar291 = fVar291 + fVar291 * auVar163._12_4_;
  fVar293 = fVar293 + fVar293 * auVar163._16_4_;
  fVar296 = fVar296 + fVar296 * auVar163._20_4_;
  fVar298 = fVar298 + fVar298 * auVar163._24_4_;
  auVar332._16_16_ = auVar216;
  auVar332._0_16_ = auVar267;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar143 * 0xd + 6);
  auVar267 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar143 * 0xd + 0xe);
  auVar216 = vpmovsxwd_avx(auVar34);
  auVar33 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar144 + 0x16)) *
                                        *(float *)(prim + lVar144 + 0x1a))),0);
  auVar163 = vcvtdq2ps_avx(auVar332);
  auVar305._16_16_ = auVar231;
  auVar305._0_16_ = auVar218;
  auVar320 = vcvtdq2ps_avx(auVar305);
  auVar320 = vsubps_avx(auVar320,auVar163);
  fVar209 = auVar33._0_4_;
  fVar264 = auVar33._4_4_;
  fVar379 = auVar33._8_4_;
  fVar366 = auVar33._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar143 * 0x12 + 6);
  auVar218 = vpmovsxwd_avx(auVar35);
  auVar306._0_4_ = auVar163._0_4_ + fVar209 * auVar320._0_4_;
  auVar306._4_4_ = auVar163._4_4_ + fVar264 * auVar320._4_4_;
  auVar306._8_4_ = auVar163._8_4_ + fVar379 * auVar320._8_4_;
  auVar306._12_4_ = auVar163._12_4_ + fVar366 * auVar320._12_4_;
  auVar306._16_4_ = auVar163._16_4_ + fVar209 * auVar320._16_4_;
  auVar306._20_4_ = auVar163._20_4_ + fVar264 * auVar320._20_4_;
  auVar306._24_4_ = auVar163._24_4_ + fVar379 * auVar320._24_4_;
  auVar306._28_4_ = auVar163._28_4_ + auVar320._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar143 * 0x12 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar36);
  auVar318._16_16_ = auVar32;
  auVar318._0_16_ = auVar232;
  auVar163 = vcvtdq2ps_avx(auVar318);
  auVar354._16_16_ = auVar216;
  auVar354._0_16_ = auVar267;
  auVar320 = vcvtdq2ps_avx(auVar354);
  auVar320 = vsubps_avx(auVar320,auVar163);
  auVar319._0_4_ = auVar163._0_4_ + auVar320._0_4_ * fVar209;
  auVar319._4_4_ = auVar163._4_4_ + auVar320._4_4_ * fVar264;
  auVar319._8_4_ = auVar163._8_4_ + auVar320._8_4_ * fVar379;
  auVar319._12_4_ = auVar163._12_4_ + auVar320._12_4_ * fVar366;
  auVar319._16_4_ = auVar163._16_4_ + auVar320._16_4_ * fVar209;
  auVar319._20_4_ = auVar163._20_4_ + auVar320._20_4_ * fVar264;
  auVar319._24_4_ = auVar163._24_4_ + auVar320._24_4_ * fVar379;
  auVar319._28_4_ = auVar163._28_4_ + auVar320._28_4_;
  auVar333._16_16_ = auVar231;
  auVar333._0_16_ = auVar218;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar143 * 0x16 + 6);
  auVar267 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar143 * 0x16 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar38);
  auVar163 = vcvtdq2ps_avx(auVar333);
  auVar355._16_16_ = auVar216;
  auVar355._0_16_ = auVar267;
  auVar320 = vcvtdq2ps_avx(auVar355);
  auVar320 = vsubps_avx(auVar320,auVar163);
  auVar334._0_4_ = auVar163._0_4_ + auVar320._0_4_ * fVar209;
  auVar334._4_4_ = auVar163._4_4_ + auVar320._4_4_ * fVar264;
  auVar334._8_4_ = auVar163._8_4_ + auVar320._8_4_ * fVar379;
  auVar334._12_4_ = auVar163._12_4_ + auVar320._12_4_ * fVar366;
  auVar334._16_4_ = auVar163._16_4_ + auVar320._16_4_ * fVar209;
  auVar334._20_4_ = auVar163._20_4_ + auVar320._20_4_ * fVar264;
  auVar334._24_4_ = auVar163._24_4_ + auVar320._24_4_ * fVar379;
  auVar334._28_4_ = auVar163._28_4_ + auVar320._28_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar143 * 0x14 + 6);
  auVar267 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar143 * 0x14 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar40);
  auVar356._16_16_ = auVar216;
  auVar356._0_16_ = auVar267;
  auVar163 = vcvtdq2ps_avx(auVar356);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar143 * 0x18 + 6);
  auVar267 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar143 * 0x18 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar9);
  auVar362._16_16_ = auVar216;
  auVar362._0_16_ = auVar267;
  auVar320 = vcvtdq2ps_avx(auVar362);
  auVar320 = vsubps_avx(auVar320,auVar163);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar143 * 0x1d + 6);
  auVar267 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar143 * 0x1d + 0xe);
  auVar216 = vpmovsxwd_avx(auVar11);
  auVar357._0_4_ = auVar163._0_4_ + auVar320._0_4_ * fVar209;
  auVar357._4_4_ = auVar163._4_4_ + auVar320._4_4_ * fVar264;
  auVar357._8_4_ = auVar163._8_4_ + auVar320._8_4_ * fVar379;
  auVar357._12_4_ = auVar163._12_4_ + auVar320._12_4_ * fVar366;
  auVar357._16_4_ = auVar163._16_4_ + auVar320._16_4_ * fVar209;
  auVar357._20_4_ = auVar163._20_4_ + auVar320._20_4_ * fVar264;
  auVar357._24_4_ = auVar163._24_4_ + auVar320._24_4_ * fVar379;
  auVar357._28_4_ = auVar163._28_4_ + auVar320._28_4_;
  auVar363._16_16_ = auVar216;
  auVar363._0_16_ = auVar267;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar143 * 0x21 + 6);
  auVar267 = vpmovsxwd_avx(auVar12);
  auVar163 = vcvtdq2ps_avx(auVar363);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar143 * 0x21 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar13);
  auVar369._16_16_ = auVar216;
  auVar369._0_16_ = auVar267;
  auVar320 = vcvtdq2ps_avx(auVar369);
  auVar320 = vsubps_avx(auVar320,auVar163);
  auVar364._0_4_ = auVar163._0_4_ + auVar320._0_4_ * fVar209;
  auVar364._4_4_ = auVar163._4_4_ + auVar320._4_4_ * fVar264;
  auVar364._8_4_ = auVar163._8_4_ + auVar320._8_4_ * fVar379;
  auVar364._12_4_ = auVar163._12_4_ + auVar320._12_4_ * fVar366;
  auVar364._16_4_ = auVar163._16_4_ + auVar320._16_4_ * fVar209;
  auVar364._20_4_ = auVar163._20_4_ + auVar320._20_4_ * fVar264;
  auVar364._24_4_ = auVar163._24_4_ + auVar320._24_4_ * fVar379;
  auVar364._28_4_ = auVar163._28_4_ + auVar320._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar143 * 0x1f + 6);
  auVar267 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar143 * 0x1f + 0xe);
  auVar216 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar143 * 0x23 + 6);
  auVar218 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar143 * 0x23 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar17);
  auVar370._16_16_ = auVar216;
  auVar370._0_16_ = auVar267;
  auVar382._16_16_ = auVar231;
  auVar382._0_16_ = auVar218;
  auVar163 = vcvtdq2ps_avx(auVar370);
  auVar320 = vcvtdq2ps_avx(auVar382);
  auVar320 = vsubps_avx(auVar320,auVar163);
  auVar371._0_4_ = auVar163._0_4_ + auVar320._0_4_ * fVar209;
  auVar371._4_4_ = auVar163._4_4_ + auVar320._4_4_ * fVar264;
  auVar371._8_4_ = auVar163._8_4_ + auVar320._8_4_ * fVar379;
  auVar371._12_4_ = auVar163._12_4_ + auVar320._12_4_ * fVar366;
  auVar371._16_4_ = auVar163._16_4_ + auVar320._16_4_ * fVar209;
  auVar371._20_4_ = auVar163._20_4_ + auVar320._20_4_ * fVar264;
  auVar371._24_4_ = auVar163._24_4_ + auVar320._24_4_ * fVar379;
  auVar371._28_4_ = auVar163._28_4_ + fVar366;
  auVar163 = vsubps_avx(auVar306,auVar193);
  auVar212._0_4_ = fVar246 * auVar163._0_4_;
  auVar212._4_4_ = fVar258 * auVar163._4_4_;
  auVar212._8_4_ = fVar259 * auVar163._8_4_;
  auVar212._12_4_ = fVar260 * auVar163._12_4_;
  auVar26._16_4_ = fVar245 * auVar163._16_4_;
  auVar26._0_16_ = auVar212;
  auVar26._20_4_ = fVar261 * auVar163._20_4_;
  auVar26._24_4_ = fVar262 * auVar163._24_4_;
  auVar26._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar319,auVar193);
  auVar247._0_4_ = fVar246 * auVar163._0_4_;
  auVar247._4_4_ = fVar258 * auVar163._4_4_;
  auVar247._8_4_ = fVar259 * auVar163._8_4_;
  auVar247._12_4_ = fVar260 * auVar163._12_4_;
  auVar31._16_4_ = fVar245 * auVar163._16_4_;
  auVar31._0_16_ = auVar247;
  auVar31._20_4_ = fVar261 * auVar163._20_4_;
  auVar31._24_4_ = fVar262 * auVar163._24_4_;
  auVar31._28_4_ = auVar322._28_4_ + auVar28._28_4_;
  auVar163 = vsubps_avx(auVar334,auVar156);
  auVar188._0_4_ = fVar265 * auVar163._0_4_;
  auVar188._4_4_ = fVar272 * auVar163._4_4_;
  auVar188._8_4_ = fVar273 * auVar163._8_4_;
  auVar188._12_4_ = fVar274 * auVar163._12_4_;
  auVar322._16_4_ = fVar275 * auVar163._16_4_;
  auVar322._0_16_ = auVar188;
  auVar322._20_4_ = fVar276 * auVar163._20_4_;
  auVar322._24_4_ = fVar277 * auVar163._24_4_;
  auVar322._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar357,auVar156);
  auVar266._0_4_ = fVar265 * auVar163._0_4_;
  auVar266._4_4_ = fVar272 * auVar163._4_4_;
  auVar266._8_4_ = fVar273 * auVar163._8_4_;
  auVar266._12_4_ = fVar274 * auVar163._12_4_;
  auVar28._16_4_ = fVar275 * auVar163._16_4_;
  auVar28._0_16_ = auVar266;
  auVar28._20_4_ = fVar276 * auVar163._20_4_;
  auVar28._24_4_ = fVar277 * auVar163._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar163 = vsubps_avx(auVar364,auVar234);
  auVar152._0_4_ = fVar278 * auVar163._0_4_;
  auVar152._4_4_ = fVar287 * auVar163._4_4_;
  auVar152._8_4_ = fVar289 * auVar163._8_4_;
  auVar152._12_4_ = fVar291 * auVar163._12_4_;
  auVar29._16_4_ = fVar293 * auVar163._16_4_;
  auVar29._0_16_ = auVar152;
  auVar29._20_4_ = fVar296 * auVar163._20_4_;
  auVar29._24_4_ = fVar298 * auVar163._24_4_;
  auVar29._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar371,auVar234);
  auVar228._0_4_ = fVar278 * auVar163._0_4_;
  auVar228._4_4_ = fVar287 * auVar163._4_4_;
  auVar228._8_4_ = fVar289 * auVar163._8_4_;
  auVar228._12_4_ = fVar291 * auVar163._12_4_;
  auVar41._16_4_ = fVar293 * auVar163._16_4_;
  auVar41._0_16_ = auVar228;
  auVar41._20_4_ = fVar296 * auVar163._20_4_;
  auVar41._24_4_ = fVar298 * auVar163._24_4_;
  auVar41._28_4_ = auVar163._28_4_;
  auVar267 = vpminsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar216 = vpminsd_avx(auVar212,auVar247);
  auVar358._16_16_ = auVar267;
  auVar358._0_16_ = auVar216;
  auVar218 = auVar28._16_16_;
  auVar325 = ZEXT1664(auVar218);
  auVar267 = vpminsd_avx(auVar322._16_16_,auVar218);
  auVar216 = vpminsd_avx(auVar188,auVar266);
  auVar365._16_16_ = auVar267;
  auVar365._0_16_ = auVar216;
  auVar163 = vmaxps_avx(auVar358,auVar365);
  auVar267 = vpminsd_avx(auVar29._16_16_,auVar41._16_16_);
  auVar216 = vpminsd_avx(auVar152,auVar228);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar397._4_4_ = uVar149;
  auVar397._0_4_ = uVar149;
  auVar397._8_4_ = uVar149;
  auVar397._12_4_ = uVar149;
  auVar397._16_4_ = uVar149;
  auVar397._20_4_ = uVar149;
  auVar397._24_4_ = uVar149;
  auVar397._28_4_ = uVar149;
  auVar383._16_16_ = auVar267;
  auVar383._0_16_ = auVar216;
  auVar320 = vmaxps_avx(auVar383,auVar397);
  auVar163 = vmaxps_avx(auVar163,auVar320);
  local_80._4_4_ = auVar163._4_4_ * 0.99999964;
  local_80._0_4_ = auVar163._0_4_ * 0.99999964;
  local_80._8_4_ = auVar163._8_4_ * 0.99999964;
  local_80._12_4_ = auVar163._12_4_ * 0.99999964;
  local_80._16_4_ = auVar163._16_4_ * 0.99999964;
  local_80._20_4_ = auVar163._20_4_ * 0.99999964;
  local_80._24_4_ = auVar163._24_4_ * 0.99999964;
  local_80._28_4_ = auVar320._28_4_;
  auVar267 = vpmaxsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar216 = vpmaxsd_avx(auVar212,auVar247);
  auVar222._16_16_ = auVar267;
  auVar222._0_16_ = auVar216;
  auVar267 = vpmaxsd_avx(auVar322._16_16_,auVar218);
  auVar216 = vpmaxsd_avx(auVar188,auVar266);
  auVar163._16_16_ = auVar267;
  auVar163._0_16_ = auVar216;
  auVar163 = vminps_avx(auVar222,auVar163);
  auVar267 = vpmaxsd_avx(auVar29._16_16_,auVar41._16_16_);
  auVar216 = vpmaxsd_avx(auVar152,auVar228);
  auVar157._16_16_ = auVar267;
  auVar157._0_16_ = auVar216;
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar223._4_4_ = uVar149;
  auVar223._0_4_ = uVar149;
  auVar223._8_4_ = uVar149;
  auVar223._12_4_ = uVar149;
  auVar223._16_4_ = uVar149;
  auVar223._20_4_ = uVar149;
  auVar223._24_4_ = uVar149;
  auVar223._28_4_ = uVar149;
  auVar320 = vminps_avx(auVar157,auVar223);
  auVar163 = vminps_avx(auVar163,auVar320);
  auVar42._4_4_ = auVar163._4_4_ * 1.0000004;
  auVar42._0_4_ = auVar163._0_4_ * 1.0000004;
  auVar42._8_4_ = auVar163._8_4_ * 1.0000004;
  auVar42._12_4_ = auVar163._12_4_ * 1.0000004;
  auVar42._16_4_ = auVar163._16_4_ * 1.0000004;
  auVar42._20_4_ = auVar163._20_4_ * 1.0000004;
  auVar42._24_4_ = auVar163._24_4_ * 1.0000004;
  auVar42._28_4_ = auVar163._28_4_;
  auVar163 = vcmpps_avx(local_80,auVar42,2);
  auVar267 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar194._16_16_ = auVar267;
  auVar194._0_16_ = auVar267;
  auVar320 = vcvtdq2ps_avx(auVar194);
  auVar320 = vcmpps_avx(_DAT_01f7b060,auVar320,1);
  auVar163 = vandps_avx(auVar163,auVar320);
  uVar149 = vmovmskps_avx(auVar163);
  uVar143 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar149);
  local_600 = mm_lookupmask_ps._16_8_;
  uStack_5f8 = mm_lookupmask_ps._24_8_;
  uStack_5f0 = mm_lookupmask_ps._16_8_;
  uStack_5e8 = mm_lookupmask_ps._24_8_;
  local_610 = pre->ray_space + k;
  local_710 = (undefined1 (*) [32])&local_180;
  uVar139 = 1 << ((byte)k & 0x1f);
  local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar139 & 0xf) << 4));
  local_720 = mm_lookupmask_ps + (long)((int)uVar139 >> 4) * 0x10;
  local_708 = pre;
  local_608 = prim;
  do {
    auVar163 = local_7e0;
    if (uVar143 == 0) {
      return;
    }
    auVar320 = auVar325._0_32_;
    lVar144 = 0;
    if (uVar143 != 0) {
      for (; (uVar143 >> lVar144 & 1) == 0; lVar144 = lVar144 + 1) {
      }
    }
    uVar141 = *(uint *)(local_608 + 2);
    uVar19 = *(uint *)(local_608 + lVar144 * 4 + 6);
    pGVar22 = (context->scene->geometries).items[CONCAT44(0,uVar141)].ptr;
    uVar145 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                              (ulong)uVar19 *
                              pGVar22[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar246 = (pGVar22->time_range).lower;
    fVar246 = pGVar22->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar246) / ((pGVar22->time_range).upper - fVar246))
    ;
    auVar267 = vroundss_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),9);
    auVar267 = vminss_avx(auVar267,ZEXT416((uint)(pGVar22->fnumTimeSegments + -1.0)));
    auVar267 = vmaxss_avx(ZEXT816(0) << 0x20,auVar267);
    fVar246 = fVar246 - auVar267._0_4_;
    _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar147 = (long)(int)auVar267._0_4_ * 0x38;
    lVar144 = *(long *)(_Var23 + 0x10 + lVar147);
    lVar146 = *(long *)(_Var23 + 0x38 + lVar147);
    lVar24 = *(long *)(_Var23 + 0x48 + lVar147);
    auVar267 = vshufps_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),0);
    pfVar1 = (float *)(lVar146 + uVar145 * lVar24);
    fVar259 = auVar267._0_4_;
    fVar289 = auVar267._4_4_;
    fVar260 = auVar267._8_4_;
    fVar291 = auVar267._12_4_;
    pfVar2 = (float *)(lVar146 + (uVar145 + 1) * lVar24);
    pfVar3 = (float *)(lVar146 + (uVar145 + 2) * lVar24);
    pfVar4 = (float *)(lVar146 + lVar24 * (uVar145 + 3));
    lVar146 = *(long *)(_Var23 + lVar147);
    auVar267 = vshufps_avx(ZEXT416((uint)(1.0 - fVar246)),ZEXT416((uint)(1.0 - fVar246)),0);
    pfVar5 = (float *)(lVar146 + lVar144 * uVar145);
    fVar246 = auVar267._0_4_;
    fVar278 = auVar267._4_4_;
    fVar258 = auVar267._8_4_;
    fVar287 = auVar267._12_4_;
    pfVar6 = (float *)(lVar146 + lVar144 * (uVar145 + 1));
    fVar302 = fVar259 * *pfVar1 + fVar246 * *pfVar5;
    fVar310 = fVar289 * pfVar1[1] + fVar278 * pfVar5[1];
    auVar303._0_8_ = CONCAT44(fVar310,fVar302);
    auVar303._8_4_ = fVar260 * pfVar1[2] + fVar258 * pfVar5[2];
    auVar303._12_4_ = fVar291 * pfVar1[3] + fVar287 * pfVar5[3];
    fVar387 = fVar246 * *pfVar6 + fVar259 * *pfVar2;
    fVar392 = fVar278 * pfVar6[1] + fVar289 * pfVar2[1];
    auVar388._0_8_ = CONCAT44(fVar392,fVar387);
    auVar388._8_4_ = fVar258 * pfVar6[2] + fVar260 * pfVar2[2];
    auVar388._12_4_ = fVar287 * pfVar6[3] + fVar291 * pfVar2[3];
    pfVar1 = (float *)(lVar146 + lVar144 * (uVar145 + 2));
    fVar393 = fVar246 * *pfVar1 + fVar259 * *pfVar3;
    fVar401 = fVar278 * pfVar1[1] + fVar289 * pfVar3[1];
    auVar395._0_8_ = CONCAT44(fVar401,fVar393);
    auVar395._8_4_ = fVar258 * pfVar1[2] + fVar260 * pfVar3[2];
    auVar395._12_4_ = fVar287 * pfVar1[3] + fVar291 * pfVar3[3];
    pfVar1 = (float *)(lVar146 + lVar144 * (uVar145 + 3));
    fVar367 = fVar246 * *pfVar1 + fVar259 * *pfVar4;
    fVar378 = fVar278 * pfVar1[1] + fVar289 * pfVar4[1];
    auVar368._0_8_ = CONCAT44(fVar378,fVar367);
    auVar368._8_4_ = fVar258 * pfVar1[2] + fVar260 * pfVar4[2];
    auVar368._12_4_ = fVar287 * pfVar1[3] + fVar291 * pfVar4[3];
    uVar20 = (uint)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar267 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar231 = vinsertps_avx(auVar267,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar218 = vsubps_avx(auVar303,auVar231);
    auVar267 = vshufps_avx(auVar218,auVar218,0);
    auVar216 = vshufps_avx(auVar218,auVar218,0x55);
    auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
    fVar246 = (local_610->vx).field_0.m128[0];
    fVar278 = (local_610->vx).field_0.m128[1];
    fVar258 = (local_610->vx).field_0.m128[2];
    fVar287 = (local_610->vx).field_0.m128[3];
    fVar259 = (local_610->vy).field_0.m128[0];
    fVar289 = (local_610->vy).field_0.m128[1];
    fVar260 = (local_610->vy).field_0.m128[2];
    fVar291 = (local_610->vy).field_0.m128[3];
    fVar245 = (local_610->vz).field_0.m128[0];
    fVar293 = (local_610->vz).field_0.m128[1];
    fVar261 = (local_610->vz).field_0.m128[2];
    fVar296 = (local_610->vz).field_0.m128[3];
    auVar248._0_4_ = auVar267._0_4_ * fVar246 + auVar216._0_4_ * fVar259 + fVar245 * auVar218._0_4_;
    auVar248._4_4_ = auVar267._4_4_ * fVar278 + auVar216._4_4_ * fVar289 + fVar293 * auVar218._4_4_;
    auVar248._8_4_ = auVar267._8_4_ * fVar258 + auVar216._8_4_ * fVar260 + fVar261 * auVar218._8_4_;
    auVar248._12_4_ =
         auVar267._12_4_ * fVar287 + auVar216._12_4_ * fVar291 + fVar296 * auVar218._12_4_;
    auVar267 = vblendps_avx(auVar248,auVar303,8);
    auVar232 = vsubps_avx(auVar388,auVar231);
    auVar216 = vshufps_avx(auVar232,auVar232,0);
    auVar218 = vshufps_avx(auVar232,auVar232,0x55);
    auVar232 = vshufps_avx(auVar232,auVar232,0xaa);
    auVar249._0_8_ =
         CONCAT44(auVar216._4_4_ * fVar278 + auVar218._4_4_ * fVar289 + fVar293 * auVar232._4_4_,
                  auVar216._0_4_ * fVar246 + auVar218._0_4_ * fVar259 + fVar245 * auVar232._0_4_);
    auVar249._8_4_ = auVar216._8_4_ * fVar258 + auVar218._8_4_ * fVar260 + fVar261 * auVar232._8_4_;
    auVar249._12_4_ =
         auVar216._12_4_ * fVar287 + auVar218._12_4_ * fVar291 + fVar296 * auVar232._12_4_;
    auVar216 = vblendps_avx(auVar249,auVar388,8);
    auVar32 = vsubps_avx(auVar395,auVar231);
    auVar218 = vshufps_avx(auVar32,auVar32,0);
    auVar232 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar250._0_4_ = auVar218._0_4_ * fVar246 + auVar232._0_4_ * fVar259 + auVar32._0_4_ * fVar245;
    auVar250._4_4_ = auVar218._4_4_ * fVar278 + auVar232._4_4_ * fVar289 + auVar32._4_4_ * fVar293;
    auVar250._8_4_ = auVar218._8_4_ * fVar258 + auVar232._8_4_ * fVar260 + auVar32._8_4_ * fVar261;
    auVar250._12_4_ =
         auVar218._12_4_ * fVar287 + auVar232._12_4_ * fVar291 + auVar32._12_4_ * fVar296;
    auVar218 = vblendps_avx(auVar250,auVar395,8);
    auVar32 = vsubps_avx(auVar368,auVar231);
    auVar231 = vshufps_avx(auVar32,auVar32,0);
    auVar232 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar189._0_4_ = auVar231._0_4_ * fVar246 + auVar232._0_4_ * fVar259 + fVar245 * auVar32._0_4_;
    auVar189._4_4_ = auVar231._4_4_ * fVar278 + auVar232._4_4_ * fVar289 + fVar293 * auVar32._4_4_;
    auVar189._8_4_ = auVar231._8_4_ * fVar258 + auVar232._8_4_ * fVar260 + fVar261 * auVar32._8_4_;
    auVar189._12_4_ =
         auVar231._12_4_ * fVar287 + auVar232._12_4_ * fVar291 + fVar296 * auVar32._12_4_;
    auVar231 = vblendps_avx(auVar189,auVar368,8);
    auVar229._8_4_ = 0x7fffffff;
    auVar229._0_8_ = 0x7fffffff7fffffff;
    auVar229._12_4_ = 0x7fffffff;
    auVar267 = vandps_avx(auVar267,auVar229);
    auVar216 = vandps_avx(auVar216,auVar229);
    auVar232 = vmaxps_avx(auVar267,auVar216);
    auVar267 = vandps_avx(auVar218,auVar229);
    auVar216 = vandps_avx(auVar231,auVar229);
    auVar267 = vmaxps_avx(auVar267,auVar216);
    auVar267 = vmaxps_avx(auVar232,auVar267);
    auVar216 = vmovshdup_avx(auVar267);
    auVar216 = vmaxss_avx(auVar216,auVar267);
    auVar267 = vshufpd_avx(auVar267,auVar267,1);
    auVar267 = vmaxss_avx(auVar267,auVar216);
    local_7e0._0_4_ = auVar267._0_4_;
    auVar148 = (undefined1  [8])(long)(int)uVar20;
    lVar144 = (long)auVar148 * 0x44;
    fVar258 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar144 + 0x908);
    fVar289 = *(float *)(bspline_basis0 + lVar144 + 0x90c);
    fVar293 = *(float *)(bspline_basis0 + lVar144 + 0x910);
    fVar261 = *(float *)(bspline_basis0 + lVar144 + 0x914);
    fVar296 = *(float *)(bspline_basis0 + lVar144 + 0x918);
    fVar298 = *(float *)(bspline_basis0 + lVar144 + 0x91c);
    fVar209 = *(float *)(bspline_basis0 + lVar144 + 0x920);
    auVar134 = *(undefined1 (*) [28])(bspline_basis0 + lVar144 + 0x908);
    fVar264 = *(float *)(bspline_basis0 + lVar144 + 0x924);
    auVar216 = vshufps_avx(auVar250,auVar250,0);
    auVar218 = vshufps_avx(auVar250,auVar250,0x55);
    register0x00001290 = auVar218;
    _local_6a0 = auVar218;
    fVar379 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar144 + 0xd8c);
    fVar366 = *(float *)(bspline_basis0 + lVar144 + 0xd90);
    fVar265 = *(float *)(bspline_basis0 + lVar144 + 0xd94);
    fVar272 = *(float *)(bspline_basis0 + lVar144 + 0xd98);
    fVar273 = *(float *)(bspline_basis0 + lVar144 + 0xd9c);
    fVar274 = *(float *)(bspline_basis0 + lVar144 + 0xda0);
    fVar275 = *(float *)(bspline_basis0 + lVar144 + 0xda4);
    auVar133 = *(undefined1 (*) [28])(bspline_basis0 + lVar144 + 0xd8c);
    auVar231 = vshufps_avx(auVar189,auVar189,0);
    register0x00001550 = auVar231;
    _local_4c0 = auVar231;
    fVar347 = auVar231._0_4_;
    fVar349 = auVar231._4_4_;
    fVar294 = auVar231._8_4_;
    fVar297 = auVar231._12_4_;
    fVar187 = auVar216._0_4_;
    fVar206 = auVar216._4_4_;
    fVar207 = auVar216._8_4_;
    fVar208 = auVar216._12_4_;
    auVar216 = vshufps_avx(auVar189,auVar189,0x55);
    fVar246 = auVar216._0_4_;
    fVar259 = auVar216._4_4_;
    fVar245 = auVar216._8_4_;
    fVar262 = auVar216._12_4_;
    fVar211 = auVar218._0_4_;
    fVar279 = auVar218._4_4_;
    fVar288 = auVar218._8_4_;
    fVar290 = auVar218._12_4_;
    auVar216 = vshufps_avx(auVar395,auVar395,0xff);
    register0x00001490 = auVar216;
    _local_a0 = auVar216;
    auVar218 = vshufps_avx(auVar368,auVar368,0xff);
    register0x000013d0 = auVar218;
    _local_c0 = auVar218;
    fVar278 = auVar218._0_4_;
    fVar287 = auVar218._4_4_;
    fVar260 = auVar218._8_4_;
    fVar291 = auVar218._12_4_;
    fVar185 = auVar216._0_4_;
    fVar263 = auVar216._4_4_;
    fVar330 = auVar216._8_4_;
    auVar128._8_4_ = auVar249._8_4_;
    auVar128._0_8_ = auVar249._0_8_;
    auVar128._12_4_ = auVar249._12_4_;
    auVar218 = vshufps_avx(auVar128,auVar128,0);
    local_7a0._16_16_ = auVar218;
    local_7a0._0_16_ = auVar218;
    fVar326 = *(float *)(bspline_basis0 + lVar144 + 0x484);
    fVar242 = *(float *)(bspline_basis0 + lVar144 + 0x488);
    fVar313 = *(float *)(bspline_basis0 + lVar144 + 0x48c);
    fVar327 = *(float *)(bspline_basis0 + lVar144 + 0x490);
    fStack_530 = *(float *)(bspline_basis0 + lVar144 + 0x494);
    fStack_52c = *(float *)(bspline_basis0 + lVar144 + 0x498);
    fStack_528 = *(float *)(bspline_basis0 + lVar144 + 0x49c);
    fStack_524 = *(float *)(bspline_basis0 + lVar144 + 0x4a0);
    fVar340 = auVar218._0_4_;
    fVar300 = auVar218._4_4_;
    fVar343 = auVar218._8_4_;
    fVar345 = auVar218._12_4_;
    auVar218 = vshufps_avx(auVar128,auVar128,0x55);
    register0x00001210 = auVar218;
    _local_780 = auVar218;
    fVar150 = auVar218._0_4_;
    fVar172 = auVar218._4_4_;
    fVar174 = auVar218._8_4_;
    fVar177 = auVar218._12_4_;
    auVar218 = vshufps_avx(auVar388,auVar388,0xff);
    register0x00001590 = auVar218;
    _local_280 = auVar218;
    fVar299 = auVar218._0_4_;
    fVar301 = auVar218._4_4_;
    fVar311 = auVar218._8_4_;
    fVar312 = auVar218._12_4_;
    auVar218 = vshufps_avx(auVar248,auVar248,0);
    register0x00001310 = auVar218;
    _local_420 = auVar218;
    fVar276 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar144);
    fVar277 = *(float *)(bspline_basis0 + lVar144 + 4);
    fVar292 = *(float *)(bspline_basis0 + lVar144 + 8);
    fVar243 = *(float *)(bspline_basis0 + lVar144 + 0xc);
    fVar315 = *(float *)(bspline_basis0 + lVar144 + 0x10);
    fVar328 = *(float *)(bspline_basis0 + lVar144 + 0x14);
    fVar329 = *(float *)(bspline_basis0 + lVar144 + 0x18);
    auVar135 = *(undefined1 (*) [28])(bspline_basis0 + lVar144);
    fVar151 = auVar218._0_4_;
    fVar173 = auVar218._4_4_;
    fVar176 = auVar218._8_4_;
    fVar179 = auVar218._12_4_;
    auVar321._0_4_ = fVar151 * fVar276 + fVar340 * fVar326 + fVar187 * fVar258 + fVar347 * fVar379;
    auVar321._4_4_ = fVar173 * fVar277 + fVar300 * fVar242 + fVar206 * fVar289 + fVar349 * fVar366;
    auVar321._8_4_ = fVar176 * fVar292 + fVar343 * fVar313 + fVar207 * fVar293 + fVar294 * fVar265;
    auVar321._12_4_ = fVar179 * fVar243 + fVar345 * fVar327 + fVar208 * fVar261 + fVar297 * fVar272;
    auVar321._16_4_ =
         fVar151 * fVar315 + fVar340 * fStack_530 + fVar187 * fVar296 + fVar347 * fVar273;
    auVar321._20_4_ =
         fVar173 * fVar328 + fVar300 * fStack_52c + fVar206 * fVar298 + fVar349 * fVar274;
    auVar321._24_4_ =
         fVar176 * fVar329 + fVar343 * fStack_528 + fVar207 * fVar209 + fVar294 * fVar275;
    auVar321._28_4_ = fVar264 + fVar208 + 0.0 + 0.0;
    auVar218 = vshufps_avx(auVar248,auVar248,0x55);
    auVar398._16_16_ = auVar218;
    auVar398._0_16_ = auVar218;
    fVar394 = auVar218._0_4_;
    fVar402 = auVar218._4_4_;
    fVar403 = auVar218._8_4_;
    fVar404 = auVar218._12_4_;
    auVar372._0_4_ = fVar394 * fVar276 + fVar150 * fVar326 + fVar211 * fVar258 + fVar379 * fVar246;
    auVar372._4_4_ = fVar402 * fVar277 + fVar172 * fVar242 + fVar279 * fVar289 + fVar366 * fVar259;
    auVar372._8_4_ = fVar403 * fVar292 + fVar174 * fVar313 + fVar288 * fVar293 + fVar265 * fVar245;
    auVar372._12_4_ = fVar404 * fVar243 + fVar177 * fVar327 + fVar290 * fVar261 + fVar272 * fVar262;
    auVar372._16_4_ =
         fVar394 * fVar315 + fVar150 * fStack_530 + fVar211 * fVar296 + fVar273 * fVar246;
    auVar372._20_4_ =
         fVar402 * fVar328 + fVar172 * fStack_52c + fVar279 * fVar298 + fVar274 * fVar259;
    auVar372._24_4_ =
         fVar403 * fVar329 + fVar174 * fStack_528 + fVar288 * fVar209 + fVar275 * fVar245;
    auVar372._28_4_ = fVar177 + fVar290 + fVar262 + 0.0;
    auVar218 = vpermilps_avx(auVar303,0xff);
    register0x00001450 = auVar218;
    _local_2a0 = auVar218;
    fVar181 = auVar218._0_4_;
    fVar183 = auVar218._4_4_;
    fVar184 = auVar218._8_4_;
    auVar158._0_4_ = fVar181 * fVar276 + fVar299 * fVar326 + fVar185 * fVar258 + fVar379 * fVar278;
    auVar158._4_4_ = fVar183 * fVar277 + fVar301 * fVar242 + fVar263 * fVar289 + fVar366 * fVar287;
    auVar158._8_4_ = fVar184 * fVar292 + fVar311 * fVar313 + fVar330 * fVar293 + fVar265 * fVar260;
    auVar158._12_4_ =
         auVar218._12_4_ * fVar243 +
         fVar312 * fVar327 + auVar216._12_4_ * fVar261 + fVar272 * fVar291;
    auVar158._16_4_ =
         fVar181 * fVar315 + fVar299 * fStack_530 + fVar185 * fVar296 + fVar273 * fVar278;
    auVar158._20_4_ =
         fVar183 * fVar328 + fVar301 * fStack_52c + fVar263 * fVar298 + fVar274 * fVar287;
    auVar158._24_4_ =
         fVar184 * fVar329 + fVar311 * fStack_528 + fVar330 * fVar209 + fVar275 * fVar260;
    auVar158._28_4_ = 0;
    fVar292 = *(float *)(bspline_basis1 + lVar144 + 0x908);
    fVar243 = *(float *)(bspline_basis1 + lVar144 + 0x90c);
    fVar315 = *(float *)(bspline_basis1 + lVar144 + 0x910);
    fVar328 = *(float *)(bspline_basis1 + lVar144 + 0x914);
    fVar329 = *(float *)(bspline_basis1 + lVar144 + 0x918);
    fVar244 = *(float *)(bspline_basis1 + lVar144 + 0x91c);
    fVar210 = *(float *)(bspline_basis1 + lVar144 + 0x920);
    fVar261 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar144 + 0xd8c);
    fVar296 = *(float *)(bspline_basis1 + lVar144 + 0xd90);
    fVar209 = *(float *)(bspline_basis1 + lVar144 + 0xd94);
    fVar366 = *(float *)(bspline_basis1 + lVar144 + 0xd98);
    fVar265 = *(float *)(bspline_basis1 + lVar144 + 0xd9c);
    fVar273 = *(float *)(bspline_basis1 + lVar144 + 0xda0);
    fVar274 = *(float *)(bspline_basis1 + lVar144 + 0xda4);
    auVar136 = *(undefined1 (*) [28])(bspline_basis1 + lVar144 + 0xd8c);
    auVar26 = *(undefined1 (*) [32])(bspline_basis1 + lVar144 + 0x484);
    auVar286 = ZEXT3264(auVar26);
    fVar258 = auVar26._0_4_;
    fVar289 = auVar26._4_4_;
    fVar293 = auVar26._8_4_;
    fVar298 = auVar26._12_4_;
    fVar379 = auVar26._16_4_;
    fVar272 = auVar26._20_4_;
    fVar275 = auVar26._24_4_;
    fVar277 = fVar297 + fVar264 + 0.0;
    fVar295 = *(float *)(bspline_basis1 + lVar144);
    fVar351 = *(float *)(bspline_basis1 + lVar144 + 4);
    fVar175 = *(float *)(bspline_basis1 + lVar144 + 8);
    fVar178 = *(float *)(bspline_basis1 + lVar144 + 0xc);
    fVar180 = *(float *)(bspline_basis1 + lVar144 + 0x10);
    fVar182 = *(float *)(bspline_basis1 + lVar144 + 0x14);
    fVar186 = *(float *)(bspline_basis1 + lVar144 + 0x18);
    auVar253._0_4_ = fVar151 * fVar295 + fVar340 * fVar258 + fVar292 * fVar187 + fVar347 * fVar261;
    auVar253._4_4_ = fVar173 * fVar351 + fVar300 * fVar289 + fVar243 * fVar206 + fVar349 * fVar296;
    auVar253._8_4_ = fVar176 * fVar175 + fVar343 * fVar293 + fVar315 * fVar207 + fVar294 * fVar209;
    auVar253._12_4_ = fVar179 * fVar178 + fVar345 * fVar298 + fVar328 * fVar208 + fVar297 * fVar366;
    auVar253._16_4_ = fVar151 * fVar180 + fVar340 * fVar379 + fVar329 * fVar187 + fVar347 * fVar265;
    auVar253._20_4_ = fVar173 * fVar182 + fVar300 * fVar272 + fVar244 * fVar206 + fVar349 * fVar273;
    auVar253._24_4_ = fVar176 * fVar186 + fVar343 * fVar275 + fVar210 * fVar207 + fVar294 * fVar274;
    auVar253._28_4_ = fVar312 + fVar277;
    local_6e0._0_4_ = fVar394 * fVar295 + fVar150 * fVar258 + fVar292 * fVar211 + fVar261 * fVar246;
    local_6e0._4_4_ = fVar402 * fVar351 + fVar172 * fVar289 + fVar243 * fVar279 + fVar296 * fVar259;
    fStack_6d8 = fVar403 * fVar175 + fVar174 * fVar293 + fVar315 * fVar288 + fVar209 * fVar245;
    fStack_6d4 = fVar404 * fVar178 + fVar177 * fVar298 + fVar328 * fVar290 + fVar366 * fVar262;
    auVar235._16_4_ = fVar394 * fVar180 + fVar150 * fVar379 + fVar329 * fVar211 + fVar265 * fVar246;
    auVar235._0_16_ = _local_6e0;
    auVar235._20_4_ = fVar402 * fVar182 + fVar172 * fVar272 + fVar244 * fVar279 + fVar273 * fVar259;
    auVar235._24_4_ = fVar403 * fVar186 + fVar174 * fVar275 + fVar210 * fVar288 + fVar274 * fVar245;
    auVar235._28_4_ = fVar277 + fVar297 + fVar264 + 0.0;
    local_800._0_4_ = fVar299 * fVar258 + fVar185 * fVar292 + fVar278 * fVar261 + fVar181 * fVar295;
    local_800._4_4_ = fVar301 * fVar289 + fVar263 * fVar243 + fVar287 * fVar296 + fVar183 * fVar351;
    local_800._8_4_ = fVar311 * fVar293 + fVar330 * fVar315 + fVar260 * fVar209 + fVar184 * fVar175;
    local_800._12_4_ =
         fVar312 * fVar298 + auVar216._12_4_ * fVar328 + fVar291 * fVar366 +
         auVar218._12_4_ * fVar178;
    local_800._16_4_ = fVar299 * fVar379 + fVar185 * fVar329 + fVar278 * fVar265 + fVar181 * fVar180
    ;
    local_800._20_4_ = fVar301 * fVar272 + fVar263 * fVar244 + fVar287 * fVar273 + fVar183 * fVar182
    ;
    local_800._24_4_ = fVar311 * fVar275 + fVar330 * fVar210 + fVar260 * fVar274 + fVar184 * fVar186
    ;
    local_800._28_4_ = fVar297 + fVar291 + fVar264 + fVar277;
    auVar28 = vsubps_avx(auVar253,auVar321);
    auVar29 = vsubps_avx(auVar235,auVar372);
    fVar278 = auVar28._0_4_;
    fVar260 = auVar28._4_4_;
    auVar43._4_4_ = auVar372._4_4_ * fVar260;
    auVar43._0_4_ = auVar372._0_4_ * fVar278;
    fVar261 = auVar28._8_4_;
    auVar43._8_4_ = auVar372._8_4_ * fVar261;
    fVar209 = auVar28._12_4_;
    auVar43._12_4_ = auVar372._12_4_ * fVar209;
    fVar366 = auVar28._16_4_;
    auVar43._16_4_ = auVar372._16_4_ * fVar366;
    fVar273 = auVar28._20_4_;
    auVar43._20_4_ = auVar372._20_4_ * fVar273;
    fVar276 = auVar28._24_4_;
    auVar43._24_4_ = auVar372._24_4_ * fVar276;
    auVar43._28_4_ = fVar277;
    fVar287 = auVar29._0_4_;
    fVar291 = auVar29._4_4_;
    auVar44._4_4_ = auVar321._4_4_ * fVar291;
    auVar44._0_4_ = auVar321._0_4_ * fVar287;
    fVar296 = auVar29._8_4_;
    auVar44._8_4_ = auVar321._8_4_ * fVar296;
    fVar264 = auVar29._12_4_;
    auVar44._12_4_ = auVar321._12_4_ * fVar264;
    fVar265 = auVar29._16_4_;
    auVar44._16_4_ = auVar321._16_4_ * fVar265;
    fVar274 = auVar29._20_4_;
    auVar44._20_4_ = auVar321._20_4_ * fVar274;
    fVar277 = auVar29._24_4_;
    auVar44._24_4_ = auVar321._24_4_ * fVar277;
    auVar44._28_4_ = auVar235._28_4_;
    auVar27 = vsubps_avx(auVar43,auVar44);
    auVar322 = vmaxps_avx(auVar158,local_800);
    auVar45._4_4_ = auVar322._4_4_ * auVar322._4_4_ * (fVar260 * fVar260 + fVar291 * fVar291);
    auVar45._0_4_ = auVar322._0_4_ * auVar322._0_4_ * (fVar278 * fVar278 + fVar287 * fVar287);
    auVar45._8_4_ = auVar322._8_4_ * auVar322._8_4_ * (fVar261 * fVar261 + fVar296 * fVar296);
    auVar45._12_4_ = auVar322._12_4_ * auVar322._12_4_ * (fVar209 * fVar209 + fVar264 * fVar264);
    auVar45._16_4_ = auVar322._16_4_ * auVar322._16_4_ * (fVar366 * fVar366 + fVar265 * fVar265);
    auVar45._20_4_ = auVar322._20_4_ * auVar322._20_4_ * (fVar273 * fVar273 + fVar274 * fVar274);
    auVar45._24_4_ = auVar322._24_4_ * auVar322._24_4_ * (fVar276 * fVar276 + fVar277 * fVar277);
    auVar45._28_4_ = auVar29._28_4_ + auVar235._28_4_;
    auVar46._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar46._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar46._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar46._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar46._16_4_ = auVar27._16_4_ * auVar27._16_4_;
    auVar46._20_4_ = auVar27._20_4_ * auVar27._20_4_;
    auVar46._24_4_ = auVar27._24_4_ * auVar27._24_4_;
    auVar46._28_4_ = auVar27._28_4_;
    auVar322 = vcmpps_avx(auVar46,auVar45,2);
    auVar230._0_4_ = (float)(int)uVar20;
    auVar230._4_12_ = auVar216._4_12_;
    local_4e0._0_16_ = auVar230;
    auVar216 = vshufps_avx(auVar230,auVar230,0);
    auVar236._16_16_ = auVar216;
    auVar236._0_16_ = auVar216;
    auVar27 = vcmpps_avx(_DAT_01f7b060,auVar236,1);
    auVar216 = vpermilps_avx(auVar248,0xaa);
    register0x00001450 = auVar216;
    _local_5a0 = auVar216;
    auVar129._8_4_ = auVar249._8_4_;
    auVar129._0_8_ = auVar249._0_8_;
    auVar129._12_4_ = auVar249._12_4_;
    auVar218 = vpermilps_avx(auVar129,0xaa);
    register0x00001550 = auVar218;
    _local_e0 = auVar218;
    auVar386 = ZEXT3264(_local_e0);
    auVar231 = vpermilps_avx(auVar250,0xaa);
    register0x00001590 = auVar231;
    _local_100 = auVar231;
    auVar232 = vpermilps_avx(auVar189,0xaa);
    register0x00001310 = auVar232;
    _local_400 = auVar232;
    auVar30 = auVar27 & auVar322;
    uVar139 = *(uint *)(ray + k * 4 + 0x60);
    uStack_728 = auVar250._8_8_;
    local_730 = CONCAT44(0,uVar141);
    local_510 = ZEXT416(uVar141);
    local_500._0_16_ = ZEXT416(uVar19);
    auVar267 = ZEXT416((uint)(auVar267._0_4_ * 4.7683716e-07));
    uStack_8e8 = auVar303._8_8_;
    uStack_838 = auVar388._8_8_;
    uStack_848 = auVar395._8_8_;
    uStack_858 = auVar368._8_8_;
    fVar278 = fVar150;
    fVar287 = fVar172;
    fVar260 = fVar174;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
      auVar325 = ZEXT3264(auVar320);
      auVar339 = ZEXT3264(local_7a0);
    }
    else {
      local_440 = vandps_avx(auVar322,auVar27);
      fVar263 = auVar216._0_4_;
      fVar330 = auVar216._4_4_;
      fVar299 = auVar216._8_4_;
      fVar301 = auVar216._12_4_;
      fVar311 = auVar218._0_4_;
      fVar312 = auVar218._4_4_;
      fVar314 = auVar218._8_4_;
      fVar316 = auVar218._12_4_;
      fVar331 = auVar231._0_4_;
      fVar341 = auVar231._4_4_;
      fVar342 = auVar231._8_4_;
      fVar344 = auVar231._12_4_;
      local_560._0_4_ = auVar136._0_4_;
      local_560._4_4_ = auVar136._4_4_;
      fStack_558 = auVar136._8_4_;
      fStack_554 = auVar136._12_4_;
      fStack_550 = auVar136._16_4_;
      fStack_54c = auVar136._20_4_;
      fStack_548 = auVar136._24_4_;
      fVar181 = auVar232._0_4_;
      fVar183 = auVar232._4_4_;
      fVar184 = auVar232._8_4_;
      fVar185 = auVar232._12_4_;
      local_560._0_4_ =
           fVar263 * fVar295 +
           fVar311 * fVar258 + fVar331 * fVar292 + fVar181 * (float)local_560._0_4_;
      local_560._4_4_ =
           fVar330 * fVar351 +
           fVar312 * fVar289 + fVar341 * fVar243 + fVar183 * (float)local_560._4_4_;
      fStack_558 = fVar299 * fVar175 + fVar314 * fVar293 + fVar342 * fVar315 + fVar184 * fStack_558;
      fStack_554 = fVar301 * fVar178 + fVar316 * fVar298 + fVar344 * fVar328 + fVar185 * fStack_554;
      fStack_550 = fVar263 * fVar180 + fVar311 * fVar379 + fVar331 * fVar329 + fVar181 * fStack_550;
      fStack_54c = fVar330 * fVar182 + fVar312 * fVar272 + fVar341 * fVar244 + fVar183 * fStack_54c;
      fStack_548 = fVar299 * fVar186 + fVar314 * fVar275 + fVar342 * fVar210 + fVar184 * fStack_548;
      fStack_544 = local_440._28_4_ +
                   auVar27._28_4_ + *(float *)(bspline_basis1 + lVar144 + 0x924) + 0.0;
      local_5c0._0_4_ = auVar135._0_4_;
      local_5c0._4_4_ = auVar135._4_4_;
      fStack_5b8 = auVar135._8_4_;
      fStack_5b4 = auVar135._12_4_;
      fStack_5b0 = auVar135._16_4_;
      fStack_5ac = auVar135._20_4_;
      fStack_5a8 = auVar135._24_4_;
      local_700._0_4_ = auVar134._0_4_;
      local_700._4_4_ = auVar134._4_4_;
      uStack_6f8._0_4_ = auVar134._8_4_;
      uStack_6f8._4_4_ = auVar134._12_4_;
      uStack_6f0._0_4_ = auVar134._16_4_;
      uStack_6f0._4_4_ = auVar134._20_4_;
      uStack_6e8._0_4_ = auVar134._24_4_;
      local_8e0._0_4_ = auVar133._0_4_;
      local_8e0._4_4_ = auVar133._4_4_;
      fStack_8d8 = auVar133._8_4_;
      fStack_8d4 = auVar133._12_4_;
      fStack_8d0 = auVar133._16_4_;
      fStack_8cc = auVar133._20_4_;
      fStack_8c8 = auVar133._24_4_;
      local_700._0_4_ =
           fVar263 * (float)local_5c0._0_4_ +
           fVar311 * fVar326 + fVar331 * (float)local_700._0_4_ + fVar181 * (float)local_8e0._0_4_;
      local_700._4_4_ =
           fVar330 * (float)local_5c0._4_4_ +
           fVar312 * fVar242 + fVar341 * (float)local_700._4_4_ + fVar183 * (float)local_8e0._4_4_;
      uStack_6f8._0_4_ =
           fVar299 * fStack_5b8 +
           fVar314 * fVar313 + fVar342 * (float)uStack_6f8 + fVar184 * fStack_8d8;
      uStack_6f8._4_4_ =
           fVar301 * fStack_5b4 +
           fVar316 * fVar327 + fVar344 * uStack_6f8._4_4_ + fVar185 * fStack_8d4;
      uStack_6f0._0_4_ =
           fVar263 * fStack_5b0 +
           fVar311 * fStack_530 + fVar331 * (float)uStack_6f0 + fVar181 * fStack_8d0;
      uStack_6f0._4_4_ =
           fVar330 * fStack_5ac +
           fVar312 * fStack_52c + fVar341 * uStack_6f0._4_4_ + fVar183 * fStack_8cc;
      uStack_6e8._0_4_ =
           fVar299 * fStack_5a8 +
           fVar314 * fStack_528 + fVar342 * (float)uStack_6e8 + fVar184 * fStack_8c8;
      uStack_6e8._4_4_ = fVar404 + fStack_544 + local_440._28_4_ + auVar27._28_4_;
      fVar258 = *(float *)(bspline_basis0 + lVar144 + 0x1210);
      fVar289 = *(float *)(bspline_basis0 + lVar144 + 0x1214);
      fVar291 = *(float *)(bspline_basis0 + lVar144 + 0x1218);
      fVar293 = *(float *)(bspline_basis0 + lVar144 + 0x121c);
      fVar261 = *(float *)(bspline_basis0 + lVar144 + 0x1220);
      fVar296 = *(float *)(bspline_basis0 + lVar144 + 0x1224);
      fVar298 = *(float *)(bspline_basis0 + lVar144 + 0x1228);
      fVar209 = *(float *)(bspline_basis0 + lVar144 + 0x1694);
      fVar264 = *(float *)(bspline_basis0 + lVar144 + 0x1698);
      fVar379 = *(float *)(bspline_basis0 + lVar144 + 0x169c);
      fVar366 = *(float *)(bspline_basis0 + lVar144 + 0x16a0);
      fVar265 = *(float *)(bspline_basis0 + lVar144 + 0x16a4);
      fVar272 = *(float *)(bspline_basis0 + lVar144 + 0x16a8);
      fVar273 = *(float *)(bspline_basis0 + lVar144 + 0x16ac);
      fVar274 = *(float *)(bspline_basis0 + lVar144 + 0x1b18);
      fVar275 = *(float *)(bspline_basis0 + lVar144 + 0x1b1c);
      fVar276 = *(float *)(bspline_basis0 + lVar144 + 0x1b20);
      fVar277 = *(float *)(bspline_basis0 + lVar144 + 0x1b24);
      fVar326 = *(float *)(bspline_basis0 + lVar144 + 0x1b28);
      fVar242 = *(float *)(bspline_basis0 + lVar144 + 0x1b2c);
      fVar313 = *(float *)(bspline_basis0 + lVar144 + 0x1b30);
      fVar327 = *(float *)(bspline_basis0 + lVar144 + 0x1f9c);
      fVar292 = *(float *)(bspline_basis0 + lVar144 + 0x1fa0);
      fVar243 = *(float *)(bspline_basis0 + lVar144 + 0x1fa4);
      fVar315 = *(float *)(bspline_basis0 + lVar144 + 0x1fa8);
      fVar328 = *(float *)(bspline_basis0 + lVar144 + 0x1fac);
      fVar329 = *(float *)(bspline_basis0 + lVar144 + 0x1fb0);
      fVar244 = *(float *)(bspline_basis0 + lVar144 + 0x1fb4);
      local_7e0._16_16_ = auVar163._16_16_;
      local_7e0._0_16_ = auVar267;
      fVar295 = fVar301 + auVar26._28_4_;
      fVar210 = *(float *)(bspline_basis0 + lVar144 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar144 + 0x1fb8);
      fVar351 = *(float *)(bspline_basis0 + lVar144 + 0x16b0) + fVar210;
      local_540 = fVar151 * fVar258 + fVar340 * fVar209 + fVar187 * fVar274 + fVar347 * fVar327;
      fStack_53c = fVar173 * fVar289 + fVar300 * fVar264 + fVar206 * fVar275 + fVar349 * fVar292;
      fStack_538 = fVar176 * fVar291 + fVar343 * fVar379 + fVar207 * fVar276 + fVar294 * fVar243;
      fStack_534 = fVar179 * fVar293 + fVar345 * fVar366 + fVar208 * fVar277 + fVar297 * fVar315;
      fStack_530 = fVar151 * fVar261 + fVar340 * fVar265 + fVar187 * fVar326 + fVar347 * fVar328;
      fStack_52c = fVar173 * fVar296 + fVar300 * fVar272 + fVar206 * fVar242 + fVar349 * fVar329;
      fStack_528 = fVar176 * fVar298 + fVar343 * fVar273 + fVar207 * fVar313 + fVar294 * fVar244;
      fStack_524 = *(float *)(bspline_basis0 + lVar144 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar144 + 0x1fb8) + fVar295;
      auVar195._0_4_ = fVar211 * fVar274 + fVar246 * fVar327 + fVar150 * fVar209 + fVar394 * fVar258
      ;
      auVar195._4_4_ = fVar279 * fVar275 + fVar259 * fVar292 + fVar172 * fVar264 + fVar402 * fVar289
      ;
      auVar195._8_4_ = fVar288 * fVar276 + fVar245 * fVar243 + fVar174 * fVar379 + fVar403 * fVar291
      ;
      auVar195._12_4_ =
           fVar290 * fVar277 + fVar262 * fVar315 + fVar177 * fVar366 + fVar404 * fVar293;
      auVar195._16_4_ =
           fVar211 * fVar326 + fVar246 * fVar328 + fVar150 * fVar265 + fVar394 * fVar261;
      auVar195._20_4_ =
           fVar279 * fVar242 + fVar259 * fVar329 + fVar172 * fVar272 + fVar402 * fVar296;
      auVar195._24_4_ =
           fVar288 * fVar313 + fVar245 * fVar244 + fVar174 * fVar273 + fVar403 * fVar298;
      auVar195._28_4_ = fVar301 + *(float *)(bspline_basis1 + lVar144 + 0x1c) + fVar295 + fVar210;
      local_5c0._4_4_ =
           fVar312 * fVar264 + fVar341 * fVar275 + fVar183 * fVar292 + fVar330 * fVar289;
      local_5c0._0_4_ =
           fVar311 * fVar209 + fVar331 * fVar274 + fVar181 * fVar327 + fVar263 * fVar258;
      fStack_5b8 = fVar314 * fVar379 + fVar342 * fVar276 + fVar184 * fVar243 + fVar299 * fVar291;
      fStack_5b4 = fVar316 * fVar366 + fVar344 * fVar277 + fVar185 * fVar315 + fVar301 * fVar293;
      fStack_5b0 = fVar311 * fVar265 + fVar331 * fVar326 + fVar181 * fVar328 + fVar263 * fVar261;
      fStack_5ac = fVar312 * fVar272 + fVar341 * fVar242 + fVar183 * fVar329 + fVar330 * fVar296;
      fStack_5a8 = fVar314 * fVar273 + fVar342 * fVar313 + fVar184 * fVar244 + fVar299 * fVar298;
      fStack_5a4 = fVar351 + *(float *)(bspline_basis0 + lVar144 + 0x122c);
      fVar258 = *(float *)(bspline_basis1 + lVar144 + 0x1b18);
      fVar289 = *(float *)(bspline_basis1 + lVar144 + 0x1b1c);
      fVar291 = *(float *)(bspline_basis1 + lVar144 + 0x1b20);
      fVar293 = *(float *)(bspline_basis1 + lVar144 + 0x1b24);
      fVar261 = *(float *)(bspline_basis1 + lVar144 + 0x1b28);
      fVar296 = *(float *)(bspline_basis1 + lVar144 + 0x1b2c);
      fVar298 = *(float *)(bspline_basis1 + lVar144 + 0x1b30);
      fVar209 = *(float *)(bspline_basis1 + lVar144 + 0x1f9c);
      fVar264 = *(float *)(bspline_basis1 + lVar144 + 0x1fa0);
      fVar379 = *(float *)(bspline_basis1 + lVar144 + 0x1fa4);
      fVar366 = *(float *)(bspline_basis1 + lVar144 + 0x1fa8);
      fVar265 = *(float *)(bspline_basis1 + lVar144 + 0x1fac);
      fVar272 = *(float *)(bspline_basis1 + lVar144 + 0x1fb0);
      fVar273 = *(float *)(bspline_basis1 + lVar144 + 0x1fb4);
      fVar274 = *(float *)(bspline_basis1 + lVar144 + 0x1694);
      fVar275 = *(float *)(bspline_basis1 + lVar144 + 0x1698);
      fVar276 = *(float *)(bspline_basis1 + lVar144 + 0x169c);
      fVar277 = *(float *)(bspline_basis1 + lVar144 + 0x16a0);
      fVar326 = *(float *)(bspline_basis1 + lVar144 + 0x16a4);
      fVar242 = *(float *)(bspline_basis1 + lVar144 + 0x16a8);
      fVar313 = *(float *)(bspline_basis1 + lVar144 + 0x16ac);
      fVar327 = *(float *)(bspline_basis1 + lVar144 + 0x1210);
      fVar292 = *(float *)(bspline_basis1 + lVar144 + 0x1214);
      fVar243 = *(float *)(bspline_basis1 + lVar144 + 0x1218);
      fVar315 = *(float *)(bspline_basis1 + lVar144 + 0x121c);
      fVar328 = *(float *)(bspline_basis1 + lVar144 + 0x1220);
      fVar329 = *(float *)(bspline_basis1 + lVar144 + 0x1224);
      fVar244 = *(float *)(bspline_basis1 + lVar144 + 0x1228);
      auVar307._0_4_ = fVar151 * fVar327 + fVar340 * fVar274 + fVar187 * fVar258 + fVar347 * fVar209
      ;
      auVar307._4_4_ = fVar173 * fVar292 + fVar300 * fVar275 + fVar206 * fVar289 + fVar349 * fVar264
      ;
      auVar307._8_4_ = fVar176 * fVar243 + fVar343 * fVar276 + fVar207 * fVar291 + fVar294 * fVar379
      ;
      auVar307._12_4_ =
           fVar179 * fVar315 + fVar345 * fVar277 + fVar208 * fVar293 + fVar297 * fVar366;
      auVar307._16_4_ =
           fVar151 * fVar328 + fVar340 * fVar326 + fVar187 * fVar261 + fVar347 * fVar265;
      auVar307._20_4_ =
           fVar173 * fVar329 + fVar300 * fVar242 + fVar206 * fVar296 + fVar349 * fVar272;
      auVar307._24_4_ =
           fVar176 * fVar244 + fVar343 * fVar313 + fVar207 * fVar298 + fVar294 * fVar273;
      auVar307._28_4_ = fVar290 + fVar290 + fVar351 + fVar297;
      auVar335._0_4_ = fVar394 * fVar327 + fVar150 * fVar274 + fVar211 * fVar258 + fVar246 * fVar209
      ;
      auVar335._4_4_ = fVar402 * fVar292 + fVar172 * fVar275 + fVar279 * fVar289 + fVar259 * fVar264
      ;
      auVar335._8_4_ = fVar403 * fVar243 + fVar174 * fVar276 + fVar288 * fVar291 + fVar245 * fVar379
      ;
      auVar335._12_4_ =
           fVar404 * fVar315 + fVar177 * fVar277 + fVar290 * fVar293 + fVar262 * fVar366;
      auVar335._16_4_ =
           fVar394 * fVar328 + fVar150 * fVar326 + fVar211 * fVar261 + fVar246 * fVar265;
      auVar335._20_4_ =
           fVar402 * fVar329 + fVar172 * fVar242 + fVar279 * fVar296 + fVar259 * fVar272;
      auVar335._24_4_ =
           fVar403 * fVar244 + fVar174 * fVar313 + fVar288 * fVar298 + fVar245 * fVar273;
      auVar335._28_4_ = fVar290 + fVar290 + fVar290 + fVar351;
      auVar224._0_4_ = fVar263 * fVar327 + fVar311 * fVar274 + fVar331 * fVar258 + fVar181 * fVar209
      ;
      auVar224._4_4_ = fVar330 * fVar292 + fVar312 * fVar275 + fVar341 * fVar289 + fVar183 * fVar264
      ;
      auVar224._8_4_ = fVar299 * fVar243 + fVar314 * fVar276 + fVar342 * fVar291 + fVar184 * fVar379
      ;
      auVar224._12_4_ =
           fVar301 * fVar315 + fVar316 * fVar277 + fVar344 * fVar293 + fVar185 * fVar366;
      auVar224._16_4_ =
           fVar263 * fVar328 + fVar311 * fVar326 + fVar331 * fVar261 + fVar181 * fVar265;
      auVar224._20_4_ =
           fVar330 * fVar329 + fVar312 * fVar242 + fVar341 * fVar296 + fVar183 * fVar272;
      auVar224._24_4_ =
           fVar299 * fVar244 + fVar314 * fVar313 + fVar342 * fVar298 + fVar184 * fVar273;
      auVar224._28_4_ =
           *(float *)(bspline_basis1 + lVar144 + 0x122c) +
           *(float *)(bspline_basis1 + lVar144 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar144 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar144 + 0x1fb8);
      auVar254._8_4_ = 0x7fffffff;
      auVar254._0_8_ = 0x7fffffff7fffffff;
      auVar254._12_4_ = 0x7fffffff;
      auVar254._16_4_ = 0x7fffffff;
      auVar254._20_4_ = 0x7fffffff;
      auVar254._24_4_ = 0x7fffffff;
      auVar254._28_4_ = 0x7fffffff;
      auVar132._4_4_ = fStack_53c;
      auVar132._0_4_ = local_540;
      auVar132._8_4_ = fStack_538;
      auVar132._12_4_ = fStack_534;
      auVar132._16_4_ = fStack_530;
      auVar132._20_4_ = fStack_52c;
      auVar132._24_4_ = fStack_528;
      auVar132._28_4_ = fStack_524;
      auVar163 = vandps_avx(auVar132,auVar254);
      auVar26 = vandps_avx(auVar195,auVar254);
      auVar26 = vmaxps_avx(auVar163,auVar26);
      auVar163 = vandps_avx(auVar254,_local_5c0);
      auVar163 = vmaxps_avx(auVar26,auVar163);
      auVar216 = vpermilps_avx(auVar267,0);
      auVar281._16_16_ = auVar216;
      auVar281._0_16_ = auVar216;
      auVar163 = vcmpps_avx(auVar163,auVar281,1);
      auVar322 = vblendvps_avx(auVar132,auVar28,auVar163);
      auVar27 = vblendvps_avx(auVar195,auVar29,auVar163);
      auVar163 = vandps_avx(auVar307,auVar254);
      auVar26 = vandps_avx(auVar335,auVar254);
      auVar30 = vmaxps_avx(auVar163,auVar26);
      auVar163 = vandps_avx(auVar224,auVar254);
      auVar163 = vmaxps_avx(auVar30,auVar163);
      auVar30 = vcmpps_avx(auVar163,auVar281,1);
      auVar163 = vblendvps_avx(auVar307,auVar28,auVar30);
      auVar28 = vblendvps_avx(auVar335,auVar29,auVar30);
      fVar295 = auVar322._0_4_;
      fVar351 = auVar322._4_4_;
      fVar175 = auVar322._8_4_;
      fVar178 = auVar322._12_4_;
      fVar180 = auVar322._16_4_;
      fVar182 = auVar322._20_4_;
      fVar186 = auVar322._24_4_;
      fVar211 = auVar163._0_4_;
      fVar279 = auVar163._4_4_;
      fVar288 = auVar163._8_4_;
      fVar290 = auVar163._12_4_;
      fVar151 = auVar163._16_4_;
      fVar173 = auVar163._20_4_;
      fVar176 = auVar163._24_4_;
      fVar179 = -auVar163._28_4_;
      fVar258 = auVar27._0_4_;
      fVar261 = auVar27._4_4_;
      fVar264 = auVar27._8_4_;
      fVar272 = auVar27._12_4_;
      fVar276 = auVar27._16_4_;
      fVar313 = auVar27._20_4_;
      fVar315 = auVar27._24_4_;
      auVar159._0_4_ = fVar258 * fVar258 + fVar295 * fVar295;
      auVar159._4_4_ = fVar261 * fVar261 + fVar351 * fVar351;
      auVar159._8_4_ = fVar264 * fVar264 + fVar175 * fVar175;
      auVar159._12_4_ = fVar272 * fVar272 + fVar178 * fVar178;
      auVar159._16_4_ = fVar276 * fVar276 + fVar180 * fVar180;
      auVar159._20_4_ = fVar313 * fVar313 + fVar182 * fVar182;
      auVar159._24_4_ = fVar315 * fVar315 + fVar186 * fVar186;
      auVar159._28_4_ = auVar335._28_4_ + auVar322._28_4_;
      auVar322 = vrsqrtps_avx(auVar159);
      fVar289 = auVar322._0_4_;
      fVar291 = auVar322._4_4_;
      auVar47._4_4_ = fVar291 * 1.5;
      auVar47._0_4_ = fVar289 * 1.5;
      fVar293 = auVar322._8_4_;
      auVar47._8_4_ = fVar293 * 1.5;
      fVar296 = auVar322._12_4_;
      auVar47._12_4_ = fVar296 * 1.5;
      fVar298 = auVar322._16_4_;
      auVar47._16_4_ = fVar298 * 1.5;
      fVar209 = auVar322._20_4_;
      auVar47._20_4_ = fVar209 * 1.5;
      fVar379 = auVar322._24_4_;
      fVar210 = auVar26._28_4_;
      auVar47._24_4_ = fVar379 * 1.5;
      auVar47._28_4_ = fVar210;
      auVar48._4_4_ = fVar291 * fVar291 * fVar291 * auVar159._4_4_ * 0.5;
      auVar48._0_4_ = fVar289 * fVar289 * fVar289 * auVar159._0_4_ * 0.5;
      auVar48._8_4_ = fVar293 * fVar293 * fVar293 * auVar159._8_4_ * 0.5;
      auVar48._12_4_ = fVar296 * fVar296 * fVar296 * auVar159._12_4_ * 0.5;
      auVar48._16_4_ = fVar298 * fVar298 * fVar298 * auVar159._16_4_ * 0.5;
      auVar48._20_4_ = fVar209 * fVar209 * fVar209 * auVar159._20_4_ * 0.5;
      auVar48._24_4_ = fVar379 * fVar379 * fVar379 * auVar159._24_4_ * 0.5;
      auVar48._28_4_ = auVar159._28_4_;
      auVar26 = vsubps_avx(auVar47,auVar48);
      fVar289 = auVar26._0_4_;
      fVar296 = auVar26._4_4_;
      fVar379 = auVar26._8_4_;
      fVar273 = auVar26._12_4_;
      fVar277 = auVar26._16_4_;
      fVar327 = auVar26._20_4_;
      fVar328 = auVar26._24_4_;
      fVar291 = auVar28._0_4_;
      fVar298 = auVar28._4_4_;
      fVar366 = auVar28._8_4_;
      fVar274 = auVar28._12_4_;
      fVar326 = auVar28._16_4_;
      fVar292 = auVar28._20_4_;
      fVar329 = auVar28._24_4_;
      auVar160._0_4_ = fVar291 * fVar291 + fVar211 * fVar211;
      auVar160._4_4_ = fVar298 * fVar298 + fVar279 * fVar279;
      auVar160._8_4_ = fVar366 * fVar366 + fVar288 * fVar288;
      auVar160._12_4_ = fVar274 * fVar274 + fVar290 * fVar290;
      auVar160._16_4_ = fVar326 * fVar326 + fVar151 * fVar151;
      auVar160._20_4_ = fVar292 * fVar292 + fVar173 * fVar173;
      auVar160._24_4_ = fVar329 * fVar329 + fVar176 * fVar176;
      auVar160._28_4_ = auVar163._28_4_ + auVar26._28_4_;
      auVar163 = vrsqrtps_avx(auVar160);
      fVar293 = auVar163._0_4_;
      fVar209 = auVar163._4_4_;
      auVar49._4_4_ = fVar209 * 1.5;
      auVar49._0_4_ = fVar293 * 1.5;
      fVar265 = auVar163._8_4_;
      auVar49._8_4_ = fVar265 * 1.5;
      fVar275 = auVar163._12_4_;
      auVar49._12_4_ = fVar275 * 1.5;
      fVar242 = auVar163._16_4_;
      auVar49._16_4_ = fVar242 * 1.5;
      fVar243 = auVar163._20_4_;
      auVar49._20_4_ = fVar243 * 1.5;
      fVar244 = auVar163._24_4_;
      auVar49._24_4_ = fVar244 * 1.5;
      auVar49._28_4_ = fVar210;
      auVar50._4_4_ = fVar209 * fVar209 * fVar209 * auVar160._4_4_ * 0.5;
      auVar50._0_4_ = fVar293 * fVar293 * fVar293 * auVar160._0_4_ * 0.5;
      auVar50._8_4_ = fVar265 * fVar265 * fVar265 * auVar160._8_4_ * 0.5;
      auVar50._12_4_ = fVar275 * fVar275 * fVar275 * auVar160._12_4_ * 0.5;
      auVar50._16_4_ = fVar242 * fVar242 * fVar242 * auVar160._16_4_ * 0.5;
      auVar50._20_4_ = fVar243 * fVar243 * fVar243 * auVar160._20_4_ * 0.5;
      auVar50._24_4_ = fVar244 * fVar244 * fVar244 * auVar160._24_4_ * 0.5;
      auVar50._28_4_ = auVar160._28_4_;
      auVar163 = vsubps_avx(auVar49,auVar50);
      fVar293 = auVar163._0_4_;
      fVar209 = auVar163._4_4_;
      fVar265 = auVar163._8_4_;
      fVar275 = auVar163._12_4_;
      fVar242 = auVar163._16_4_;
      fVar243 = auVar163._20_4_;
      fVar244 = auVar163._24_4_;
      fVar258 = auVar158._0_4_ * fVar258 * fVar289;
      fVar261 = auVar158._4_4_ * fVar261 * fVar296;
      auVar51._4_4_ = fVar261;
      auVar51._0_4_ = fVar258;
      fVar264 = auVar158._8_4_ * fVar264 * fVar379;
      auVar51._8_4_ = fVar264;
      fVar272 = auVar158._12_4_ * fVar272 * fVar273;
      auVar51._12_4_ = fVar272;
      fVar276 = auVar158._16_4_ * fVar276 * fVar277;
      auVar51._16_4_ = fVar276;
      fVar313 = auVar158._20_4_ * fVar313 * fVar327;
      auVar51._20_4_ = fVar313;
      fVar315 = auVar158._24_4_ * fVar315 * fVar328;
      auVar51._24_4_ = fVar315;
      auVar51._28_4_ = fVar179;
      local_8e0._4_4_ = auVar321._4_4_ + fVar261;
      local_8e0._0_4_ = auVar321._0_4_ + fVar258;
      fStack_8d8 = auVar321._8_4_ + fVar264;
      fStack_8d4 = auVar321._12_4_ + fVar272;
      fStack_8d0 = auVar321._16_4_ + fVar276;
      fStack_8cc = auVar321._20_4_ + fVar313;
      fStack_8c8 = auVar321._24_4_ + fVar315;
      fStack_8c4 = auVar321._28_4_ + fVar179;
      fVar258 = auVar158._0_4_ * fVar289 * -fVar295;
      fVar261 = auVar158._4_4_ * fVar296 * -fVar351;
      auVar52._4_4_ = fVar261;
      auVar52._0_4_ = fVar258;
      fVar264 = auVar158._8_4_ * fVar379 * -fVar175;
      auVar52._8_4_ = fVar264;
      fVar272 = auVar158._12_4_ * fVar273 * -fVar178;
      auVar52._12_4_ = fVar272;
      fVar276 = auVar158._16_4_ * fVar277 * -fVar180;
      auVar52._16_4_ = fVar276;
      fVar313 = auVar158._20_4_ * fVar327 * -fVar182;
      auVar52._20_4_ = fVar313;
      fVar315 = auVar158._24_4_ * fVar328 * -fVar186;
      auVar52._24_4_ = fVar315;
      auVar52._28_4_ = fVar210;
      local_680._4_4_ = fVar261 + auVar372._4_4_;
      local_680._0_4_ = fVar258 + auVar372._0_4_;
      fStack_678 = fVar264 + auVar372._8_4_;
      fStack_674 = fVar272 + auVar372._12_4_;
      fStack_670 = fVar276 + auVar372._16_4_;
      fStack_66c = fVar313 + auVar372._20_4_;
      fStack_668 = fVar315 + auVar372._24_4_;
      fStack_664 = fVar210 + auVar372._28_4_;
      fVar258 = fVar289 * 0.0 * auVar158._0_4_;
      fVar289 = fVar296 * 0.0 * auVar158._4_4_;
      auVar53._4_4_ = fVar289;
      auVar53._0_4_ = fVar258;
      fVar261 = fVar379 * 0.0 * auVar158._8_4_;
      auVar53._8_4_ = fVar261;
      fVar296 = fVar273 * 0.0 * auVar158._12_4_;
      auVar53._12_4_ = fVar296;
      fVar264 = fVar277 * 0.0 * auVar158._16_4_;
      auVar53._16_4_ = fVar264;
      fVar379 = fVar327 * 0.0 * auVar158._20_4_;
      auVar53._20_4_ = fVar379;
      fVar272 = fVar328 * 0.0 * auVar158._24_4_;
      auVar53._24_4_ = fVar272;
      auVar53._28_4_ = fVar208;
      auVar282._0_4_ = fVar258 + (float)local_700._0_4_;
      auVar282._4_4_ = fVar289 + (float)local_700._4_4_;
      auVar282._8_4_ = fVar261 + (float)uStack_6f8;
      auVar282._12_4_ = fVar296 + uStack_6f8._4_4_;
      auVar282._16_4_ = fVar264 + (float)uStack_6f0;
      auVar282._20_4_ = fVar379 + uStack_6f0._4_4_;
      auVar282._24_4_ = fVar272 + (float)uStack_6e8;
      auVar282._28_4_ = fVar208 + uStack_6e8._4_4_;
      fVar258 = local_800._0_4_ * fVar291 * fVar293;
      fVar289 = local_800._4_4_ * fVar298 * fVar209;
      auVar54._4_4_ = fVar289;
      auVar54._0_4_ = fVar258;
      fVar291 = local_800._8_4_ * fVar366 * fVar265;
      auVar54._8_4_ = fVar291;
      fVar261 = local_800._12_4_ * fVar274 * fVar275;
      auVar54._12_4_ = fVar261;
      fVar296 = local_800._16_4_ * fVar326 * fVar242;
      auVar54._16_4_ = fVar296;
      fVar298 = local_800._20_4_ * fVar292 * fVar243;
      auVar54._20_4_ = fVar298;
      fVar264 = local_800._24_4_ * fVar329 * fVar244;
      auVar54._24_4_ = fVar264;
      auVar54._28_4_ = auVar28._28_4_;
      auVar30 = vsubps_avx(auVar321,auVar51);
      auVar336._0_4_ = auVar253._0_4_ + fVar258;
      auVar336._4_4_ = auVar253._4_4_ + fVar289;
      auVar336._8_4_ = auVar253._8_4_ + fVar291;
      auVar336._12_4_ = auVar253._12_4_ + fVar261;
      auVar336._16_4_ = auVar253._16_4_ + fVar296;
      auVar336._20_4_ = auVar253._20_4_ + fVar298;
      auVar336._24_4_ = auVar253._24_4_ + fVar264;
      auVar336._28_4_ = auVar253._28_4_ + auVar28._28_4_;
      fVar258 = local_800._0_4_ * fVar293 * -fVar211;
      fVar289 = local_800._4_4_ * fVar209 * -fVar279;
      auVar55._4_4_ = fVar289;
      auVar55._0_4_ = fVar258;
      fVar291 = local_800._8_4_ * fVar265 * -fVar288;
      auVar55._8_4_ = fVar291;
      fVar261 = local_800._12_4_ * fVar275 * -fVar290;
      auVar55._12_4_ = fVar261;
      fVar296 = local_800._16_4_ * fVar242 * -fVar151;
      auVar55._16_4_ = fVar296;
      fVar298 = local_800._20_4_ * fVar243 * -fVar173;
      auVar55._20_4_ = fVar298;
      fVar264 = local_800._24_4_ * fVar244 * -fVar176;
      auVar55._24_4_ = fVar264;
      auVar55._28_4_ = fVar316;
      auVar31 = vsubps_avx(auVar372,auVar52);
      auVar359._0_4_ = (float)local_6e0._0_4_ + fVar258;
      auVar359._4_4_ = (float)local_6e0._4_4_ + fVar289;
      auVar359._8_4_ = fStack_6d8 + fVar291;
      auVar359._12_4_ = fStack_6d4 + fVar261;
      auVar359._16_4_ = auVar235._16_4_ + fVar296;
      auVar359._20_4_ = auVar235._20_4_ + fVar298;
      auVar359._24_4_ = auVar235._24_4_ + fVar264;
      auVar359._28_4_ = auVar235._28_4_ + fVar316;
      fVar258 = local_800._0_4_ * fVar293 * 0.0;
      fVar289 = local_800._4_4_ * fVar209 * 0.0;
      auVar56._4_4_ = fVar289;
      auVar56._0_4_ = fVar258;
      fVar291 = local_800._8_4_ * fVar265 * 0.0;
      auVar56._8_4_ = fVar291;
      fVar293 = local_800._12_4_ * fVar275 * 0.0;
      auVar56._12_4_ = fVar293;
      fVar261 = local_800._16_4_ * fVar242 * 0.0;
      auVar56._16_4_ = fVar261;
      fVar296 = local_800._20_4_ * fVar243 * 0.0;
      auVar56._20_4_ = fVar296;
      fVar298 = local_800._24_4_ * fVar244 * 0.0;
      auVar56._24_4_ = fVar298;
      auVar56._28_4_ = 0x3f000000;
      auVar41 = vsubps_avx(_local_700,auVar53);
      auVar391._0_4_ = fVar258 + (float)local_560._0_4_;
      auVar391._4_4_ = fVar289 + (float)local_560._4_4_;
      auVar391._8_4_ = fVar291 + fStack_558;
      auVar391._12_4_ = fVar293 + fStack_554;
      auVar391._16_4_ = fVar261 + fStack_550;
      auVar391._20_4_ = fVar296 + fStack_54c;
      auVar391._24_4_ = fVar298 + fStack_548;
      auVar391._28_4_ = fStack_544 + 0.5;
      auVar163 = vsubps_avx(auVar253,auVar54);
      auVar26 = vsubps_avx(auVar235,auVar55);
      auVar156 = vsubps_avx(_local_560,auVar56);
      auVar322 = vsubps_avx(auVar359,auVar31);
      auVar27 = vsubps_avx(auVar391,auVar41);
      auVar57._4_4_ = auVar41._4_4_ * auVar322._4_4_;
      auVar57._0_4_ = auVar41._0_4_ * auVar322._0_4_;
      auVar57._8_4_ = auVar41._8_4_ * auVar322._8_4_;
      auVar57._12_4_ = auVar41._12_4_ * auVar322._12_4_;
      auVar57._16_4_ = auVar41._16_4_ * auVar322._16_4_;
      auVar57._20_4_ = auVar41._20_4_ * auVar322._20_4_;
      auVar57._24_4_ = auVar41._24_4_ * auVar322._24_4_;
      auVar57._28_4_ = auVar235._28_4_;
      auVar58._4_4_ = auVar31._4_4_ * auVar27._4_4_;
      auVar58._0_4_ = auVar31._0_4_ * auVar27._0_4_;
      auVar58._8_4_ = auVar31._8_4_ * auVar27._8_4_;
      auVar58._12_4_ = auVar31._12_4_ * auVar27._12_4_;
      auVar58._16_4_ = auVar31._16_4_ * auVar27._16_4_;
      auVar58._20_4_ = auVar31._20_4_ * auVar27._20_4_;
      auVar58._24_4_ = auVar31._24_4_ * auVar27._24_4_;
      auVar58._28_4_ = fStack_544;
      auVar28 = vsubps_avx(auVar58,auVar57);
      auVar59._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar59._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar59._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar59._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar59._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar59._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar59._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar59._28_4_ = auVar27._28_4_;
      auVar29 = vsubps_avx(auVar336,auVar30);
      auVar60._4_4_ = auVar41._4_4_ * auVar29._4_4_;
      auVar60._0_4_ = auVar41._0_4_ * auVar29._0_4_;
      auVar60._8_4_ = auVar41._8_4_ * auVar29._8_4_;
      auVar60._12_4_ = auVar41._12_4_ * auVar29._12_4_;
      auVar60._16_4_ = auVar41._16_4_ * auVar29._16_4_;
      auVar60._20_4_ = auVar41._20_4_ * auVar29._20_4_;
      auVar60._24_4_ = auVar41._24_4_ * auVar29._24_4_;
      auVar60._28_4_ = auVar253._28_4_;
      auVar42 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar29._4_4_ * auVar31._4_4_;
      auVar61._0_4_ = auVar29._0_4_ * auVar31._0_4_;
      auVar61._8_4_ = auVar29._8_4_ * auVar31._8_4_;
      auVar61._12_4_ = auVar29._12_4_ * auVar31._12_4_;
      auVar61._16_4_ = auVar29._16_4_ * auVar31._16_4_;
      auVar61._20_4_ = auVar29._20_4_ * auVar31._20_4_;
      auVar61._24_4_ = auVar29._24_4_ * auVar31._24_4_;
      auVar61._28_4_ = auVar27._28_4_;
      auVar62._4_4_ = auVar30._4_4_ * auVar322._4_4_;
      auVar62._0_4_ = auVar30._0_4_ * auVar322._0_4_;
      auVar62._8_4_ = auVar30._8_4_ * auVar322._8_4_;
      auVar62._12_4_ = auVar30._12_4_ * auVar322._12_4_;
      auVar62._16_4_ = auVar30._16_4_ * auVar322._16_4_;
      auVar62._20_4_ = auVar30._20_4_ * auVar322._20_4_;
      auVar62._24_4_ = auVar30._24_4_ * auVar322._24_4_;
      auVar62._28_4_ = auVar322._28_4_;
      auVar322 = vsubps_avx(auVar62,auVar61);
      auVar161._0_4_ = auVar28._0_4_ * 0.0 + auVar322._0_4_ + auVar42._0_4_ * 0.0;
      auVar161._4_4_ = auVar28._4_4_ * 0.0 + auVar322._4_4_ + auVar42._4_4_ * 0.0;
      auVar161._8_4_ = auVar28._8_4_ * 0.0 + auVar322._8_4_ + auVar42._8_4_ * 0.0;
      auVar161._12_4_ = auVar28._12_4_ * 0.0 + auVar322._12_4_ + auVar42._12_4_ * 0.0;
      auVar161._16_4_ = auVar28._16_4_ * 0.0 + auVar322._16_4_ + auVar42._16_4_ * 0.0;
      auVar161._20_4_ = auVar28._20_4_ * 0.0 + auVar322._20_4_ + auVar42._20_4_ * 0.0;
      auVar161._24_4_ = auVar28._24_4_ * 0.0 + auVar322._24_4_ + auVar42._24_4_ * 0.0;
      auVar161._28_4_ = auVar322._28_4_ + auVar322._28_4_ + auVar42._28_4_;
      auVar42 = vcmpps_avx(auVar161,ZEXT432(0) << 0x20,2);
      auVar163 = vblendvps_avx(auVar163,_local_8e0,auVar42);
      auVar26 = vblendvps_avx(auVar26,_local_680,auVar42);
      auVar322 = vblendvps_avx(auVar156,auVar282,auVar42);
      auVar286 = ZEXT3264(auVar322);
      auVar27 = vblendvps_avx(auVar30,auVar336,auVar42);
      auVar28 = vblendvps_avx(auVar31,auVar359,auVar42);
      auVar29 = vblendvps_avx(auVar41,auVar391,auVar42);
      auVar30 = vblendvps_avx(auVar336,auVar30,auVar42);
      auVar31 = vblendvps_avx(auVar359,auVar31,auVar42);
      auVar216 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
      auVar41 = vblendvps_avx(auVar391,auVar41,auVar42);
      auVar30 = vsubps_avx(auVar30,auVar163);
      auVar308 = vsubps_avx(auVar31,auVar26);
      auVar41 = vsubps_avx(auVar41,auVar322);
      auVar157 = vsubps_avx(auVar26,auVar28);
      fVar258 = auVar308._0_4_;
      fVar186 = auVar322._0_4_;
      fVar296 = auVar308._4_4_;
      fVar211 = auVar322._4_4_;
      auVar63._4_4_ = fVar211 * fVar296;
      auVar63._0_4_ = fVar186 * fVar258;
      fVar366 = auVar308._8_4_;
      fVar279 = auVar322._8_4_;
      auVar63._8_4_ = fVar279 * fVar366;
      fVar275 = auVar308._12_4_;
      fVar288 = auVar322._12_4_;
      auVar63._12_4_ = fVar288 * fVar275;
      fVar313 = auVar308._16_4_;
      fVar290 = auVar322._16_4_;
      auVar63._16_4_ = fVar290 * fVar313;
      fVar328 = auVar308._20_4_;
      fVar151 = auVar322._20_4_;
      auVar63._20_4_ = fVar151 * fVar328;
      fVar351 = auVar308._24_4_;
      fVar173 = auVar322._24_4_;
      auVar63._24_4_ = fVar173 * fVar351;
      auVar63._28_4_ = auVar31._28_4_;
      fVar289 = auVar26._0_4_;
      fVar330 = auVar41._0_4_;
      fVar298 = auVar26._4_4_;
      fVar340 = auVar41._4_4_;
      auVar64._4_4_ = fVar340 * fVar298;
      auVar64._0_4_ = fVar330 * fVar289;
      fVar265 = auVar26._8_4_;
      fVar300 = auVar41._8_4_;
      auVar64._8_4_ = fVar300 * fVar265;
      fVar276 = auVar26._12_4_;
      fVar343 = auVar41._12_4_;
      auVar64._12_4_ = fVar343 * fVar276;
      fVar327 = auVar26._16_4_;
      fVar345 = auVar41._16_4_;
      auVar64._16_4_ = fVar345 * fVar327;
      fVar329 = auVar26._20_4_;
      fVar347 = auVar41._20_4_;
      auVar64._20_4_ = fVar347 * fVar329;
      fVar175 = auVar26._24_4_;
      fVar349 = auVar41._24_4_;
      uVar149 = auVar156._28_4_;
      auVar64._24_4_ = fVar349 * fVar175;
      auVar64._28_4_ = uVar149;
      auVar26 = vsubps_avx(auVar64,auVar63);
      fVar291 = auVar163._0_4_;
      fVar209 = auVar163._4_4_;
      auVar65._4_4_ = fVar340 * fVar209;
      auVar65._0_4_ = fVar330 * fVar291;
      fVar272 = auVar163._8_4_;
      auVar65._8_4_ = fVar300 * fVar272;
      fVar277 = auVar163._12_4_;
      auVar65._12_4_ = fVar343 * fVar277;
      fVar292 = auVar163._16_4_;
      auVar65._16_4_ = fVar345 * fVar292;
      fVar244 = auVar163._20_4_;
      auVar65._20_4_ = fVar347 * fVar244;
      fVar178 = auVar163._24_4_;
      auVar65._24_4_ = fVar349 * fVar178;
      auVar65._28_4_ = uVar149;
      fVar293 = auVar30._0_4_;
      fVar264 = auVar30._4_4_;
      auVar66._4_4_ = fVar211 * fVar264;
      auVar66._0_4_ = fVar186 * fVar293;
      fVar273 = auVar30._8_4_;
      auVar66._8_4_ = fVar279 * fVar273;
      fVar326 = auVar30._12_4_;
      auVar66._12_4_ = fVar288 * fVar326;
      fVar243 = auVar30._16_4_;
      auVar66._16_4_ = fVar290 * fVar243;
      fVar210 = auVar30._20_4_;
      auVar66._20_4_ = fVar151 * fVar210;
      fVar180 = auVar30._24_4_;
      auVar66._24_4_ = fVar173 * fVar180;
      auVar66._28_4_ = auVar391._28_4_;
      auVar31 = vsubps_avx(auVar66,auVar65);
      auVar67._4_4_ = fVar298 * fVar264;
      auVar67._0_4_ = fVar289 * fVar293;
      auVar67._8_4_ = fVar265 * fVar273;
      auVar67._12_4_ = fVar276 * fVar326;
      auVar67._16_4_ = fVar327 * fVar243;
      auVar67._20_4_ = fVar329 * fVar210;
      auVar67._24_4_ = fVar175 * fVar180;
      auVar67._28_4_ = uVar149;
      auVar399._0_4_ = fVar291 * fVar258;
      auVar399._4_4_ = fVar209 * fVar296;
      auVar399._8_4_ = fVar272 * fVar366;
      auVar399._12_4_ = fVar277 * fVar275;
      auVar399._16_4_ = fVar292 * fVar313;
      auVar399._20_4_ = fVar244 * fVar328;
      auVar399._24_4_ = fVar178 * fVar351;
      auVar399._28_4_ = 0;
      auVar156 = vsubps_avx(auVar399,auVar67);
      auVar192 = vsubps_avx(auVar322,auVar29);
      fVar261 = auVar156._28_4_ + auVar31._28_4_;
      auVar196._0_4_ = auVar156._0_4_ + auVar31._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
      auVar196._4_4_ = auVar156._4_4_ + auVar31._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
      auVar196._8_4_ = auVar156._8_4_ + auVar31._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
      auVar196._12_4_ = auVar156._12_4_ + auVar31._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
      auVar196._16_4_ = auVar156._16_4_ + auVar31._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
      auVar196._20_4_ = auVar156._20_4_ + auVar31._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
      auVar196._24_4_ = auVar156._24_4_ + auVar31._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
      auVar196._28_4_ = fVar261 + auVar26._28_4_;
      fVar176 = auVar157._0_4_;
      fVar179 = auVar157._4_4_;
      auVar68._4_4_ = fVar179 * auVar29._4_4_;
      auVar68._0_4_ = fVar176 * auVar29._0_4_;
      fVar181 = auVar157._8_4_;
      auVar68._8_4_ = fVar181 * auVar29._8_4_;
      fVar183 = auVar157._12_4_;
      auVar68._12_4_ = fVar183 * auVar29._12_4_;
      fVar184 = auVar157._16_4_;
      auVar68._16_4_ = fVar184 * auVar29._16_4_;
      fVar185 = auVar157._20_4_;
      auVar68._20_4_ = fVar185 * auVar29._20_4_;
      fVar263 = auVar157._24_4_;
      auVar68._24_4_ = fVar263 * auVar29._24_4_;
      auVar68._28_4_ = fVar261;
      fVar261 = auVar192._0_4_;
      fVar379 = auVar192._4_4_;
      auVar69._4_4_ = auVar28._4_4_ * fVar379;
      auVar69._0_4_ = auVar28._0_4_ * fVar261;
      fVar274 = auVar192._8_4_;
      auVar69._8_4_ = auVar28._8_4_ * fVar274;
      fVar242 = auVar192._12_4_;
      auVar69._12_4_ = auVar28._12_4_ * fVar242;
      fVar315 = auVar192._16_4_;
      auVar69._16_4_ = auVar28._16_4_ * fVar315;
      fVar295 = auVar192._20_4_;
      auVar69._20_4_ = auVar28._20_4_ * fVar295;
      fVar182 = auVar192._24_4_;
      auVar69._24_4_ = auVar28._24_4_ * fVar182;
      auVar69._28_4_ = auVar156._28_4_;
      auVar31 = vsubps_avx(auVar69,auVar68);
      auVar163 = vsubps_avx(auVar163,auVar27);
      fVar294 = auVar163._0_4_;
      fVar297 = auVar163._4_4_;
      auVar70._4_4_ = fVar297 * auVar29._4_4_;
      auVar70._0_4_ = fVar294 * auVar29._0_4_;
      fVar299 = auVar163._8_4_;
      auVar70._8_4_ = fVar299 * auVar29._8_4_;
      fVar301 = auVar163._12_4_;
      auVar70._12_4_ = fVar301 * auVar29._12_4_;
      fVar311 = auVar163._16_4_;
      auVar70._16_4_ = fVar311 * auVar29._16_4_;
      fVar312 = auVar163._20_4_;
      auVar70._20_4_ = fVar312 * auVar29._20_4_;
      fVar314 = auVar163._24_4_;
      auVar70._24_4_ = fVar314 * auVar29._24_4_;
      auVar70._28_4_ = auVar29._28_4_;
      auVar71._4_4_ = auVar27._4_4_ * fVar379;
      auVar71._0_4_ = auVar27._0_4_ * fVar261;
      auVar71._8_4_ = auVar27._8_4_ * fVar274;
      auVar71._12_4_ = auVar27._12_4_ * fVar242;
      auVar71._16_4_ = auVar27._16_4_ * fVar315;
      auVar71._20_4_ = auVar27._20_4_ * fVar295;
      auVar71._24_4_ = auVar27._24_4_ * fVar182;
      auVar71._28_4_ = auVar26._28_4_;
      auVar163 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = auVar28._4_4_ * fVar297;
      auVar72._0_4_ = auVar28._0_4_ * fVar294;
      auVar72._8_4_ = auVar28._8_4_ * fVar299;
      auVar72._12_4_ = auVar28._12_4_ * fVar301;
      auVar72._16_4_ = auVar28._16_4_ * fVar311;
      auVar72._20_4_ = auVar28._20_4_ * fVar312;
      auVar72._24_4_ = auVar28._24_4_ * fVar314;
      auVar72._28_4_ = auVar29._28_4_;
      auVar73._4_4_ = auVar27._4_4_ * fVar179;
      auVar73._0_4_ = auVar27._0_4_ * fVar176;
      auVar73._8_4_ = auVar27._8_4_ * fVar181;
      auVar73._12_4_ = auVar27._12_4_ * fVar183;
      auVar73._16_4_ = auVar27._16_4_ * fVar184;
      auVar73._20_4_ = auVar27._20_4_ * fVar185;
      auVar73._24_4_ = auVar27._24_4_ * fVar263;
      auVar73._28_4_ = auVar27._28_4_;
      auVar26 = vsubps_avx(auVar73,auVar72);
      auVar255._0_4_ = auVar31._0_4_ * 0.0 + auVar26._0_4_ + auVar163._0_4_ * 0.0;
      auVar255._4_4_ = auVar31._4_4_ * 0.0 + auVar26._4_4_ + auVar163._4_4_ * 0.0;
      auVar255._8_4_ = auVar31._8_4_ * 0.0 + auVar26._8_4_ + auVar163._8_4_ * 0.0;
      auVar255._12_4_ = auVar31._12_4_ * 0.0 + auVar26._12_4_ + auVar163._12_4_ * 0.0;
      auVar255._16_4_ = auVar31._16_4_ * 0.0 + auVar26._16_4_ + auVar163._16_4_ * 0.0;
      auVar255._20_4_ = auVar31._20_4_ * 0.0 + auVar26._20_4_ + auVar163._20_4_ * 0.0;
      auVar255._24_4_ = auVar31._24_4_ * 0.0 + auVar26._24_4_ + auVar163._24_4_ * 0.0;
      auVar255._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar163._28_4_;
      auVar163 = vmaxps_avx(auVar196,auVar255);
      auVar163 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
      auVar218 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
      auVar216 = vpand_avx(auVar218,auVar216);
      auVar218 = vpmovsxwd_avx(auVar216);
      auVar231 = vpunpckhwd_avx(auVar216,auVar216);
      auVar237._16_16_ = auVar231;
      auVar237._0_16_ = auVar218;
      if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar237 >> 0x7f,0) == '\0') &&
            (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar231 >> 0x3f,0) == '\0') &&
          (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar231[0xf]
         ) {
LAB_00ae7ba6:
        auVar205 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar163 = vcmpps_avx(auVar308,auVar308,0xf);
        auVar271 = ZEXT3264(auVar163);
        auVar325 = ZEXT3264(auVar320);
      }
      else {
        auVar74._4_4_ = fVar379 * fVar296;
        auVar74._0_4_ = fVar261 * fVar258;
        auVar74._8_4_ = fVar274 * fVar366;
        auVar74._12_4_ = fVar242 * fVar275;
        auVar74._16_4_ = fVar315 * fVar313;
        auVar74._20_4_ = fVar295 * fVar328;
        auVar74._24_4_ = fVar182 * fVar351;
        auVar74._28_4_ = auVar231._12_4_;
        auVar373._0_4_ = fVar176 * fVar330;
        auVar373._4_4_ = fVar179 * fVar340;
        auVar373._8_4_ = fVar181 * fVar300;
        auVar373._12_4_ = fVar183 * fVar343;
        auVar373._16_4_ = fVar184 * fVar345;
        auVar373._20_4_ = fVar185 * fVar347;
        auVar373._24_4_ = fVar263 * fVar349;
        auVar373._28_4_ = 0;
        auVar163 = vsubps_avx(auVar373,auVar74);
        auVar75._4_4_ = fVar297 * fVar340;
        auVar75._0_4_ = fVar294 * fVar330;
        auVar75._8_4_ = fVar299 * fVar300;
        auVar75._12_4_ = fVar301 * fVar343;
        auVar75._16_4_ = fVar311 * fVar345;
        auVar75._20_4_ = fVar312 * fVar347;
        auVar75._24_4_ = fVar314 * fVar349;
        auVar75._28_4_ = auVar41._28_4_;
        auVar76._4_4_ = fVar379 * fVar264;
        auVar76._0_4_ = fVar261 * fVar293;
        auVar76._8_4_ = fVar274 * fVar273;
        auVar76._12_4_ = fVar242 * fVar326;
        auVar76._16_4_ = fVar315 * fVar243;
        auVar76._20_4_ = fVar295 * fVar210;
        auVar76._24_4_ = fVar182 * fVar180;
        auVar76._28_4_ = auVar192._28_4_;
        auVar26 = vsubps_avx(auVar76,auVar75);
        auVar77._4_4_ = fVar179 * fVar264;
        auVar77._0_4_ = fVar176 * fVar293;
        auVar77._8_4_ = fVar181 * fVar273;
        auVar77._12_4_ = fVar183 * fVar326;
        auVar77._16_4_ = fVar184 * fVar243;
        auVar77._20_4_ = fVar185 * fVar210;
        auVar77._24_4_ = fVar263 * fVar180;
        auVar77._28_4_ = auVar196._28_4_;
        auVar78._4_4_ = fVar297 * fVar296;
        auVar78._0_4_ = fVar294 * fVar258;
        auVar78._8_4_ = fVar299 * fVar366;
        auVar78._12_4_ = fVar301 * fVar275;
        auVar78._16_4_ = fVar311 * fVar313;
        auVar78._20_4_ = fVar312 * fVar328;
        fVar258 = auVar308._28_4_;
        auVar78._24_4_ = fVar314 * fVar351;
        auVar78._28_4_ = fVar258;
        auVar28 = vsubps_avx(auVar78,auVar77);
        auVar308._0_4_ = auVar163._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
        auVar308._4_4_ = auVar163._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
        auVar308._8_4_ = auVar163._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
        auVar308._12_4_ = auVar163._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
        auVar308._16_4_ = auVar163._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
        auVar308._20_4_ = auVar163._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
        auVar308._24_4_ = auVar163._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
        auVar308._28_4_ = fVar258 + auVar28._28_4_ + auVar196._28_4_;
        auVar27 = vrcpps_avx(auVar308);
        fVar258 = auVar27._0_4_;
        fVar293 = auVar27._4_4_;
        auVar79._4_4_ = auVar308._4_4_ * fVar293;
        auVar79._0_4_ = auVar308._0_4_ * fVar258;
        fVar261 = auVar27._8_4_;
        auVar79._8_4_ = auVar308._8_4_ * fVar261;
        fVar296 = auVar27._12_4_;
        auVar79._12_4_ = auVar308._12_4_ * fVar296;
        fVar264 = auVar27._16_4_;
        auVar79._16_4_ = auVar308._16_4_ * fVar264;
        fVar379 = auVar27._20_4_;
        auVar79._20_4_ = auVar308._20_4_ * fVar379;
        fVar366 = auVar27._24_4_;
        auVar79._24_4_ = auVar308._24_4_ * fVar366;
        auVar79._28_4_ = auVar192._28_4_;
        auVar374._8_4_ = 0x3f800000;
        auVar374._0_8_ = 0x3f8000003f800000;
        auVar374._12_4_ = 0x3f800000;
        auVar374._16_4_ = 0x3f800000;
        auVar374._20_4_ = 0x3f800000;
        auVar374._24_4_ = 0x3f800000;
        auVar374._28_4_ = 0x3f800000;
        auVar29 = vsubps_avx(auVar374,auVar79);
        fVar258 = auVar29._0_4_ * fVar258 + fVar258;
        fVar293 = auVar29._4_4_ * fVar293 + fVar293;
        fVar261 = auVar29._8_4_ * fVar261 + fVar261;
        fVar296 = auVar29._12_4_ * fVar296 + fVar296;
        fVar264 = auVar29._16_4_ * fVar264 + fVar264;
        fVar379 = auVar29._20_4_ * fVar379 + fVar379;
        fVar366 = auVar29._24_4_ * fVar366 + fVar366;
        auVar80._4_4_ =
             (auVar163._4_4_ * fVar209 + auVar26._4_4_ * fVar298 + auVar28._4_4_ * fVar211) *
             fVar293;
        auVar80._0_4_ =
             (auVar163._0_4_ * fVar291 + auVar26._0_4_ * fVar289 + auVar28._0_4_ * fVar186) *
             fVar258;
        auVar80._8_4_ =
             (auVar163._8_4_ * fVar272 + auVar26._8_4_ * fVar265 + auVar28._8_4_ * fVar279) *
             fVar261;
        auVar80._12_4_ =
             (auVar163._12_4_ * fVar277 + auVar26._12_4_ * fVar276 + auVar28._12_4_ * fVar288) *
             fVar296;
        auVar80._16_4_ =
             (auVar163._16_4_ * fVar292 + auVar26._16_4_ * fVar327 + auVar28._16_4_ * fVar290) *
             fVar264;
        auVar80._20_4_ =
             (auVar163._20_4_ * fVar244 + auVar26._20_4_ * fVar329 + auVar28._20_4_ * fVar151) *
             fVar379;
        auVar80._24_4_ =
             (auVar163._24_4_ * fVar178 + auVar26._24_4_ * fVar175 + auVar28._24_4_ * fVar173) *
             fVar366;
        auVar80._28_4_ = auVar30._28_4_ + auVar322._28_4_;
        auVar218 = vpermilps_avx(ZEXT416(uVar139),0);
        auVar162._16_16_ = auVar218;
        auVar162._0_16_ = auVar218;
        auVar163 = vcmpps_avx(auVar162,auVar80,2);
        uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar238._4_4_ = uVar149;
        auVar238._0_4_ = uVar149;
        auVar238._8_4_ = uVar149;
        auVar238._12_4_ = uVar149;
        auVar238._16_4_ = uVar149;
        auVar238._20_4_ = uVar149;
        auVar238._24_4_ = uVar149;
        auVar238._28_4_ = uVar149;
        auVar26 = vcmpps_avx(auVar80,auVar238,2);
        auVar163 = vandps_avx(auVar26,auVar163);
        auVar218 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auVar216 = vpand_avx(auVar216,auVar218);
        auVar218 = vpmovsxwd_avx(auVar216);
        auVar231 = vpshufd_avx(auVar216,0xee);
        auVar231 = vpmovsxwd_avx(auVar231);
        auVar286 = ZEXT1664(auVar231);
        auVar239._16_16_ = auVar231;
        auVar239._0_16_ = auVar218;
        if ((((((((auVar239 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar239 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar239 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar239 >> 0x7f,0) == '\0') &&
              (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar231 >> 0x3f,0) == '\0') &&
            (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar231[0xf]) goto LAB_00ae7ba6;
        auVar163 = vcmpps_avx(ZEXT832(0) << 0x20,auVar308,4);
        auVar218 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
        auVar216 = vpand_avx(auVar216,auVar218);
        auVar218 = vpmovsxwd_avx(auVar216);
        auVar216 = vpunpckhwd_avx(auVar216,auVar216);
        auVar283._16_16_ = auVar216;
        auVar283._0_16_ = auVar218;
        auVar286 = ZEXT3264(auVar283);
        auVar205 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar163 = vcmpps_avx(auVar308,auVar308,0xf);
        auVar271 = ZEXT3264(auVar163);
        auVar325 = ZEXT3264(auVar320);
        if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar283 >> 0x7f,0) != '\0') ||
              (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar216 >> 0x3f,0) != '\0') ||
            (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar216[0xf] < '\0') {
          auVar81._4_4_ = auVar196._4_4_ * fVar293;
          auVar81._0_4_ = auVar196._0_4_ * fVar258;
          auVar81._8_4_ = auVar196._8_4_ * fVar261;
          auVar81._12_4_ = auVar196._12_4_ * fVar296;
          auVar81._16_4_ = auVar196._16_4_ * fVar264;
          auVar81._20_4_ = auVar196._20_4_ * fVar379;
          auVar81._24_4_ = auVar196._24_4_ * fVar366;
          auVar81._28_4_ = SUB84(uStack_5e8,4);
          auVar82._4_4_ = auVar255._4_4_ * fVar293;
          auVar82._0_4_ = auVar255._0_4_ * fVar258;
          auVar82._8_4_ = auVar255._8_4_ * fVar261;
          auVar82._12_4_ = auVar255._12_4_ * fVar296;
          auVar82._16_4_ = auVar255._16_4_ * fVar264;
          auVar82._20_4_ = auVar255._20_4_ * fVar379;
          auVar82._24_4_ = auVar255._24_4_ * fVar366;
          auVar82._28_4_ = auVar29._28_4_ + auVar27._28_4_;
          auVar256._8_4_ = 0x3f800000;
          auVar256._0_8_ = 0x3f8000003f800000;
          auVar256._12_4_ = 0x3f800000;
          auVar256._16_4_ = 0x3f800000;
          auVar256._20_4_ = 0x3f800000;
          auVar256._24_4_ = 0x3f800000;
          auVar256._28_4_ = 0x3f800000;
          auVar163 = vsubps_avx(auVar256,auVar81);
          auVar163 = vblendvps_avx(auVar163,auVar81,auVar42);
          auVar325 = ZEXT3264(auVar163);
          auVar163 = vsubps_avx(auVar256,auVar82);
          _local_480 = vblendvps_avx(auVar163,auVar82,auVar42);
          auVar205 = ZEXT3264(auVar283);
          local_460 = auVar80;
        }
      }
      auVar386 = ZEXT3264(local_800);
      auVar339 = ZEXT3264(local_7a0);
      auVar163 = auVar205._0_32_;
      if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar163 >> 0x7f,0) != '\0') ||
            (auVar205 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar163 >> 0xbf,0) != '\0') ||
          (auVar205 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar205[0x1f] < '\0') {
        auVar320 = vsubps_avx(local_800,auVar158);
        fVar289 = auVar158._0_4_ + auVar325._0_4_ * auVar320._0_4_;
        fVar291 = auVar158._4_4_ + auVar325._4_4_ * auVar320._4_4_;
        fVar293 = auVar158._8_4_ + auVar325._8_4_ * auVar320._8_4_;
        fVar261 = auVar158._12_4_ + auVar325._12_4_ * auVar320._12_4_;
        fVar296 = auVar158._16_4_ + auVar325._16_4_ * auVar320._16_4_;
        fVar298 = auVar158._20_4_ + auVar325._20_4_ * auVar320._20_4_;
        fVar209 = auVar158._24_4_ + auVar325._24_4_ * auVar320._24_4_;
        fVar264 = auVar320._28_4_ + 0.0;
        fVar258 = *(float *)((long)local_708->ray_space + k * 4 + -0x20);
        auVar83._4_4_ = (fVar291 + fVar291) * fVar258;
        auVar83._0_4_ = (fVar289 + fVar289) * fVar258;
        auVar83._8_4_ = (fVar293 + fVar293) * fVar258;
        auVar83._12_4_ = (fVar261 + fVar261) * fVar258;
        auVar83._16_4_ = (fVar296 + fVar296) * fVar258;
        auVar83._20_4_ = (fVar298 + fVar298) * fVar258;
        auVar83._24_4_ = (fVar209 + fVar209) * fVar258;
        auVar83._28_4_ = fVar264 + fVar264;
        auVar320 = vcmpps_avx(local_460,auVar83,6);
        auVar26 = auVar163 & auVar320;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0x7f,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0xbf,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar26[0x1f]) goto LAB_00ae66da;
        local_3c0 = (float)local_480._0_4_ + (float)local_480._0_4_ + -1.0;
        fStack_3bc = (float)local_480._4_4_ + (float)local_480._4_4_ + -1.0;
        fStack_3b8 = (float)uStack_478 + (float)uStack_478 + -1.0;
        fStack_3b4 = uStack_478._4_4_ + uStack_478._4_4_ + -1.0;
        fStack_3b0 = (float)uStack_470 + (float)uStack_470 + -1.0;
        fStack_3ac = uStack_470._4_4_ + uStack_470._4_4_ + -1.0;
        fStack_3a8 = (float)uStack_468 + (float)uStack_468 + -1.0;
        fStack_3a4 = uStack_468._4_4_ + uStack_468._4_4_ + -1.0;
        auVar322 = auVar325._0_32_;
        local_480._4_4_ = fStack_3bc;
        local_480._0_4_ = local_3c0;
        uStack_478._0_4_ = fStack_3b8;
        uStack_478._4_4_ = fStack_3b4;
        uStack_470._0_4_ = fStack_3b0;
        uStack_470._4_4_ = fStack_3ac;
        auVar138 = _local_480;
        uStack_468._0_4_ = fStack_3a8;
        uStack_468._4_4_ = fStack_3a4;
        auVar26 = _local_480;
        local_3a0 = local_460;
        local_380 = 0;
        uStack_368 = uStack_8e8;
        uStack_358 = uStack_838;
        uStack_348 = uStack_848;
        uStack_338 = uStack_858;
        _local_480 = auVar26;
        if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          local_640 = vandps_avx(auVar320,auVar163);
          auVar213._0_4_ = 1.0 / auVar230._0_4_;
          auVar213._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar267 = vshufps_avx(auVar213,auVar213,0);
          local_300[0] = auVar267._0_4_ * (auVar325._0_4_ + 0.0);
          local_300[1] = auVar267._4_4_ * (auVar325._4_4_ + 1.0);
          local_300[2] = auVar267._8_4_ * (auVar325._8_4_ + 2.0);
          local_300[3] = auVar267._12_4_ * (auVar325._12_4_ + 3.0);
          fStack_2f0 = auVar267._0_4_ * (auVar325._16_4_ + 4.0);
          fStack_2ec = auVar267._4_4_ * (auVar325._20_4_ + 5.0);
          fStack_2e8 = auVar267._8_4_ * (auVar325._24_4_ + 6.0);
          fStack_2e4 = auVar325._28_4_ + 7.0;
          uStack_470 = auVar138._16_8_;
          uStack_468 = auVar26._24_8_;
          local_2e0 = local_480;
          uStack_2d8 = uStack_478;
          uStack_2d0 = uStack_470;
          uStack_2c8 = uStack_468;
          local_2c0 = local_460;
          auVar197._8_4_ = 0x7f800000;
          auVar197._0_8_ = 0x7f8000007f800000;
          auVar197._12_4_ = 0x7f800000;
          auVar197._16_4_ = 0x7f800000;
          auVar197._20_4_ = 0x7f800000;
          auVar197._24_4_ = 0x7f800000;
          auVar197._28_4_ = 0x7f800000;
          auVar163 = vblendvps_avx(auVar197,local_460,local_640);
          auVar320 = vshufps_avx(auVar163,auVar163,0xb1);
          auVar320 = vminps_avx(auVar163,auVar320);
          auVar26 = vshufpd_avx(auVar320,auVar320,5);
          auVar320 = vminps_avx(auVar320,auVar26);
          auVar26 = vperm2f128_avx(auVar320,auVar320,1);
          auVar320 = vminps_avx(auVar320,auVar26);
          auVar320 = vcmpps_avx(auVar163,auVar320,0);
          auVar26 = local_640 & auVar320;
          auVar163 = local_640;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar163 = vandps_avx(auVar320,local_640);
          }
          uVar140 = vmovmskps_avx(auVar163);
          uVar142 = 0;
          if (uVar140 != 0) {
            for (; (uVar140 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
            }
          }
          uVar145 = (ulong)uVar142;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar258 = local_300[uVar145];
            uVar149 = *(undefined4 *)((long)&local_2e0 + uVar145 * 4);
            fVar291 = 1.0 - fVar258;
            fVar289 = fVar258 * fVar291 * 4.0;
            auVar286 = ZEXT464(0x3f000000);
            auVar267 = ZEXT416((uint)(fVar258 * fVar258 * 0.5));
            auVar267 = vshufps_avx(auVar267,auVar267,0);
            auVar216 = ZEXT416((uint)((fVar291 * fVar291 + fVar289) * 0.5));
            auVar216 = vshufps_avx(auVar216,auVar216,0);
            auVar218 = ZEXT416((uint)((-fVar258 * fVar258 - fVar289) * 0.5));
            auVar218 = vshufps_avx(auVar218,auVar218,0);
            auVar231 = ZEXT416((uint)(fVar291 * -fVar291 * 0.5));
            auVar231 = vshufps_avx(auVar231,auVar231,0);
            auVar214._0_4_ =
                 auVar231._0_4_ * fVar302 +
                 auVar218._0_4_ * fVar387 + auVar267._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
            auVar214._4_4_ =
                 auVar231._4_4_ * fVar310 +
                 auVar218._4_4_ * fVar392 + auVar267._4_4_ * fVar378 + auVar216._4_4_ * fVar401;
            auVar214._8_4_ =
                 auVar231._8_4_ * auVar303._8_4_ +
                 auVar218._8_4_ * auVar388._8_4_ +
                 auVar267._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
            auVar214._12_4_ =
                 auVar231._12_4_ * auVar303._12_4_ +
                 auVar218._12_4_ * auVar388._12_4_ +
                 auVar267._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar145 * 4);
            *(float *)(ray + k * 4 + 0x180) = auVar214._0_4_;
            uVar21 = vextractps_avx(auVar214,1);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
            uVar21 = vextractps_avx(auVar214,2);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
            *(float *)(ray + k * 4 + 0x1e0) = fVar258;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
            *(uint *)(ray + k * 4 + 0x220) = uVar19;
            *(uint *)(ray + k * 4 + 0x240) = uVar141;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
          else {
            auVar267 = vpermilps_avx(local_510,0);
            register0x00001210 = auVar267;
            _local_6c0 = auVar267;
            auVar267 = vpermilps_avx(ZEXT416(uVar19),0);
            register0x00001210 = auVar267;
            _local_7c0 = auVar267;
            local_660 = ZEXT1632(*local_718);
            uStack_6d0 = *(undefined8 *)(local_720 + 0x10);
            uStack_6c8 = *(undefined8 *)(local_720 + 0x18);
            uStack_6f0 = *(undefined8 *)(local_720 + 0x10);
            _local_700 = *local_718;
            uStack_6e8 = *(undefined8 *)(local_720 + 0x18);
            auVar205 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            local_3e0 = auVar322;
            local_37c = uVar20;
            local_370 = auVar303._0_8_;
            local_360 = auVar388._0_8_;
            local_350 = auVar395._0_8_;
            local_340 = auVar368._0_8_;
            while( true ) {
              local_200 = local_300[uVar145];
              local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar145 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar145 * 4);
              fVar289 = 1.0 - local_200;
              fVar258 = local_200 * fVar289 * 4.0;
              auVar286 = ZEXT464(0x3f000000);
              auVar267 = ZEXT416((uint)(local_200 * local_200 * 0.5));
              auVar267 = vshufps_avx(auVar267,auVar267,0);
              auVar216 = ZEXT416((uint)((fVar289 * fVar289 + fVar258) * 0.5));
              auVar216 = vshufps_avx(auVar216,auVar216,0);
              auVar218 = ZEXT416((uint)((-local_200 * local_200 - fVar258) * 0.5));
              auVar218 = vshufps_avx(auVar218,auVar218,0);
              local_830.context = context->user;
              auVar231 = ZEXT416((uint)(fVar289 * -fVar289 * 0.5));
              auVar231 = vshufps_avx(auVar231,auVar231,0);
              auVar220._0_4_ =
                   auVar231._0_4_ * fVar302 +
                   auVar218._0_4_ * fVar387 + auVar267._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
              auVar220._4_4_ =
                   auVar231._4_4_ * fVar310 +
                   auVar218._4_4_ * fVar392 + auVar267._4_4_ * fVar378 + auVar216._4_4_ * fVar401;
              auVar220._8_4_ =
                   auVar231._8_4_ * auVar303._8_4_ +
                   auVar218._8_4_ * auVar388._8_4_ +
                   auVar267._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
              auVar220._12_4_ =
                   auVar231._12_4_ * auVar303._12_4_ +
                   auVar218._12_4_ * auVar388._12_4_ +
                   auVar267._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
              auStack_250 = vshufps_avx(auVar220,auVar220,0);
              local_260[0] = (RTCHitN)auStack_250[0];
              local_260[1] = (RTCHitN)auStack_250[1];
              local_260[2] = (RTCHitN)auStack_250[2];
              local_260[3] = (RTCHitN)auStack_250[3];
              local_260[4] = (RTCHitN)auStack_250[4];
              local_260[5] = (RTCHitN)auStack_250[5];
              local_260[6] = (RTCHitN)auStack_250[6];
              local_260[7] = (RTCHitN)auStack_250[7];
              local_260[8] = (RTCHitN)auStack_250[8];
              local_260[9] = (RTCHitN)auStack_250[9];
              local_260[10] = (RTCHitN)auStack_250[10];
              local_260[0xb] = (RTCHitN)auStack_250[0xb];
              local_260[0xc] = (RTCHitN)auStack_250[0xc];
              local_260[0xd] = (RTCHitN)auStack_250[0xd];
              local_260[0xe] = (RTCHitN)auStack_250[0xe];
              local_260[0xf] = (RTCHitN)auStack_250[0xf];
              auStack_230 = vshufps_avx(auVar220,auVar220,0x55);
              local_240 = auStack_230;
              auStack_210 = vshufps_avx(auVar220,auVar220,0xaa);
              local_220 = auStack_210;
              fStack_1fc = local_200;
              fStack_1f8 = local_200;
              fStack_1f4 = local_200;
              fStack_1f0 = local_200;
              fStack_1ec = local_200;
              fStack_1e8 = local_200;
              fStack_1e4 = local_200;
              uStack_1dc = local_1e0;
              uStack_1d8 = local_1e0;
              uStack_1d4 = local_1e0;
              uStack_1d0 = local_1e0;
              uStack_1cc = local_1e0;
              uStack_1c8 = local_1e0;
              uStack_1c4 = local_1e0;
              local_1c0 = local_7c0;
              uStack_1b8 = uStack_7b8;
              uStack_1b0 = uStack_7b0;
              uStack_1a8 = uStack_7a8;
              local_1a0 = local_6c0;
              uStack_198 = uStack_6b8;
              uStack_190 = uStack_6b0;
              uStack_188 = uStack_6a8;
              local_710[1] = auVar271._0_32_;
              *local_710 = auVar271._0_32_;
              local_180 = (local_830.context)->instID[0];
              uStack_17c = local_180;
              uStack_178 = local_180;
              uStack_174 = local_180;
              uStack_170 = local_180;
              uStack_16c = local_180;
              uStack_168 = local_180;
              uStack_164 = local_180;
              local_160 = (local_830.context)->instPrimID[0];
              uStack_15c = local_160;
              uStack_158 = local_160;
              uStack_154 = local_160;
              uStack_150 = local_160;
              uStack_14c = local_160;
              uStack_148 = local_160;
              uStack_144 = local_160;
              local_760 = local_700;
              uStack_758 = uStack_6f8;
              uStack_750 = uStack_6f0;
              uStack_748 = uStack_6e8;
              local_830.valid = (int *)&local_760;
              local_830.geometryUserPtr = pGVar22->userPtr;
              local_830.hit = local_260;
              local_830.N = 8;
              auVar191 = local_660._0_16_;
              auVar155 = _local_6e0;
              local_830.ray = (RTCRayN *)ray;
              if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_800._0_16_ = auVar205._0_16_;
                auVar286 = ZEXT1664(auVar286._0_16_);
                auVar163 = ZEXT1632(auVar271._0_16_);
                auVar386 = ZEXT1664(auVar386._0_16_);
                (*pGVar22->intersectionFilterN)(&local_830);
                auVar205 = ZEXT1664(local_800._0_16_);
                auVar339 = ZEXT3264(local_7a0);
                auVar325 = ZEXT3264(auVar322);
                auVar163 = vcmpps_avx(auVar163,auVar163,0xf);
                auVar271 = ZEXT3264(auVar163);
                auVar191._8_8_ = uStack_758;
                auVar191._0_8_ = local_760;
                auVar155._8_8_ = uStack_748;
                auVar155._0_8_ = uStack_750;
                fVar150 = (float)local_780._0_4_;
                fVar172 = (float)local_780._4_4_;
                fVar174 = fStack_778;
                fVar177 = fStack_774;
                fVar278 = fStack_770;
                fVar287 = fStack_76c;
                fVar260 = fStack_768;
              }
              auVar267 = vpcmpeqd_avx(auVar191,ZEXT816(0) << 0x40);
              auVar216 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
              auVar227._16_16_ = auVar216;
              auVar227._0_16_ = auVar267;
              auVar163 = auVar271._0_32_ & ~auVar227;
              if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar163 >> 0x7f,0) == '\0') &&
                    (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar163 >> 0xbf,0) == '\0') &&
                  (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar163[0x1f]) {
                auVar170._0_4_ = auVar267._0_4_ ^ auVar271._0_4_;
                auVar170._4_4_ = auVar267._4_4_ ^ auVar271._4_4_;
                auVar170._8_4_ = auVar267._8_4_ ^ auVar271._8_4_;
                auVar170._12_4_ = auVar267._12_4_ ^ auVar271._12_4_;
                auVar170._16_4_ = auVar216._0_4_ ^ auVar271._16_4_;
                auVar170._20_4_ = auVar216._4_4_ ^ auVar271._20_4_;
                auVar170._24_4_ = auVar216._8_4_ ^ auVar271._24_4_;
                auVar170._28_4_ = auVar216._12_4_ ^ auVar271._28_4_;
              }
              else {
                p_Var25 = context->args->filter;
                if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  local_800._0_16_ = auVar205._0_16_;
                  auVar286 = ZEXT1664(auVar286._0_16_);
                  auVar163 = ZEXT1632(auVar271._0_16_);
                  auVar386 = ZEXT1664(auVar386._0_16_);
                  (*p_Var25)(&local_830);
                  auVar205 = ZEXT1664(local_800._0_16_);
                  auVar339 = ZEXT3264(local_7a0);
                  auVar325 = ZEXT3264(auVar322);
                  auVar163 = vcmpps_avx(auVar163,auVar163,0xf);
                  auVar271 = ZEXT3264(auVar163);
                  auVar191._8_8_ = uStack_758;
                  auVar191._0_8_ = local_760;
                  auVar155._8_8_ = uStack_748;
                  auVar155._0_8_ = uStack_750;
                  fVar150 = (float)local_780._0_4_;
                  fVar172 = (float)local_780._4_4_;
                  fVar174 = fStack_778;
                  fVar177 = fStack_774;
                  fVar278 = fStack_770;
                  fVar287 = fStack_76c;
                  fVar260 = fStack_768;
                }
                auVar267 = vpcmpeqd_avx(auVar191,ZEXT816(0) << 0x40);
                auVar216 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
                auVar203._16_16_ = auVar216;
                auVar203._0_16_ = auVar267;
                auVar170._0_4_ = auVar267._0_4_ ^ auVar271._0_4_;
                auVar170._4_4_ = auVar267._4_4_ ^ auVar271._4_4_;
                auVar170._8_4_ = auVar267._8_4_ ^ auVar271._8_4_;
                auVar170._12_4_ = auVar267._12_4_ ^ auVar271._12_4_;
                auVar170._16_4_ = auVar216._0_4_ ^ auVar271._16_4_;
                auVar170._20_4_ = auVar216._4_4_ ^ auVar271._20_4_;
                auVar170._24_4_ = auVar216._8_4_ ^ auVar271._24_4_;
                auVar170._28_4_ = auVar216._12_4_ ^ auVar271._28_4_;
                auVar163 = auVar271._0_32_ & ~auVar203;
                if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar163 >> 0x7f,0) != '\0') ||
                      (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar163 >> 0xbf,0) != '\0') ||
                    (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar163[0x1f] < '\0') {
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])local_830.hit);
                  *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0x20));
                  *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0x40));
                  *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0x60));
                  *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0x80));
                  *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0xa0));
                  *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0xc0));
                  *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0xe0));
                  *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar163;
                  auVar163 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(local_830.hit + 0x100));
                  *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar163;
                }
              }
              auVar163 = local_460;
              if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar170 >> 0x7f,0) == '\0') &&
                    (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0xbf,0) == '\0') &&
                  (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar170[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar205._0_4_;
              }
              else {
                auVar205 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_640 + uVar145 * 4) = 0;
              auVar267 = vshufps_avx(auVar205._0_16_,auVar205._0_16_,0);
              auVar171._16_16_ = auVar267;
              auVar171._0_16_ = auVar267;
              auVar26 = vcmpps_avx(auVar163,auVar171,2);
              auVar320 = vandps_avx(auVar26,local_640);
              local_640 = local_640 & auVar26;
              if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_640 >> 0x7f,0) == '\0') &&
                    (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_640 >> 0xbf,0) == '\0') &&
                  (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_640[0x1f]) break;
              auVar204._8_4_ = 0x7f800000;
              auVar204._0_8_ = 0x7f8000007f800000;
              auVar204._12_4_ = 0x7f800000;
              auVar204._16_4_ = 0x7f800000;
              auVar204._20_4_ = 0x7f800000;
              auVar204._24_4_ = 0x7f800000;
              auVar204._28_4_ = 0x7f800000;
              auVar163 = vblendvps_avx(auVar204,auVar163,auVar320);
              auVar26 = vshufps_avx(auVar163,auVar163,0xb1);
              auVar26 = vminps_avx(auVar163,auVar26);
              auVar27 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar27 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar26 = vcmpps_avx(auVar163,auVar26,0);
              auVar27 = auVar320 & auVar26;
              auVar163 = auVar320;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar163 = vandps_avx(auVar26,auVar320);
              }
              uVar142 = vmovmskps_avx(auVar163);
              uVar141 = 0;
              if (uVar142 != 0) {
                for (; (uVar142 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                }
              }
              uVar145 = (ulong)uVar141;
              local_640 = auVar320;
            }
          }
        }
      }
      auVar267 = local_7e0._0_16_;
    }
LAB_00ae66da:
    auVar271 = ZEXT3264(auVar398);
    auVar205 = ZEXT3264(local_5e0);
    auVar309 = ZEXT3264(_local_6a0);
    if (8 < (int)uVar20) {
      auVar216 = vpshufd_avx(ZEXT416(uVar20),0);
      local_540 = auVar216._0_4_;
      fStack_53c = auVar216._4_4_;
      fStack_538 = auVar216._8_4_;
      fStack_534 = auVar216._12_4_;
      auVar267 = vshufps_avx(auVar267,auVar267,0);
      local_440._16_16_ = auVar267;
      local_440._0_16_ = auVar267;
      auVar267 = vpermilps_avx(ZEXT416(uVar139),0);
      local_120._16_16_ = auVar267;
      local_120._0_16_ = auVar267;
      auVar153._0_4_ = 1.0 / (float)local_4e0._0_4_;
      auVar153._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar267 = vshufps_avx(auVar153,auVar153,0);
      register0x00001210 = auVar267;
      _local_140 = auVar267;
      auVar267 = vpermilps_avx(local_510,0);
      local_4e0._16_16_ = auVar267;
      local_4e0._0_16_ = auVar267;
      auVar267 = vpermilps_avx(local_500._0_16_,0);
      local_500._16_16_ = auVar267;
      local_500._0_16_ = auVar267;
      auVar163 = auVar325._0_32_;
      local_37c = uVar20;
      for (lVar146 = 8; local_5e0 = auVar205._0_32_, lVar146 < (long)auVar148; lVar146 = lVar146 + 8
          ) {
        pauVar7 = (undefined1 (*) [28])(bspline_basis0 + lVar146 * 4 + lVar144);
        fVar291 = *(float *)*pauVar7;
        fVar261 = *(float *)(*pauVar7 + 4);
        fVar296 = *(float *)(*pauVar7 + 8);
        fVar209 = *(float *)(*pauVar7 + 0xc);
        fVar264 = *(float *)(*pauVar7 + 0x10);
        fVar366 = *(float *)(*pauVar7 + 0x14);
        fVar265 = *(float *)(*pauVar7 + 0x18);
        auVar136 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar144 + 0x21fffac + lVar146 * 4);
        fVar273 = *(float *)*pauVar7;
        fVar274 = *(float *)(*pauVar7 + 4);
        fVar276 = *(float *)(*pauVar7 + 8);
        fVar277 = *(float *)(*pauVar7 + 0xc);
        fVar326 = *(float *)(*pauVar7 + 0x10);
        fVar242 = *(float *)(*pauVar7 + 0x14);
        fVar313 = *(float *)(*pauVar7 + 0x18);
        auVar135 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar144 + 0x2200430 + lVar146 * 4);
        fVar327 = *(float *)*pauVar7;
        fVar292 = *(float *)(*pauVar7 + 4);
        fVar243 = *(float *)(*pauVar7 + 8);
        fVar315 = *(float *)(*pauVar7 + 0xc);
        fVar328 = *(float *)(*pauVar7 + 0x10);
        fVar329 = *(float *)(*pauVar7 + 0x14);
        fVar244 = *(float *)(*pauVar7 + 0x18);
        auVar134 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar144 + 0x22008b4 + lVar146 * 4);
        fVar210 = *(float *)*pauVar7;
        fVar295 = *(float *)(*pauVar7 + 4);
        fVar351 = *(float *)(*pauVar7 + 8);
        fVar175 = *(float *)(*pauVar7 + 0xc);
        fVar178 = *(float *)(*pauVar7 + 0x10);
        fVar180 = *(float *)(*pauVar7 + 0x14);
        fVar182 = *(float *)(*pauVar7 + 0x18);
        auVar133 = *pauVar7;
        fVar330 = auVar339._0_4_;
        fVar340 = auVar339._4_4_;
        fVar300 = auVar339._8_4_;
        fVar343 = auVar339._12_4_;
        fVar345 = auVar339._16_4_;
        fVar347 = auVar339._20_4_;
        fVar349 = auVar339._24_4_;
        fVar185 = fStack_4a4 + auVar386._28_4_ + fStack_4a4;
        fVar263 = fStack_4a4 + fStack_4a4 + fVar262;
        local_7e0._0_4_ =
             fVar291 * (float)local_420._0_4_ +
             fVar330 * fVar273 + (float)local_4c0._0_4_ * fVar210 + fVar187 * fVar327;
        local_7e0._4_4_ =
             fVar261 * (float)local_420._4_4_ +
             fVar340 * fVar274 + (float)local_4c0._4_4_ * fVar295 + fVar206 * fVar292;
        local_7e0._8_4_ =
             fVar296 * fStack_418 + fVar300 * fVar276 + fStack_4b8 * fVar351 + fVar207 * fVar243;
        local_7e0._12_4_ =
             fVar209 * fStack_414 + fVar343 * fVar277 + fStack_4b4 * fVar175 + fVar208 * fVar315;
        local_7e0._16_4_ =
             fVar264 * fStack_410 + fVar345 * fVar326 + fStack_4b0 * fVar178 + fVar187 * fVar328;
        local_7e0._20_4_ =
             fVar366 * fStack_40c + fVar347 * fVar242 + fStack_4ac * fVar180 + fVar206 * fVar329;
        local_7e0._24_4_ =
             fVar265 * fStack_408 + fVar349 * fVar313 + fStack_4a8 * fVar182 + fVar207 * fVar244;
        local_7e0._28_4_ = fStack_4a4 + fVar262 + fVar185;
        fVar258 = auVar271._0_4_;
        fVar289 = auVar271._4_4_;
        fVar293 = auVar271._8_4_;
        fVar298 = auVar271._12_4_;
        fVar379 = auVar271._16_4_;
        fVar272 = auVar271._20_4_;
        fVar275 = auVar271._24_4_;
        auVar225._0_4_ =
             fVar291 * fVar258 + fVar150 * fVar273 + auVar309._0_4_ * fVar327 + fVar246 * fVar210;
        auVar225._4_4_ =
             fVar261 * fVar289 + fVar172 * fVar274 + auVar309._4_4_ * fVar292 + fVar259 * fVar295;
        auVar225._8_4_ =
             fVar296 * fVar293 + fVar174 * fVar276 + auVar309._8_4_ * fVar243 + fVar245 * fVar351;
        auVar225._12_4_ =
             fVar209 * fVar298 + fVar177 * fVar277 + auVar309._12_4_ * fVar315 + fVar262 * fVar175;
        auVar225._16_4_ =
             fVar264 * fVar379 + fVar278 * fVar326 + auVar309._16_4_ * fVar328 + fVar246 * fVar178;
        auVar225._20_4_ =
             fVar366 * fVar272 + fVar287 * fVar242 + auVar309._20_4_ * fVar329 + fVar259 * fVar180;
        auVar225._24_4_ =
             fVar265 * fVar275 + fVar260 * fVar313 + auVar309._24_4_ * fVar244 + fVar245 * fVar182;
        auVar225._28_4_ = fVar185 + fStack_4a4 + fStack_4a4 + auVar286._28_4_;
        fVar151 = fVar291 * (float)local_2a0._0_4_ +
                  fVar273 * (float)local_280._0_4_ +
                  (float)local_a0._0_4_ * fVar327 + (float)local_c0._0_4_ * fVar210;
        fVar173 = fVar261 * (float)local_2a0._4_4_ +
                  fVar274 * (float)local_280._4_4_ +
                  (float)local_a0._4_4_ * fVar292 + (float)local_c0._4_4_ * fVar295;
        fVar176 = fVar296 * fStack_298 +
                  fVar276 * fStack_278 + fStack_98 * fVar243 + fStack_b8 * fVar351;
        fVar179 = fVar209 * fStack_294 +
                  fVar277 * fStack_274 + fStack_94 * fVar315 + fStack_b4 * fVar175;
        fVar181 = fVar264 * fStack_290 +
                  fVar326 * fStack_270 + fStack_90 * fVar328 + fStack_b0 * fVar178;
        fVar183 = fVar366 * fStack_28c +
                  fVar242 * fStack_26c + fStack_8c * fVar329 + fStack_ac * fVar180;
        fVar184 = fVar265 * fStack_288 +
                  fVar313 * fStack_268 + fStack_88 * fVar244 + fStack_a8 * fVar182;
        fVar185 = fVar185 + fVar263;
        pfVar1 = (float *)(bspline_basis1 + lVar146 * 4 + lVar144);
        fVar242 = *pfVar1;
        fVar313 = pfVar1[1];
        fVar327 = pfVar1[2];
        fVar292 = pfVar1[3];
        fVar243 = pfVar1[4];
        fVar315 = pfVar1[5];
        fVar328 = pfVar1[6];
        pfVar2 = (float *)(lVar144 + 0x22023cc + lVar146 * 4);
        fVar329 = *pfVar2;
        fVar244 = pfVar2[1];
        fVar210 = pfVar2[2];
        fVar295 = pfVar2[3];
        fVar351 = pfVar2[4];
        fVar175 = pfVar2[5];
        fVar178 = pfVar2[6];
        pfVar2 = (float *)(lVar144 + 0x2202850 + lVar146 * 4);
        fVar180 = *pfVar2;
        fVar182 = pfVar2[1];
        fVar186 = pfVar2[2];
        fVar211 = pfVar2[3];
        fVar279 = pfVar2[4];
        fVar288 = pfVar2[5];
        fVar290 = pfVar2[6];
        pauVar7 = (undefined1 (*) [28])(lVar144 + 0x2202cd4 + lVar146 * 4);
        fVar278 = *(float *)*pauVar7;
        fVar287 = *(float *)(*pauVar7 + 4);
        fVar260 = *(float *)(*pauVar7 + 8);
        fVar291 = *(float *)(*pauVar7 + 0xc);
        fVar261 = *(float *)(*pauVar7 + 0x10);
        fVar296 = *(float *)(*pauVar7 + 0x14);
        fVar209 = *(float *)(*pauVar7 + 0x18);
        auVar137 = *pauVar7;
        fVar326 = auVar339._28_4_;
        fVar366 = auVar309._28_4_;
        auVar386 = ZEXT3264(auVar271._0_32_);
        fVar264 = fVar366 + fVar366 + fVar263;
        auVar284._0_4_ =
             (float)local_420._0_4_ * fVar242 +
             fVar330 * fVar329 + fVar187 * fVar180 + fVar278 * (float)local_4c0._0_4_;
        auVar284._4_4_ =
             (float)local_420._4_4_ * fVar313 +
             fVar340 * fVar244 + fVar206 * fVar182 + fVar287 * (float)local_4c0._4_4_;
        auVar284._8_4_ =
             fStack_418 * fVar327 + fVar300 * fVar210 + fVar207 * fVar186 + fVar260 * fStack_4b8;
        auVar284._12_4_ =
             fStack_414 * fVar292 + fVar343 * fVar295 + fVar208 * fVar211 + fVar291 * fStack_4b4;
        auVar284._16_4_ =
             fStack_410 * fVar243 + fVar345 * fVar351 + fVar187 * fVar279 + fVar261 * fStack_4b0;
        auVar284._20_4_ =
             fStack_40c * fVar315 + fVar347 * fVar175 + fVar206 * fVar288 + fVar296 * fStack_4ac;
        auVar284._24_4_ =
             fStack_408 * fVar328 + fVar349 * fVar178 + fVar207 * fVar290 + fVar209 * fStack_4a8;
        auVar284._28_4_ = fVar366 + fVar326 + fVar264;
        auVar269._0_4_ =
             fVar258 * fVar242 +
             fVar329 * (float)local_780._0_4_ + fVar180 * auVar309._0_4_ + fVar246 * fVar278;
        auVar269._4_4_ =
             fVar289 * fVar313 +
             fVar244 * (float)local_780._4_4_ + fVar182 * auVar309._4_4_ + fVar259 * fVar287;
        auVar269._8_4_ =
             fVar293 * fVar327 + fVar210 * fStack_778 + fVar186 * auVar309._8_4_ + fVar245 * fVar260
        ;
        auVar269._12_4_ =
             fVar298 * fVar292 +
             fVar295 * fStack_774 + fVar211 * auVar309._12_4_ + fVar262 * fVar291;
        auVar269._16_4_ =
             fVar379 * fVar243 +
             fVar351 * fStack_770 + fVar279 * auVar309._16_4_ + fVar246 * fVar261;
        auVar269._20_4_ =
             fVar272 * fVar315 +
             fVar175 * fStack_76c + fVar288 * auVar309._20_4_ + fVar259 * fVar296;
        auVar269._24_4_ =
             fVar275 * fVar328 +
             fVar178 * fStack_768 + fVar290 * auVar309._24_4_ + fVar245 * fVar209;
        auVar269._28_4_ = fVar264 + fVar366 + fVar366 + auVar271._28_4_;
        local_5c0._0_4_ =
             fVar329 * (float)local_280._0_4_ +
             (float)local_a0._0_4_ * fVar180 + (float)local_c0._0_4_ * fVar278 +
             fVar242 * (float)local_2a0._0_4_;
        local_5c0._4_4_ =
             fVar244 * (float)local_280._4_4_ +
             (float)local_a0._4_4_ * fVar182 + (float)local_c0._4_4_ * fVar287 +
             fVar313 * (float)local_2a0._4_4_;
        fStack_5b8 = fVar210 * fStack_278 + fStack_98 * fVar186 + fStack_b8 * fVar260 +
                     fVar327 * fStack_298;
        fStack_5b4 = fVar295 * fStack_274 + fStack_94 * fVar211 + fStack_b4 * fVar291 +
                     fVar292 * fStack_294;
        fStack_5b0 = fVar351 * fStack_270 + fStack_90 * fVar279 + fStack_b0 * fVar261 +
                     fVar243 * fStack_290;
        fStack_5ac = fVar175 * fStack_26c + fStack_8c * fVar288 + fStack_ac * fVar296 +
                     fVar315 * fStack_28c;
        fStack_5a8 = fVar178 * fStack_268 + fStack_88 * fVar290 + fStack_a8 * fVar209 +
                     fVar328 * fStack_288;
        fStack_5a4 = fVar366 + fVar366 + fVar326 + fVar264;
        auVar26 = vsubps_avx(auVar284,local_7e0);
        auVar322 = vsubps_avx(auVar269,auVar225);
        fVar278 = auVar26._0_4_;
        fVar260 = auVar26._4_4_;
        auVar84._4_4_ = auVar225._4_4_ * fVar260;
        auVar84._0_4_ = auVar225._0_4_ * fVar278;
        fVar261 = auVar26._8_4_;
        auVar84._8_4_ = auVar225._8_4_ * fVar261;
        fVar209 = auVar26._12_4_;
        auVar84._12_4_ = auVar225._12_4_ * fVar209;
        fVar366 = auVar26._16_4_;
        auVar84._16_4_ = auVar225._16_4_ * fVar366;
        fVar273 = auVar26._20_4_;
        auVar84._20_4_ = auVar225._20_4_ * fVar273;
        fVar276 = auVar26._24_4_;
        auVar84._24_4_ = auVar225._24_4_ * fVar276;
        auVar84._28_4_ = fVar264;
        fVar287 = auVar322._0_4_;
        fVar291 = auVar322._4_4_;
        auVar85._4_4_ = local_7e0._4_4_ * fVar291;
        auVar85._0_4_ = (float)local_7e0._0_4_ * fVar287;
        fVar296 = auVar322._8_4_;
        auVar85._8_4_ = local_7e0._8_4_ * fVar296;
        fVar264 = auVar322._12_4_;
        auVar85._12_4_ = local_7e0._12_4_ * fVar264;
        fVar265 = auVar322._16_4_;
        auVar85._16_4_ = local_7e0._16_4_ * fVar265;
        fVar274 = auVar322._20_4_;
        auVar85._20_4_ = local_7e0._20_4_ * fVar274;
        fVar277 = auVar322._24_4_;
        auVar85._24_4_ = local_7e0._24_4_ * fVar277;
        auVar85._28_4_ = auVar269._28_4_;
        auVar27 = vsubps_avx(auVar84,auVar85);
        auVar130._4_4_ = fVar173;
        auVar130._0_4_ = fVar151;
        auVar130._8_4_ = fVar176;
        auVar130._12_4_ = fVar179;
        auVar130._16_4_ = fVar181;
        auVar130._20_4_ = fVar183;
        auVar130._24_4_ = fVar184;
        auVar130._28_4_ = fVar185;
        auVar320 = vmaxps_avx(auVar130,_local_5c0);
        auVar86._4_4_ = auVar320._4_4_ * auVar320._4_4_ * (fVar260 * fVar260 + fVar291 * fVar291);
        auVar86._0_4_ = auVar320._0_4_ * auVar320._0_4_ * (fVar278 * fVar278 + fVar287 * fVar287);
        auVar86._8_4_ = auVar320._8_4_ * auVar320._8_4_ * (fVar261 * fVar261 + fVar296 * fVar296);
        auVar86._12_4_ = auVar320._12_4_ * auVar320._12_4_ * (fVar209 * fVar209 + fVar264 * fVar264)
        ;
        auVar86._16_4_ = auVar320._16_4_ * auVar320._16_4_ * (fVar366 * fVar366 + fVar265 * fVar265)
        ;
        auVar86._20_4_ = auVar320._20_4_ * auVar320._20_4_ * (fVar273 * fVar273 + fVar274 * fVar274)
        ;
        auVar86._24_4_ = auVar320._24_4_ * auVar320._24_4_ * (fVar276 * fVar276 + fVar277 * fVar277)
        ;
        auVar86._28_4_ = auVar284._28_4_ + auVar269._28_4_;
        auVar87._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar87._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar87._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar87._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar87._16_4_ = auVar27._16_4_ * auVar27._16_4_;
        auVar87._20_4_ = auVar27._20_4_ * auVar27._20_4_;
        auVar87._24_4_ = auVar27._24_4_ * auVar27._24_4_;
        auVar87._28_4_ = auVar27._28_4_;
        local_660 = vcmpps_avx(auVar87,auVar86,2);
        local_380 = (uint)lVar146;
        auVar216 = vpshufd_avx(ZEXT416(local_380),0);
        auVar267 = vpor_avx(auVar216,_DAT_01f4ad30);
        auVar216 = vpor_avx(auVar216,_DAT_01f7afa0);
        auVar131._4_4_ = fStack_53c;
        auVar131._0_4_ = local_540;
        auVar131._8_4_ = fStack_538;
        auVar131._12_4_ = fStack_534;
        auVar267 = vpcmpgtd_avx(auVar131,auVar267);
        auVar286 = ZEXT1664(auVar267);
        auVar216 = vpcmpgtd_avx(auVar131,auVar216);
        register0x00001310 = auVar216;
        _local_560 = auVar267;
        auVar320 = _local_560 & local_660;
        fVar150 = (float)local_780._0_4_;
        fVar172 = (float)local_780._4_4_;
        fVar174 = fStack_778;
        fVar177 = fStack_774;
        fVar278 = fStack_770;
        fVar287 = fStack_76c;
        fVar260 = fStack_768;
        if ((((((((auVar320 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar320 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar320 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar320 >> 0x7f,0) == '\0') &&
              (auVar320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar320 >> 0xbf,0) == '\0') &&
            (auVar320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar320[0x1f]) {
          auVar205 = ZEXT3264(local_5e0);
          auVar309 = ZEXT3264(_local_6a0);
          auVar339 = ZEXT3264(auVar339._0_32_);
          auVar271 = ZEXT3264(auVar271._0_32_);
        }
        else {
          local_680._0_4_ = auVar137._0_4_;
          local_680._4_4_ = auVar137._4_4_;
          fStack_678 = auVar137._8_4_;
          fStack_674 = auVar137._12_4_;
          fStack_670 = auVar137._16_4_;
          fStack_66c = auVar137._20_4_;
          fStack_668 = auVar137._24_4_;
          local_680._0_4_ =
               fVar242 * (float)local_5a0._0_4_ +
               fVar329 * (float)local_e0._0_4_ +
               fVar180 * (float)local_100._0_4_ + (float)local_400._0_4_ * (float)local_680._0_4_;
          local_680._4_4_ =
               fVar313 * (float)local_5a0._4_4_ +
               fVar244 * (float)local_e0._4_4_ +
               fVar182 * (float)local_100._4_4_ + (float)local_400._4_4_ * (float)local_680._4_4_;
          fStack_678 = fVar327 * fStack_598 +
                       fVar210 * fStack_d8 + fVar186 * fStack_f8 + fStack_3f8 * fStack_678;
          fStack_674 = fVar292 * fStack_594 +
                       fVar295 * fStack_d4 + fVar211 * fStack_f4 + fStack_3f4 * fStack_674;
          fStack_670 = fVar243 * fStack_590 +
                       fVar351 * fStack_d0 + fVar279 * fStack_f0 + fStack_3f0 * fStack_670;
          fStack_66c = fVar315 * fStack_58c +
                       fVar175 * fStack_cc + fVar288 * fStack_ec + fStack_3ec * fStack_66c;
          fStack_668 = fVar328 * fStack_588 +
                       fVar178 * fStack_c8 + fVar290 * fStack_e8 + fStack_3e8 * fStack_668;
          fStack_664 = pfVar1[7] + fStack_764 + local_660._28_4_ + 0.0;
          local_6e0._0_4_ = auVar135._0_4_;
          local_6e0._4_4_ = auVar135._4_4_;
          fStack_6d8 = auVar135._8_4_;
          fStack_6d4 = auVar135._12_4_;
          uStack_6d0._0_4_ = auVar135._16_4_;
          uStack_6d0._4_4_ = auVar135._20_4_;
          uStack_6c8._0_4_ = auVar135._24_4_;
          local_700._0_4_ = auVar134._0_4_;
          local_700._4_4_ = auVar134._4_4_;
          uStack_6f8._0_4_ = auVar134._8_4_;
          uStack_6f8._4_4_ = auVar134._12_4_;
          uStack_6f0._0_4_ = auVar134._16_4_;
          uStack_6f0._4_4_ = auVar134._20_4_;
          uStack_6e8._0_4_ = auVar134._24_4_;
          local_8e0._0_4_ = auVar133._0_4_;
          local_8e0._4_4_ = auVar133._4_4_;
          fStack_8d8 = auVar133._8_4_;
          fStack_8d4 = auVar133._12_4_;
          fStack_8d0 = auVar133._16_4_;
          fStack_8cc = auVar133._20_4_;
          fStack_8c8 = auVar133._24_4_;
          fVar279 = (float)local_400._0_4_ * (float)local_8e0._0_4_;
          fVar288 = (float)local_400._4_4_ * (float)local_8e0._4_4_;
          fVar290 = fStack_3f8 * fStack_8d8;
          fVar263 = fStack_3f4 * fStack_8d4;
          fVar294 = fStack_3f0 * fStack_8d0;
          fVar297 = fStack_3ec * fStack_8cc;
          fVar299 = fStack_3e8 * fStack_8c8;
          pfVar1 = (float *)(lVar144 + 0x2201640 + lVar146 * 4);
          fVar291 = *pfVar1;
          fVar261 = pfVar1[1];
          fVar296 = pfVar1[2];
          fVar209 = pfVar1[3];
          fVar264 = pfVar1[4];
          fVar366 = pfVar1[5];
          fVar265 = pfVar1[6];
          pfVar2 = (float *)(lVar144 + 0x2201ac4 + lVar146 * 4);
          fVar273 = *pfVar2;
          fVar274 = pfVar2[1];
          fVar276 = pfVar2[2];
          fVar277 = pfVar2[3];
          fVar242 = pfVar2[4];
          fVar313 = pfVar2[5];
          fVar327 = pfVar2[6];
          pfVar3 = (float *)(lVar144 + 0x22011bc + lVar146 * 4);
          fVar292 = *pfVar3;
          fVar243 = pfVar3[1];
          fVar315 = pfVar3[2];
          fVar328 = pfVar3[3];
          fVar329 = pfVar3[4];
          fVar244 = pfVar3[5];
          fVar210 = pfVar3[6];
          fVar186 = pfVar1[7] + pfVar2[7];
          fVar211 = pfVar2[7] + fVar326 + 0.0;
          fVar301 = fVar326 + auVar271._28_4_ + fVar326 + 0.0;
          pfVar1 = (float *)(lVar144 + 0x2200d38 + lVar146 * 4);
          fVar326 = *pfVar1;
          fVar295 = pfVar1[1];
          fVar351 = pfVar1[2];
          fVar175 = pfVar1[3];
          fVar178 = pfVar1[4];
          fVar180 = pfVar1[5];
          fVar182 = pfVar1[6];
          fStack_8c4 = fVar186 + fVar211;
          local_8e0._4_4_ =
               (float)local_420._4_4_ * fVar295 +
               fVar243 * fVar340 + fVar206 * fVar261 + (float)local_4c0._4_4_ * fVar274;
          local_8e0._0_4_ =
               (float)local_420._0_4_ * fVar326 +
               fVar292 * fVar330 + fVar187 * fVar291 + (float)local_4c0._0_4_ * fVar273;
          fStack_8d8 = fStack_418 * fVar351 +
                       fVar315 * fVar300 + fVar207 * fVar296 + fStack_4b8 * fVar276;
          fStack_8d4 = fStack_414 * fVar175 +
                       fVar328 * fVar343 + fVar208 * fVar209 + fStack_4b4 * fVar277;
          fStack_8d0 = fStack_410 * fVar178 +
                       fVar329 * fVar345 + fVar187 * fVar264 + fStack_4b0 * fVar242;
          fStack_8cc = fStack_40c * fVar180 +
                       fVar244 * fVar347 + fVar206 * fVar366 + fStack_4ac * fVar313;
          fStack_8c8 = fStack_408 * fVar182 +
                       fVar210 * fVar349 + fVar207 * fVar265 + fStack_4a8 * fVar327;
          auVar198._0_4_ =
               fVar258 * fVar326 +
               (float)local_6a0._0_4_ * fVar291 + fVar246 * fVar273 +
               fVar292 * (float)local_780._0_4_;
          auVar198._4_4_ =
               fVar289 * fVar295 +
               (float)local_6a0._4_4_ * fVar261 + fVar259 * fVar274 +
               fVar243 * (float)local_780._4_4_;
          auVar198._8_4_ =
               fVar293 * fVar351 + fStack_698 * fVar296 + fVar245 * fVar276 + fVar315 * fStack_778;
          auVar198._12_4_ =
               fVar298 * fVar175 + fStack_694 * fVar209 + fVar262 * fVar277 + fVar328 * fStack_774;
          auVar198._16_4_ =
               fVar379 * fVar178 + fStack_690 * fVar264 + fVar246 * fVar242 + fVar329 * fStack_770;
          auVar198._20_4_ =
               fVar272 * fVar180 + fStack_68c * fVar366 + fVar259 * fVar313 + fVar244 * fStack_76c;
          auVar198._24_4_ =
               fVar275 * fVar182 + fStack_688 * fVar265 + fVar245 * fVar327 + fVar210 * fStack_768;
          auVar198._28_4_ = fVar211 + fVar301;
          auVar384._0_4_ =
               fVar292 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * fVar291 + (float)local_400._0_4_ * fVar273 +
               fVar326 * (float)local_5a0._0_4_;
          auVar384._4_4_ =
               fVar243 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fVar261 + (float)local_400._4_4_ * fVar274 +
               fVar295 * (float)local_5a0._4_4_;
          auVar384._8_4_ =
               fVar315 * fStack_d8 + fStack_f8 * fVar296 + fStack_3f8 * fVar276 +
               fVar351 * fStack_598;
          auVar384._12_4_ =
               fVar328 * fStack_d4 + fStack_f4 * fVar209 + fStack_3f4 * fVar277 +
               fVar175 * fStack_594;
          auVar384._16_4_ =
               fVar329 * fStack_d0 + fStack_f0 * fVar264 + fStack_3f0 * fVar242 +
               fVar178 * fStack_590;
          auVar384._20_4_ =
               fVar244 * fStack_cc + fStack_ec * fVar366 + fStack_3ec * fVar313 +
               fVar180 * fStack_58c;
          auVar384._24_4_ =
               fVar210 * fStack_c8 + fStack_e8 * fVar265 + fStack_3e8 * fVar327 +
               fVar182 * fStack_588;
          auVar384._28_4_ = pfVar3[7] + fVar186 + fVar301;
          pfVar1 = (float *)(lVar144 + 0x2203a60 + lVar146 * 4);
          fVar258 = *pfVar1;
          fVar289 = pfVar1[1];
          fVar291 = pfVar1[2];
          fVar293 = pfVar1[3];
          fVar261 = pfVar1[4];
          fVar296 = pfVar1[5];
          fVar298 = pfVar1[6];
          pfVar2 = (float *)(lVar144 + 0x2203ee4 + lVar146 * 4);
          fVar209 = *pfVar2;
          fVar264 = pfVar2[1];
          fVar379 = pfVar2[2];
          fVar366 = pfVar2[3];
          fVar265 = pfVar2[4];
          fVar272 = pfVar2[5];
          fVar273 = pfVar2[6];
          pfVar3 = (float *)(lVar144 + 0x22035dc + lVar146 * 4);
          fVar274 = *pfVar3;
          fVar275 = pfVar3[1];
          fVar276 = pfVar3[2];
          fVar277 = pfVar3[3];
          fVar326 = pfVar3[4];
          fVar242 = pfVar3[5];
          fVar313 = pfVar3[6];
          pfVar4 = (float *)(lVar144 + 0x2203158 + lVar146 * 4);
          fVar327 = *pfVar4;
          fVar292 = pfVar4[1];
          fVar243 = pfVar4[2];
          fVar315 = pfVar4[3];
          fVar328 = pfVar4[4];
          fVar329 = pfVar4[5];
          fVar244 = pfVar4[6];
          auVar337._0_4_ =
               (float)local_420._0_4_ * fVar327 +
               fVar274 * fVar330 + fVar187 * fVar258 + (float)local_4c0._0_4_ * fVar209;
          auVar337._4_4_ =
               (float)local_420._4_4_ * fVar292 +
               fVar275 * fVar340 + fVar206 * fVar289 + (float)local_4c0._4_4_ * fVar264;
          auVar337._8_4_ =
               fStack_418 * fVar243 + fVar276 * fVar300 + fVar207 * fVar291 + fStack_4b8 * fVar379;
          auVar337._12_4_ =
               fStack_414 * fVar315 + fVar277 * fVar343 + fVar208 * fVar293 + fStack_4b4 * fVar366;
          auVar337._16_4_ =
               fStack_410 * fVar328 + fVar326 * fVar345 + fVar187 * fVar261 + fStack_4b0 * fVar265;
          auVar337._20_4_ =
               fStack_40c * fVar329 + fVar242 * fVar347 + fVar206 * fVar296 + fStack_4ac * fVar272;
          auVar337._24_4_ =
               fStack_408 * fVar244 + fVar313 * fVar349 + fVar207 * fVar298 + fStack_4a8 * fVar273;
          auVar337._28_4_ = fStack_404 + fStack_404 + fStack_4a4 + fStack_404;
          auVar375._0_4_ =
               fVar327 * fVar394 +
               fVar274 * (float)local_780._0_4_ +
               (float)local_6a0._0_4_ * fVar258 + fVar246 * fVar209;
          auVar375._4_4_ =
               fVar292 * fVar402 +
               fVar275 * (float)local_780._4_4_ +
               (float)local_6a0._4_4_ * fVar289 + fVar259 * fVar264;
          auVar375._8_4_ =
               fVar243 * fVar403 + fVar276 * fStack_778 + fStack_698 * fVar291 + fVar245 * fVar379;
          auVar375._12_4_ =
               fVar315 * fVar404 + fVar277 * fStack_774 + fStack_694 * fVar293 + fVar262 * fVar366;
          auVar375._16_4_ =
               fVar328 * fVar394 + fVar326 * fStack_770 + fStack_690 * fVar261 + fVar246 * fVar265;
          auVar375._20_4_ =
               fVar329 * fVar402 + fVar242 * fStack_76c + fStack_68c * fVar296 + fVar259 * fVar272;
          auVar375._24_4_ =
               fVar244 * fVar403 + fVar313 * fStack_768 + fStack_688 * fVar298 + fVar245 * fVar273;
          auVar375._28_4_ = fStack_404 + fStack_404 + fVar262 + fStack_404;
          auVar270._8_4_ = 0x7fffffff;
          auVar270._0_8_ = 0x7fffffff7fffffff;
          auVar270._12_4_ = 0x7fffffff;
          auVar270._16_4_ = 0x7fffffff;
          auVar270._20_4_ = 0x7fffffff;
          auVar270._24_4_ = 0x7fffffff;
          auVar270._28_4_ = 0x7fffffff;
          auVar320 = vandps_avx(_local_8e0,auVar270);
          auVar27 = vandps_avx(auVar198,auVar270);
          auVar27 = vmaxps_avx(auVar320,auVar27);
          auVar320 = vandps_avx(auVar384,auVar270);
          auVar27 = vmaxps_avx(auVar27,auVar320);
          auVar27 = vcmpps_avx(auVar27,local_440,1);
          auVar28 = vblendvps_avx(_local_8e0,auVar26,auVar27);
          auVar165._0_4_ =
               fVar327 * (float)local_5a0._0_4_ +
               fVar274 * (float)local_e0._0_4_ +
               (float)local_400._0_4_ * fVar209 + (float)local_100._0_4_ * fVar258;
          auVar165._4_4_ =
               fVar292 * (float)local_5a0._4_4_ +
               fVar275 * (float)local_e0._4_4_ +
               (float)local_400._4_4_ * fVar264 + (float)local_100._4_4_ * fVar289;
          auVar165._8_4_ =
               fVar243 * fStack_598 +
               fVar276 * fStack_d8 + fStack_3f8 * fVar379 + fStack_f8 * fVar291;
          auVar165._12_4_ =
               fVar315 * fStack_594 +
               fVar277 * fStack_d4 + fStack_3f4 * fVar366 + fStack_f4 * fVar293;
          auVar165._16_4_ =
               fVar328 * fStack_590 +
               fVar326 * fStack_d0 + fStack_3f0 * fVar265 + fStack_f0 * fVar261;
          auVar165._20_4_ =
               fVar329 * fStack_58c +
               fVar242 * fStack_cc + fStack_3ec * fVar272 + fStack_ec * fVar296;
          auVar165._24_4_ =
               fVar244 * fStack_588 +
               fVar313 * fStack_c8 + fStack_3e8 * fVar273 + fStack_e8 * fVar298;
          auVar165._28_4_ = auVar320._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar29 = vblendvps_avx(auVar198,auVar322,auVar27);
          auVar320 = vandps_avx(auVar337,auVar270);
          auVar27 = vandps_avx(auVar375,auVar270);
          auVar30 = vmaxps_avx(auVar320,auVar27);
          auVar320 = vandps_avx(auVar165,auVar270);
          auVar320 = vmaxps_avx(auVar30,auVar320);
          local_7c0._0_4_ = auVar136._0_4_;
          local_7c0._4_4_ = auVar136._4_4_;
          uStack_7b8._0_4_ = auVar136._8_4_;
          uStack_7b8._4_4_ = auVar136._12_4_;
          uStack_7b0._0_4_ = auVar136._16_4_;
          uStack_7b0._4_4_ = auVar136._20_4_;
          uStack_7a8._0_4_ = auVar136._24_4_;
          auVar27 = vcmpps_avx(auVar320,local_440,1);
          auVar320 = vblendvps_avx(auVar337,auVar26,auVar27);
          auVar166._0_4_ =
               (float)local_5a0._0_4_ * (float)local_7c0._0_4_ +
               (float)local_e0._0_4_ * (float)local_6e0._0_4_ +
               (float)local_100._0_4_ * (float)local_700._0_4_ + fVar279;
          auVar166._4_4_ =
               (float)local_5a0._4_4_ * (float)local_7c0._4_4_ +
               (float)local_e0._4_4_ * (float)local_6e0._4_4_ +
               (float)local_100._4_4_ * (float)local_700._4_4_ + fVar288;
          auVar166._8_4_ =
               fStack_598 * (float)uStack_7b8 +
               fStack_d8 * fStack_6d8 + fStack_f8 * (float)uStack_6f8 + fVar290;
          auVar166._12_4_ =
               fStack_594 * uStack_7b8._4_4_ +
               fStack_d4 * fStack_6d4 + fStack_f4 * uStack_6f8._4_4_ + fVar263;
          auVar166._16_4_ =
               fStack_590 * (float)uStack_7b0 +
               fStack_d0 * (float)uStack_6d0 + fStack_f0 * (float)uStack_6f0 + fVar294;
          auVar166._20_4_ =
               fStack_58c * uStack_7b0._4_4_ +
               fStack_cc * uStack_6d0._4_4_ + fStack_ec * uStack_6f0._4_4_ + fVar297;
          auVar166._24_4_ =
               fStack_588 * (float)uStack_7a8 +
               fStack_c8 * (float)uStack_6c8 + fStack_e8 * (float)uStack_6e8 + fVar299;
          auVar166._28_4_ = auVar30._28_4_ + fStack_664 + local_660._28_4_ + 0.0;
          auVar26 = vblendvps_avx(auVar375,auVar322,auVar27);
          fVar186 = auVar28._0_4_;
          fVar211 = auVar28._4_4_;
          fVar279 = auVar28._8_4_;
          fVar288 = auVar28._12_4_;
          fVar290 = auVar28._16_4_;
          fVar263 = auVar28._20_4_;
          fVar330 = auVar28._24_4_;
          fVar340 = auVar28._28_4_;
          fVar274 = auVar320._0_4_;
          fVar276 = auVar320._4_4_;
          fVar326 = auVar320._8_4_;
          fVar313 = auVar320._12_4_;
          fVar292 = auVar320._16_4_;
          fVar315 = auVar320._20_4_;
          fVar329 = auVar320._24_4_;
          fVar258 = auVar29._0_4_;
          fVar291 = auVar29._4_4_;
          fVar261 = auVar29._8_4_;
          fVar298 = auVar29._12_4_;
          fVar264 = auVar29._16_4_;
          fVar366 = auVar29._20_4_;
          fVar272 = auVar29._24_4_;
          auVar360._0_4_ = fVar258 * fVar258 + fVar186 * fVar186;
          auVar360._4_4_ = fVar291 * fVar291 + fVar211 * fVar211;
          auVar360._8_4_ = fVar261 * fVar261 + fVar279 * fVar279;
          auVar360._12_4_ = fVar298 * fVar298 + fVar288 * fVar288;
          auVar360._16_4_ = fVar264 * fVar264 + fVar290 * fVar290;
          auVar360._20_4_ = fVar366 * fVar366 + fVar263 * fVar263;
          auVar360._24_4_ = fVar272 * fVar272 + fVar330 * fVar330;
          auVar360._28_4_ = fStack_404 + fStack_8c4;
          auVar27 = vrsqrtps_avx(auVar360);
          fVar289 = auVar27._0_4_;
          fVar293 = auVar27._4_4_;
          auVar88._4_4_ = fVar293 * 1.5;
          auVar88._0_4_ = fVar289 * 1.5;
          fVar296 = auVar27._8_4_;
          auVar88._8_4_ = fVar296 * 1.5;
          fVar209 = auVar27._12_4_;
          auVar88._12_4_ = fVar209 * 1.5;
          fVar379 = auVar27._16_4_;
          auVar88._16_4_ = fVar379 * 1.5;
          fVar265 = auVar27._20_4_;
          auVar88._20_4_ = fVar265 * 1.5;
          fVar273 = auVar27._24_4_;
          auVar88._24_4_ = fVar273 * 1.5;
          auVar88._28_4_ = auVar375._28_4_;
          auVar89._4_4_ = fVar293 * fVar293 * fVar293 * auVar360._4_4_ * 0.5;
          auVar89._0_4_ = fVar289 * fVar289 * fVar289 * auVar360._0_4_ * 0.5;
          auVar89._8_4_ = fVar296 * fVar296 * fVar296 * auVar360._8_4_ * 0.5;
          auVar89._12_4_ = fVar209 * fVar209 * fVar209 * auVar360._12_4_ * 0.5;
          auVar89._16_4_ = fVar379 * fVar379 * fVar379 * auVar360._16_4_ * 0.5;
          auVar89._20_4_ = fVar265 * fVar265 * fVar265 * auVar360._20_4_ * 0.5;
          auVar89._24_4_ = fVar273 * fVar273 * fVar273 * auVar360._24_4_ * 0.5;
          auVar89._28_4_ = auVar360._28_4_;
          auVar28 = vsubps_avx(auVar88,auVar89);
          fVar210 = auVar28._0_4_;
          fVar295 = auVar28._4_4_;
          fVar351 = auVar28._8_4_;
          fVar175 = auVar28._12_4_;
          fVar178 = auVar28._16_4_;
          fVar180 = auVar28._20_4_;
          fVar182 = auVar28._24_4_;
          fVar289 = auVar26._0_4_;
          fVar293 = auVar26._4_4_;
          fVar296 = auVar26._8_4_;
          fVar209 = auVar26._12_4_;
          fVar379 = auVar26._16_4_;
          fVar265 = auVar26._20_4_;
          fVar273 = auVar26._24_4_;
          auVar323._0_4_ = fVar289 * fVar289 + fVar274 * fVar274;
          auVar323._4_4_ = fVar293 * fVar293 + fVar276 * fVar276;
          auVar323._8_4_ = fVar296 * fVar296 + fVar326 * fVar326;
          auVar323._12_4_ = fVar209 * fVar209 + fVar313 * fVar313;
          auVar323._16_4_ = fVar379 * fVar379 + fVar292 * fVar292;
          auVar323._20_4_ = fVar265 * fVar265 + fVar315 * fVar315;
          auVar323._24_4_ = fVar273 * fVar273 + fVar329 * fVar329;
          auVar323._28_4_ = auVar27._28_4_ + auVar320._28_4_;
          auVar320 = vrsqrtps_avx(auVar323);
          fVar275 = auVar320._0_4_;
          fVar277 = auVar320._4_4_;
          auVar90._4_4_ = fVar277 * 1.5;
          auVar90._0_4_ = fVar275 * 1.5;
          fVar242 = auVar320._8_4_;
          auVar90._8_4_ = fVar242 * 1.5;
          fVar327 = auVar320._12_4_;
          auVar90._12_4_ = fVar327 * 1.5;
          fVar243 = auVar320._16_4_;
          auVar90._16_4_ = fVar243 * 1.5;
          fVar328 = auVar320._20_4_;
          auVar90._20_4_ = fVar328 * 1.5;
          fVar244 = auVar320._24_4_;
          auVar90._24_4_ = fVar244 * 1.5;
          auVar90._28_4_ = auVar375._28_4_;
          auVar91._4_4_ = fVar277 * fVar277 * fVar277 * auVar323._4_4_ * 0.5;
          auVar91._0_4_ = fVar275 * fVar275 * fVar275 * auVar323._0_4_ * 0.5;
          auVar91._8_4_ = fVar242 * fVar242 * fVar242 * auVar323._8_4_ * 0.5;
          auVar91._12_4_ = fVar327 * fVar327 * fVar327 * auVar323._12_4_ * 0.5;
          auVar91._16_4_ = fVar243 * fVar243 * fVar243 * auVar323._16_4_ * 0.5;
          auVar91._20_4_ = fVar328 * fVar328 * fVar328 * auVar323._20_4_ * 0.5;
          auVar91._24_4_ = fVar244 * fVar244 * fVar244 * auVar323._24_4_ * 0.5;
          auVar91._28_4_ = auVar323._28_4_;
          auVar26 = vsubps_avx(auVar90,auVar91);
          fVar275 = auVar26._0_4_;
          fVar277 = auVar26._4_4_;
          fVar242 = auVar26._8_4_;
          fVar327 = auVar26._12_4_;
          fVar243 = auVar26._16_4_;
          fVar328 = auVar26._20_4_;
          fVar244 = auVar26._24_4_;
          fVar258 = fVar151 * fVar210 * fVar258;
          fVar291 = fVar173 * fVar295 * fVar291;
          auVar92._4_4_ = fVar291;
          auVar92._0_4_ = fVar258;
          fVar261 = fVar176 * fVar351 * fVar261;
          auVar92._8_4_ = fVar261;
          fVar298 = fVar179 * fVar175 * fVar298;
          auVar92._12_4_ = fVar298;
          fVar264 = fVar181 * fVar178 * fVar264;
          auVar92._16_4_ = fVar264;
          fVar366 = fVar183 * fVar180 * fVar366;
          auVar92._20_4_ = fVar366;
          fVar272 = fVar184 * fVar182 * fVar272;
          auVar92._24_4_ = fVar272;
          auVar92._28_4_ = auVar320._28_4_;
          local_7c0._4_4_ = fVar291 + local_7e0._4_4_;
          local_7c0._0_4_ = fVar258 + (float)local_7e0._0_4_;
          uStack_7b8._0_4_ = fVar261 + local_7e0._8_4_;
          uStack_7b8._4_4_ = fVar298 + local_7e0._12_4_;
          uStack_7b0._0_4_ = fVar264 + local_7e0._16_4_;
          uStack_7b0._4_4_ = fVar366 + local_7e0._20_4_;
          uStack_7a8._0_4_ = fVar272 + local_7e0._24_4_;
          uStack_7a8._4_4_ = auVar320._28_4_ + local_7e0._28_4_;
          fVar258 = fVar151 * fVar210 * -fVar186;
          fVar291 = fVar173 * fVar295 * -fVar211;
          auVar93._4_4_ = fVar291;
          auVar93._0_4_ = fVar258;
          fVar261 = fVar176 * fVar351 * -fVar279;
          auVar93._8_4_ = fVar261;
          fVar298 = fVar179 * fVar175 * -fVar288;
          auVar93._12_4_ = fVar298;
          fVar264 = fVar181 * fVar178 * -fVar290;
          auVar93._16_4_ = fVar264;
          fVar366 = fVar183 * fVar180 * -fVar263;
          auVar93._20_4_ = fVar366;
          fVar272 = fVar184 * fVar182 * -fVar330;
          auVar93._24_4_ = fVar272;
          auVar93._28_4_ = -fVar340;
          local_6e0._4_4_ = auVar225._4_4_ + fVar291;
          local_6e0._0_4_ = auVar225._0_4_ + fVar258;
          fStack_6d8 = auVar225._8_4_ + fVar261;
          fStack_6d4 = auVar225._12_4_ + fVar298;
          uStack_6d0._0_4_ = auVar225._16_4_ + fVar264;
          uStack_6d0._4_4_ = auVar225._20_4_ + fVar366;
          uStack_6c8._0_4_ = auVar225._24_4_ + fVar272;
          uStack_6c8._4_4_ = auVar225._28_4_ + -fVar340;
          fVar258 = fVar210 * 0.0 * fVar151;
          fVar291 = fVar295 * 0.0 * fVar173;
          auVar94._4_4_ = fVar291;
          auVar94._0_4_ = fVar258;
          fVar261 = fVar351 * 0.0 * fVar176;
          auVar94._8_4_ = fVar261;
          fVar298 = fVar175 * 0.0 * fVar179;
          auVar94._12_4_ = fVar298;
          fVar264 = fVar178 * 0.0 * fVar181;
          auVar94._16_4_ = fVar264;
          fVar366 = fVar180 * 0.0 * fVar183;
          auVar94._20_4_ = fVar366;
          fVar272 = fVar182 * 0.0 * fVar184;
          auVar94._24_4_ = fVar272;
          auVar94._28_4_ = fVar340;
          auVar320 = vsubps_avx(local_7e0,auVar92);
          auVar400._0_4_ = fVar258 + auVar166._0_4_;
          auVar400._4_4_ = fVar291 + auVar166._4_4_;
          auVar400._8_4_ = fVar261 + auVar166._8_4_;
          auVar400._12_4_ = fVar298 + auVar166._12_4_;
          auVar400._16_4_ = fVar264 + auVar166._16_4_;
          auVar400._20_4_ = fVar366 + auVar166._20_4_;
          auVar400._24_4_ = fVar272 + auVar166._24_4_;
          auVar400._28_4_ = fVar340 + auVar166._28_4_;
          fVar258 = (float)local_5c0._0_4_ * fVar275 * fVar289;
          fVar289 = (float)local_5c0._4_4_ * fVar277 * fVar293;
          auVar95._4_4_ = fVar289;
          auVar95._0_4_ = fVar258;
          fVar291 = fStack_5b8 * fVar242 * fVar296;
          auVar95._8_4_ = fVar291;
          fVar293 = fStack_5b4 * fVar327 * fVar209;
          auVar95._12_4_ = fVar293;
          fVar261 = fStack_5b0 * fVar243 * fVar379;
          auVar95._16_4_ = fVar261;
          fVar296 = fStack_5ac * fVar328 * fVar265;
          auVar95._20_4_ = fVar296;
          fVar298 = fStack_5a8 * fVar244 * fVar273;
          auVar95._24_4_ = fVar298;
          auVar95._28_4_ = fVar185;
          auVar192 = vsubps_avx(auVar225,auVar93);
          auVar385._0_4_ = auVar284._0_4_ + fVar258;
          auVar385._4_4_ = auVar284._4_4_ + fVar289;
          auVar385._8_4_ = auVar284._8_4_ + fVar291;
          auVar385._12_4_ = auVar284._12_4_ + fVar293;
          auVar385._16_4_ = auVar284._16_4_ + fVar261;
          auVar385._20_4_ = auVar284._20_4_ + fVar296;
          auVar385._24_4_ = auVar284._24_4_ + fVar298;
          auVar385._28_4_ = auVar284._28_4_ + fVar185;
          fVar258 = fVar275 * -fVar274 * (float)local_5c0._0_4_;
          fVar289 = fVar277 * -fVar276 * (float)local_5c0._4_4_;
          auVar96._4_4_ = fVar289;
          auVar96._0_4_ = fVar258;
          fVar291 = fVar242 * -fVar326 * fStack_5b8;
          auVar96._8_4_ = fVar291;
          fVar293 = fVar327 * -fVar313 * fStack_5b4;
          auVar96._12_4_ = fVar293;
          fVar261 = fVar243 * -fVar292 * fStack_5b0;
          auVar96._16_4_ = fVar261;
          fVar296 = fVar328 * -fVar315 * fStack_5ac;
          auVar96._20_4_ = fVar296;
          fVar298 = fVar244 * -fVar329 * fStack_5a8;
          auVar96._24_4_ = fVar298;
          auVar96._28_4_ = local_7e0._28_4_;
          auVar193 = vsubps_avx(auVar166,auVar94);
          auVar257._0_4_ = auVar269._0_4_ + fVar258;
          auVar257._4_4_ = auVar269._4_4_ + fVar289;
          auVar257._8_4_ = auVar269._8_4_ + fVar291;
          auVar257._12_4_ = auVar269._12_4_ + fVar293;
          auVar257._16_4_ = auVar269._16_4_ + fVar261;
          auVar257._20_4_ = auVar269._20_4_ + fVar296;
          auVar257._24_4_ = auVar269._24_4_ + fVar298;
          auVar257._28_4_ = auVar269._28_4_ + local_7e0._28_4_;
          fVar258 = fVar275 * 0.0 * (float)local_5c0._0_4_;
          fVar289 = fVar277 * 0.0 * (float)local_5c0._4_4_;
          auVar97._4_4_ = fVar289;
          auVar97._0_4_ = fVar258;
          fVar291 = fVar242 * 0.0 * fStack_5b8;
          auVar97._8_4_ = fVar291;
          fVar293 = fVar327 * 0.0 * fStack_5b4;
          auVar97._12_4_ = fVar293;
          fVar261 = fVar243 * 0.0 * fStack_5b0;
          auVar97._16_4_ = fVar261;
          fVar296 = fVar328 * 0.0 * fStack_5ac;
          auVar97._20_4_ = fVar296;
          fVar298 = fVar244 * 0.0 * fStack_5a8;
          auVar97._24_4_ = fVar298;
          auVar97._28_4_ = auVar166._28_4_;
          auVar27 = vsubps_avx(auVar284,auVar95);
          auVar338._0_4_ = (float)local_680._0_4_ + fVar258;
          auVar338._4_4_ = (float)local_680._4_4_ + fVar289;
          auVar338._8_4_ = fStack_678 + fVar291;
          auVar338._12_4_ = fStack_674 + fVar293;
          auVar338._16_4_ = fStack_670 + fVar261;
          auVar338._20_4_ = fStack_66c + fVar296;
          auVar338._24_4_ = fStack_668 + fVar298;
          auVar338._28_4_ = fStack_664 + auVar166._28_4_;
          auVar28 = vsubps_avx(auVar269,auVar96);
          auVar29 = vsubps_avx(_local_680,auVar97);
          auVar30 = vsubps_avx(auVar257,auVar192);
          auVar31 = vsubps_avx(auVar338,auVar193);
          auVar98._4_4_ = auVar193._4_4_ * auVar30._4_4_;
          auVar98._0_4_ = auVar193._0_4_ * auVar30._0_4_;
          auVar98._8_4_ = auVar193._8_4_ * auVar30._8_4_;
          auVar98._12_4_ = auVar193._12_4_ * auVar30._12_4_;
          auVar98._16_4_ = auVar193._16_4_ * auVar30._16_4_;
          auVar98._20_4_ = auVar193._20_4_ * auVar30._20_4_;
          auVar98._24_4_ = auVar193._24_4_ * auVar30._24_4_;
          auVar98._28_4_ = auVar375._28_4_;
          auVar99._4_4_ = auVar192._4_4_ * auVar31._4_4_;
          auVar99._0_4_ = auVar192._0_4_ * auVar31._0_4_;
          auVar99._8_4_ = auVar192._8_4_ * auVar31._8_4_;
          auVar99._12_4_ = auVar192._12_4_ * auVar31._12_4_;
          auVar99._16_4_ = auVar192._16_4_ * auVar31._16_4_;
          auVar99._20_4_ = auVar192._20_4_ * auVar31._20_4_;
          auVar99._24_4_ = auVar192._24_4_ * auVar31._24_4_;
          auVar99._28_4_ = fStack_664;
          auVar41 = vsubps_avx(auVar99,auVar98);
          auVar100._4_4_ = auVar320._4_4_ * auVar31._4_4_;
          auVar100._0_4_ = auVar320._0_4_ * auVar31._0_4_;
          auVar100._8_4_ = auVar320._8_4_ * auVar31._8_4_;
          auVar100._12_4_ = auVar320._12_4_ * auVar31._12_4_;
          auVar100._16_4_ = auVar320._16_4_ * auVar31._16_4_;
          auVar100._20_4_ = auVar320._20_4_ * auVar31._20_4_;
          auVar100._24_4_ = auVar320._24_4_ * auVar31._24_4_;
          auVar100._28_4_ = auVar31._28_4_;
          auVar31 = vsubps_avx(auVar385,auVar320);
          auVar101._4_4_ = auVar193._4_4_ * auVar31._4_4_;
          auVar101._0_4_ = auVar193._0_4_ * auVar31._0_4_;
          auVar101._8_4_ = auVar193._8_4_ * auVar31._8_4_;
          auVar101._12_4_ = auVar193._12_4_ * auVar31._12_4_;
          auVar101._16_4_ = auVar193._16_4_ * auVar31._16_4_;
          auVar101._20_4_ = auVar193._20_4_ * auVar31._20_4_;
          auVar101._24_4_ = auVar193._24_4_ * auVar31._24_4_;
          auVar101._28_4_ = auVar26._28_4_;
          auVar42 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar192._4_4_ * auVar31._4_4_;
          auVar102._0_4_ = auVar192._0_4_ * auVar31._0_4_;
          auVar102._8_4_ = auVar192._8_4_ * auVar31._8_4_;
          auVar102._12_4_ = auVar192._12_4_ * auVar31._12_4_;
          auVar102._16_4_ = auVar192._16_4_ * auVar31._16_4_;
          auVar102._20_4_ = auVar192._20_4_ * auVar31._20_4_;
          auVar102._24_4_ = auVar192._24_4_ * auVar31._24_4_;
          auVar102._28_4_ = auVar26._28_4_;
          auVar103._4_4_ = auVar320._4_4_ * auVar30._4_4_;
          auVar103._0_4_ = auVar320._0_4_ * auVar30._0_4_;
          auVar103._8_4_ = auVar320._8_4_ * auVar30._8_4_;
          auVar103._12_4_ = auVar320._12_4_ * auVar30._12_4_;
          auVar103._16_4_ = auVar320._16_4_ * auVar30._16_4_;
          auVar103._20_4_ = auVar320._20_4_ * auVar30._20_4_;
          auVar103._24_4_ = auVar320._24_4_ * auVar30._24_4_;
          auVar103._28_4_ = auVar30._28_4_;
          auVar26 = vsubps_avx(auVar103,auVar102);
          auVar199._0_4_ = auVar41._0_4_ * 0.0 + auVar26._0_4_ + auVar42._0_4_ * 0.0;
          auVar199._4_4_ = auVar41._4_4_ * 0.0 + auVar26._4_4_ + auVar42._4_4_ * 0.0;
          auVar199._8_4_ = auVar41._8_4_ * 0.0 + auVar26._8_4_ + auVar42._8_4_ * 0.0;
          auVar199._12_4_ = auVar41._12_4_ * 0.0 + auVar26._12_4_ + auVar42._12_4_ * 0.0;
          auVar199._16_4_ = auVar41._16_4_ * 0.0 + auVar26._16_4_ + auVar42._16_4_ * 0.0;
          auVar199._20_4_ = auVar41._20_4_ * 0.0 + auVar26._20_4_ + auVar42._20_4_ * 0.0;
          auVar199._24_4_ = auVar41._24_4_ * 0.0 + auVar26._24_4_ + auVar42._24_4_ * 0.0;
          auVar199._28_4_ = auVar41._28_4_ + auVar26._28_4_ + auVar42._28_4_;
          auVar157 = vcmpps_avx(auVar199,ZEXT832(0) << 0x20,2);
          auVar26 = vblendvps_avx(auVar27,_local_7c0,auVar157);
          auVar27 = vblendvps_avx(auVar28,_local_6e0,auVar157);
          auVar28 = vblendvps_avx(auVar29,auVar400,auVar157);
          auVar29 = vblendvps_avx(auVar320,auVar385,auVar157);
          auVar30 = vblendvps_avx(auVar192,auVar257,auVar157);
          auVar31 = vblendvps_avx(auVar193,auVar338,auVar157);
          auVar41 = vblendvps_avx(auVar385,auVar320,auVar157);
          auVar42 = vblendvps_avx(auVar257,auVar192,auVar157);
          auVar156 = vblendvps_avx(auVar338,auVar193,auVar157);
          auVar320 = vandps_avx(local_660,_local_560);
          auVar41 = vsubps_avx(auVar41,auVar26);
          auVar194 = vsubps_avx(auVar42,auVar27);
          auVar156 = vsubps_avx(auVar156,auVar28);
          auVar221 = vsubps_avx(auVar27,auVar30);
          fVar258 = auVar194._0_4_;
          fVar297 = auVar28._0_4_;
          fVar209 = auVar194._4_4_;
          fVar299 = auVar28._4_4_;
          auVar104._4_4_ = fVar299 * fVar209;
          auVar104._0_4_ = fVar297 * fVar258;
          fVar274 = auVar194._8_4_;
          fVar301 = auVar28._8_4_;
          auVar104._8_4_ = fVar301 * fVar274;
          fVar327 = auVar194._12_4_;
          fVar311 = auVar28._12_4_;
          auVar104._12_4_ = fVar311 * fVar327;
          fVar210 = auVar194._16_4_;
          fVar312 = auVar28._16_4_;
          auVar104._16_4_ = fVar312 * fVar210;
          fVar186 = auVar194._20_4_;
          fVar314 = auVar28._20_4_;
          auVar104._20_4_ = fVar314 * fVar186;
          fVar340 = auVar194._24_4_;
          fVar316 = auVar28._24_4_;
          auVar104._24_4_ = fVar316 * fVar340;
          auVar104._28_4_ = auVar42._28_4_;
          fVar289 = auVar27._0_4_;
          fVar331 = auVar156._0_4_;
          fVar264 = auVar27._4_4_;
          fVar341 = auVar156._4_4_;
          auVar105._4_4_ = fVar341 * fVar264;
          auVar105._0_4_ = fVar331 * fVar289;
          fVar275 = auVar27._8_4_;
          fVar342 = auVar156._8_4_;
          auVar105._8_4_ = fVar342 * fVar275;
          fVar292 = auVar27._12_4_;
          fVar344 = auVar156._12_4_;
          auVar105._12_4_ = fVar344 * fVar292;
          fVar295 = auVar27._16_4_;
          fVar346 = auVar156._16_4_;
          auVar105._16_4_ = fVar346 * fVar295;
          fVar211 = auVar27._20_4_;
          fVar348 = auVar156._20_4_;
          auVar105._20_4_ = fVar348 * fVar211;
          fVar300 = auVar27._24_4_;
          fVar350 = auVar156._24_4_;
          uVar149 = auVar192._28_4_;
          auVar105._24_4_ = fVar350 * fVar300;
          auVar105._28_4_ = uVar149;
          auVar42 = vsubps_avx(auVar105,auVar104);
          fVar291 = auVar26._0_4_;
          fVar379 = auVar26._4_4_;
          auVar106._4_4_ = fVar341 * fVar379;
          auVar106._0_4_ = fVar331 * fVar291;
          fVar276 = auVar26._8_4_;
          auVar106._8_4_ = fVar342 * fVar276;
          fVar243 = auVar26._12_4_;
          auVar106._12_4_ = fVar344 * fVar243;
          fVar351 = auVar26._16_4_;
          auVar106._16_4_ = fVar346 * fVar351;
          fVar279 = auVar26._20_4_;
          auVar106._20_4_ = fVar348 * fVar279;
          fVar343 = auVar26._24_4_;
          auVar106._24_4_ = fVar350 * fVar343;
          auVar106._28_4_ = uVar149;
          fVar293 = auVar41._0_4_;
          fVar366 = auVar41._4_4_;
          auVar107._4_4_ = fVar299 * fVar366;
          auVar107._0_4_ = fVar297 * fVar293;
          fVar277 = auVar41._8_4_;
          auVar107._8_4_ = fVar301 * fVar277;
          fVar315 = auVar41._12_4_;
          auVar107._12_4_ = fVar311 * fVar315;
          fVar175 = auVar41._16_4_;
          auVar107._16_4_ = fVar312 * fVar175;
          fVar288 = auVar41._20_4_;
          auVar107._20_4_ = fVar314 * fVar288;
          fVar345 = auVar41._24_4_;
          auVar107._24_4_ = fVar316 * fVar345;
          auVar107._28_4_ = auVar385._28_4_;
          auVar192 = vsubps_avx(auVar107,auVar106);
          auVar108._4_4_ = fVar264 * fVar366;
          auVar108._0_4_ = fVar289 * fVar293;
          auVar108._8_4_ = fVar275 * fVar277;
          auVar108._12_4_ = fVar292 * fVar315;
          auVar108._16_4_ = fVar295 * fVar175;
          auVar108._20_4_ = fVar211 * fVar288;
          auVar108._24_4_ = fVar300 * fVar345;
          auVar108._28_4_ = uVar149;
          auVar109._4_4_ = fVar379 * fVar209;
          auVar109._0_4_ = fVar291 * fVar258;
          auVar109._8_4_ = fVar276 * fVar274;
          auVar109._12_4_ = fVar243 * fVar327;
          auVar109._16_4_ = fVar351 * fVar210;
          auVar109._20_4_ = fVar279 * fVar186;
          auVar109._24_4_ = fVar343 * fVar340;
          auVar109._28_4_ = auVar193._28_4_;
          auVar193 = vsubps_avx(auVar109,auVar108);
          auVar28 = vsubps_avx(auVar28,auVar31);
          fVar296 = auVar193._28_4_ + auVar192._28_4_;
          local_7e0._0_4_ = auVar193._0_4_ + auVar192._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
          local_7e0._4_4_ = auVar193._4_4_ + auVar192._4_4_ * 0.0 + auVar42._4_4_ * 0.0;
          local_7e0._8_4_ = auVar193._8_4_ + auVar192._8_4_ * 0.0 + auVar42._8_4_ * 0.0;
          local_7e0._12_4_ = auVar193._12_4_ + auVar192._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
          local_7e0._16_4_ = auVar193._16_4_ + auVar192._16_4_ * 0.0 + auVar42._16_4_ * 0.0;
          local_7e0._20_4_ = auVar193._20_4_ + auVar192._20_4_ * 0.0 + auVar42._20_4_ * 0.0;
          local_7e0._24_4_ = auVar193._24_4_ + auVar192._24_4_ * 0.0 + auVar42._24_4_ * 0.0;
          local_7e0._28_4_ = fVar296 + auVar42._28_4_;
          fVar261 = auVar221._0_4_;
          fVar265 = auVar221._4_4_;
          auVar110._4_4_ = auVar31._4_4_ * fVar265;
          auVar110._0_4_ = auVar31._0_4_ * fVar261;
          fVar326 = auVar221._8_4_;
          auVar110._8_4_ = auVar31._8_4_ * fVar326;
          fVar328 = auVar221._12_4_;
          auVar110._12_4_ = auVar31._12_4_ * fVar328;
          fVar178 = auVar221._16_4_;
          auVar110._16_4_ = auVar31._16_4_ * fVar178;
          fVar290 = auVar221._20_4_;
          auVar110._20_4_ = auVar31._20_4_ * fVar290;
          fVar347 = auVar221._24_4_;
          auVar110._24_4_ = auVar31._24_4_ * fVar347;
          auVar110._28_4_ = fVar296;
          fVar296 = auVar28._0_4_;
          fVar272 = auVar28._4_4_;
          auVar111._4_4_ = auVar30._4_4_ * fVar272;
          auVar111._0_4_ = auVar30._0_4_ * fVar296;
          fVar242 = auVar28._8_4_;
          auVar111._8_4_ = auVar30._8_4_ * fVar242;
          fVar329 = auVar28._12_4_;
          auVar111._12_4_ = auVar30._12_4_ * fVar329;
          fVar180 = auVar28._16_4_;
          auVar111._16_4_ = auVar30._16_4_ * fVar180;
          fVar263 = auVar28._20_4_;
          auVar111._20_4_ = auVar30._20_4_ * fVar263;
          fVar349 = auVar28._24_4_;
          auVar111._24_4_ = auVar30._24_4_ * fVar349;
          auVar111._28_4_ = auVar193._28_4_;
          auVar192 = vsubps_avx(auVar111,auVar110);
          auVar26 = vsubps_avx(auVar26,auVar29);
          auVar386 = ZEXT3264(auVar26);
          fVar298 = auVar26._0_4_;
          fVar273 = auVar26._4_4_;
          auVar112._4_4_ = auVar31._4_4_ * fVar273;
          auVar112._0_4_ = auVar31._0_4_ * fVar298;
          fVar313 = auVar26._8_4_;
          auVar112._8_4_ = auVar31._8_4_ * fVar313;
          fVar244 = auVar26._12_4_;
          auVar112._12_4_ = auVar31._12_4_ * fVar244;
          fVar182 = auVar26._16_4_;
          auVar112._16_4_ = auVar31._16_4_ * fVar182;
          fVar330 = auVar26._20_4_;
          auVar112._20_4_ = auVar31._20_4_ * fVar330;
          fVar294 = auVar26._24_4_;
          auVar112._24_4_ = auVar31._24_4_ * fVar294;
          auVar112._28_4_ = auVar31._28_4_;
          auVar113._4_4_ = fVar272 * auVar29._4_4_;
          auVar113._0_4_ = fVar296 * auVar29._0_4_;
          auVar113._8_4_ = fVar242 * auVar29._8_4_;
          auVar113._12_4_ = fVar329 * auVar29._12_4_;
          auVar113._16_4_ = fVar180 * auVar29._16_4_;
          auVar113._20_4_ = fVar263 * auVar29._20_4_;
          auVar113._24_4_ = fVar349 * auVar29._24_4_;
          auVar113._28_4_ = auVar42._28_4_;
          auVar26 = vsubps_avx(auVar112,auVar113);
          auVar114._4_4_ = auVar30._4_4_ * fVar273;
          auVar114._0_4_ = auVar30._0_4_ * fVar298;
          auVar114._8_4_ = auVar30._8_4_ * fVar313;
          auVar114._12_4_ = auVar30._12_4_ * fVar244;
          auVar114._16_4_ = auVar30._16_4_ * fVar182;
          auVar114._20_4_ = auVar30._20_4_ * fVar330;
          auVar114._24_4_ = auVar30._24_4_ * fVar294;
          auVar114._28_4_ = auVar30._28_4_;
          auVar115._4_4_ = fVar265 * auVar29._4_4_;
          auVar115._0_4_ = fVar261 * auVar29._0_4_;
          auVar115._8_4_ = fVar326 * auVar29._8_4_;
          auVar115._12_4_ = fVar328 * auVar29._12_4_;
          auVar115._16_4_ = fVar178 * auVar29._16_4_;
          auVar115._20_4_ = fVar290 * auVar29._20_4_;
          auVar115._24_4_ = fVar347 * auVar29._24_4_;
          auVar115._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar115,auVar114);
          auVar167._0_4_ = auVar192._0_4_ * 0.0 + auVar29._0_4_ + auVar26._0_4_ * 0.0;
          auVar167._4_4_ = auVar192._4_4_ * 0.0 + auVar29._4_4_ + auVar26._4_4_ * 0.0;
          auVar167._8_4_ = auVar192._8_4_ * 0.0 + auVar29._8_4_ + auVar26._8_4_ * 0.0;
          auVar167._12_4_ = auVar192._12_4_ * 0.0 + auVar29._12_4_ + auVar26._12_4_ * 0.0;
          auVar167._16_4_ = auVar192._16_4_ * 0.0 + auVar29._16_4_ + auVar26._16_4_ * 0.0;
          auVar167._20_4_ = auVar192._20_4_ * 0.0 + auVar29._20_4_ + auVar26._20_4_ * 0.0;
          auVar167._24_4_ = auVar192._24_4_ * 0.0 + auVar29._24_4_ + auVar26._24_4_ * 0.0;
          auVar167._28_4_ = auVar26._28_4_ + auVar29._28_4_ + auVar26._28_4_;
          auVar26 = vmaxps_avx(local_7e0,auVar167);
          auVar26 = vcmpps_avx(auVar26,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar29 = auVar320 & auVar26;
          auVar123 = auVar27;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0x7f,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0xbf,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar29[0x1f]) {
LAB_00ae76aa:
            auVar286 = ZEXT3264(auVar123);
            auVar241._8_8_ = uStack_5f8;
            auVar241._0_8_ = local_600;
            auVar241._16_8_ = uStack_5f0;
            auVar241._24_8_ = uStack_5e8;
            auVar377._4_4_ = fVar173;
            auVar377._0_4_ = fVar151;
            auVar377._8_4_ = fVar176;
            auVar377._12_4_ = fVar179;
            auVar377._16_4_ = fVar181;
            auVar377._20_4_ = fVar183;
            auVar377._24_4_ = fVar184;
            auVar377._28_4_ = fVar185;
          }
          else {
            auVar29 = vandps_avx(auVar26,auVar320);
            auVar116._4_4_ = fVar272 * fVar209;
            auVar116._0_4_ = fVar296 * fVar258;
            auVar116._8_4_ = fVar242 * fVar274;
            auVar116._12_4_ = fVar329 * fVar327;
            auVar116._16_4_ = fVar180 * fVar210;
            auVar116._20_4_ = fVar263 * fVar186;
            auVar116._24_4_ = fVar349 * fVar340;
            auVar116._28_4_ = auVar320._28_4_;
            auVar117._4_4_ = fVar265 * fVar341;
            auVar117._0_4_ = fVar261 * fVar331;
            auVar117._8_4_ = fVar326 * fVar342;
            auVar117._12_4_ = fVar328 * fVar344;
            auVar117._16_4_ = fVar178 * fVar346;
            auVar117._20_4_ = fVar290 * fVar348;
            auVar117._24_4_ = fVar347 * fVar350;
            auVar117._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar117,auVar116);
            auVar118._4_4_ = fVar273 * fVar341;
            auVar118._0_4_ = fVar298 * fVar331;
            auVar118._8_4_ = fVar313 * fVar342;
            auVar118._12_4_ = fVar244 * fVar344;
            auVar118._16_4_ = fVar182 * fVar346;
            auVar118._20_4_ = fVar330 * fVar348;
            auVar118._24_4_ = fVar294 * fVar350;
            auVar118._28_4_ = auVar156._28_4_;
            auVar119._4_4_ = fVar272 * fVar366;
            auVar119._0_4_ = fVar296 * fVar293;
            auVar119._8_4_ = fVar242 * fVar277;
            auVar119._12_4_ = fVar329 * fVar315;
            auVar119._16_4_ = fVar180 * fVar175;
            auVar119._20_4_ = fVar263 * fVar288;
            auVar119._24_4_ = fVar349 * fVar345;
            auVar119._28_4_ = auVar28._28_4_;
            auVar30 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar265 * fVar366;
            auVar120._0_4_ = fVar261 * fVar293;
            auVar120._8_4_ = fVar326 * fVar277;
            auVar120._12_4_ = fVar328 * fVar315;
            auVar120._16_4_ = fVar178 * fVar175;
            auVar120._20_4_ = fVar290 * fVar288;
            auVar120._24_4_ = fVar347 * fVar345;
            auVar120._28_4_ = auVar41._28_4_;
            auVar121._4_4_ = fVar273 * fVar209;
            auVar121._0_4_ = fVar298 * fVar258;
            auVar121._8_4_ = fVar313 * fVar274;
            auVar121._12_4_ = fVar244 * fVar327;
            auVar121._16_4_ = fVar182 * fVar210;
            auVar121._20_4_ = fVar330 * fVar186;
            auVar121._24_4_ = fVar294 * fVar340;
            auVar121._28_4_ = auVar194._28_4_;
            auVar31 = vsubps_avx(auVar121,auVar120);
            auVar324._0_4_ = auVar26._0_4_ * 0.0 + auVar31._0_4_ + auVar30._0_4_ * 0.0;
            auVar324._4_4_ = auVar26._4_4_ * 0.0 + auVar31._4_4_ + auVar30._4_4_ * 0.0;
            auVar324._8_4_ = auVar26._8_4_ * 0.0 + auVar31._8_4_ + auVar30._8_4_ * 0.0;
            auVar324._12_4_ = auVar26._12_4_ * 0.0 + auVar31._12_4_ + auVar30._12_4_ * 0.0;
            auVar324._16_4_ = auVar26._16_4_ * 0.0 + auVar31._16_4_ + auVar30._16_4_ * 0.0;
            auVar324._20_4_ = auVar26._20_4_ * 0.0 + auVar31._20_4_ + auVar30._20_4_ * 0.0;
            auVar324._24_4_ = auVar26._24_4_ * 0.0 + auVar31._24_4_ + auVar30._24_4_ * 0.0;
            auVar324._28_4_ = auVar221._28_4_ + auVar31._28_4_ + auVar41._28_4_;
            auVar320 = vrcpps_avx(auVar324);
            fVar258 = auVar320._0_4_;
            fVar293 = auVar320._4_4_;
            auVar122._4_4_ = auVar324._4_4_ * fVar293;
            auVar122._0_4_ = auVar324._0_4_ * fVar258;
            fVar261 = auVar320._8_4_;
            auVar122._8_4_ = auVar324._8_4_ * fVar261;
            fVar296 = auVar320._12_4_;
            auVar122._12_4_ = auVar324._12_4_ * fVar296;
            fVar298 = auVar320._16_4_;
            auVar122._16_4_ = auVar324._16_4_ * fVar298;
            fVar209 = auVar320._20_4_;
            auVar122._20_4_ = auVar324._20_4_ * fVar209;
            fVar366 = auVar320._24_4_;
            auVar122._24_4_ = auVar324._24_4_ * fVar366;
            auVar122._28_4_ = auVar28._28_4_;
            auVar376._8_4_ = 0x3f800000;
            auVar376._0_8_ = 0x3f8000003f800000;
            auVar376._12_4_ = 0x3f800000;
            auVar376._16_4_ = 0x3f800000;
            auVar376._20_4_ = 0x3f800000;
            auVar376._24_4_ = 0x3f800000;
            auVar376._28_4_ = 0x3f800000;
            auVar320 = vsubps_avx(auVar376,auVar122);
            fVar258 = auVar320._0_4_ * fVar258 + fVar258;
            fVar293 = auVar320._4_4_ * fVar293 + fVar293;
            fVar261 = auVar320._8_4_ * fVar261 + fVar261;
            fVar296 = auVar320._12_4_ * fVar296 + fVar296;
            fVar298 = auVar320._16_4_ * fVar298 + fVar298;
            fVar209 = auVar320._20_4_ * fVar209 + fVar209;
            fVar366 = auVar320._24_4_ * fVar366 + fVar366;
            fVar289 = auVar30._0_4_ * fVar289;
            fVar264 = auVar30._4_4_ * fVar264;
            auVar123._4_4_ = fVar264;
            auVar123._0_4_ = fVar289;
            fVar275 = auVar30._8_4_ * fVar275;
            auVar123._8_4_ = fVar275;
            fVar292 = auVar30._12_4_ * fVar292;
            auVar123._12_4_ = fVar292;
            fVar295 = auVar30._16_4_ * fVar295;
            auVar123._16_4_ = fVar295;
            fVar211 = auVar30._20_4_ * fVar211;
            auVar123._20_4_ = fVar211;
            fVar300 = auVar30._24_4_ * fVar300;
            auVar123._24_4_ = fVar300;
            auVar123._28_4_ = auVar27._28_4_;
            auVar124._4_4_ = (fVar379 * auVar26._4_4_ + fVar264 + fVar299 * auVar31._4_4_) * fVar293
            ;
            auVar124._0_4_ = (fVar291 * auVar26._0_4_ + fVar289 + fVar297 * auVar31._0_4_) * fVar258
            ;
            auVar124._8_4_ = (fVar276 * auVar26._8_4_ + fVar275 + fVar301 * auVar31._8_4_) * fVar261
            ;
            auVar124._12_4_ =
                 (fVar243 * auVar26._12_4_ + fVar292 + fVar311 * auVar31._12_4_) * fVar296;
            auVar124._16_4_ =
                 (fVar351 * auVar26._16_4_ + fVar295 + fVar312 * auVar31._16_4_) * fVar298;
            auVar124._20_4_ =
                 (fVar279 * auVar26._20_4_ + fVar211 + fVar314 * auVar31._20_4_) * fVar209;
            auVar124._24_4_ =
                 (fVar343 * auVar26._24_4_ + fVar300 + fVar316 * auVar31._24_4_) * fVar366;
            auVar124._28_4_ = auVar27._28_4_ + auVar31._28_4_;
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar240._4_4_ = uVar149;
            auVar240._0_4_ = uVar149;
            auVar240._8_4_ = uVar149;
            auVar240._12_4_ = uVar149;
            auVar240._16_4_ = uVar149;
            auVar240._20_4_ = uVar149;
            auVar240._24_4_ = uVar149;
            auVar240._28_4_ = uVar149;
            auVar26 = vcmpps_avx(local_120,auVar124,2);
            auVar320 = vcmpps_avx(auVar124,auVar240,2);
            auVar320 = vandps_avx(auVar26,auVar320);
            auVar27 = auVar29 & auVar320;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) goto LAB_00ae76aa;
            auVar320 = vandps_avx(auVar29,auVar320);
            auVar286 = ZEXT3264(auVar320);
            auVar27 = vcmpps_avx(auVar324,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar28 = auVar320 & auVar27;
            auVar241._8_8_ = uStack_5f8;
            auVar241._0_8_ = local_600;
            auVar241._16_8_ = uStack_5f0;
            auVar241._24_8_ = uStack_5e8;
            auVar377._4_4_ = fVar173;
            auVar377._0_4_ = fVar151;
            auVar377._8_4_ = fVar176;
            auVar377._12_4_ = fVar179;
            auVar377._16_4_ = fVar181;
            auVar377._20_4_ = fVar183;
            auVar377._24_4_ = fVar184;
            auVar377._28_4_ = fVar185;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar241 = vandps_avx(auVar27,auVar320);
              auVar125._4_4_ = fVar293 * local_7e0._4_4_;
              auVar125._0_4_ = fVar258 * (float)local_7e0._0_4_;
              auVar125._8_4_ = fVar261 * local_7e0._8_4_;
              auVar125._12_4_ = fVar296 * local_7e0._12_4_;
              auVar125._16_4_ = fVar298 * local_7e0._16_4_;
              auVar125._20_4_ = fVar209 * local_7e0._20_4_;
              auVar125._24_4_ = fVar366 * local_7e0._24_4_;
              auVar125._28_4_ = auVar26._28_4_;
              auVar126._4_4_ = auVar167._4_4_ * fVar293;
              auVar126._0_4_ = auVar167._0_4_ * fVar258;
              auVar126._8_4_ = auVar167._8_4_ * fVar261;
              auVar126._12_4_ = auVar167._12_4_ * fVar296;
              auVar126._16_4_ = auVar167._16_4_ * fVar298;
              auVar126._20_4_ = auVar167._20_4_ * fVar209;
              auVar126._24_4_ = auVar167._24_4_ * fVar366;
              auVar126._28_4_ = auVar167._28_4_;
              auVar285._8_4_ = 0x3f800000;
              auVar285._0_8_ = 0x3f8000003f800000;
              auVar285._12_4_ = 0x3f800000;
              auVar285._16_4_ = 0x3f800000;
              auVar285._20_4_ = 0x3f800000;
              auVar285._24_4_ = 0x3f800000;
              auVar285._28_4_ = 0x3f800000;
              auVar286 = ZEXT3264(auVar285);
              auVar320 = vsubps_avx(auVar285,auVar125);
              local_5e0 = vblendvps_avx(auVar320,auVar125,auVar157);
              auVar320 = vsubps_avx(auVar285,auVar126);
              _local_4a0 = vblendvps_avx(auVar320,auVar126,auVar157);
              local_580 = auVar124;
            }
          }
          auVar339 = ZEXT3264(local_7a0);
          if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar241 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar241 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar241 >> 0x7f,0) != '\0') ||
                (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar241 >> 0xbf,0) != '\0') ||
              (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar241[0x1f] < '\0') {
            auVar320 = vsubps_avx(_local_5c0,auVar377);
            fVar289 = auVar377._0_4_ + auVar320._0_4_ * local_5e0._0_4_;
            fVar291 = auVar377._4_4_ + auVar320._4_4_ * local_5e0._4_4_;
            fVar293 = auVar377._8_4_ + auVar320._8_4_ * local_5e0._8_4_;
            fVar261 = auVar377._12_4_ + auVar320._12_4_ * local_5e0._12_4_;
            fVar296 = auVar377._16_4_ + auVar320._16_4_ * local_5e0._16_4_;
            fVar298 = auVar377._20_4_ + auVar320._20_4_ * local_5e0._20_4_;
            fVar209 = auVar377._24_4_ + auVar320._24_4_ * local_5e0._24_4_;
            fVar264 = auVar377._28_4_ + auVar320._28_4_;
            fVar258 = *(float *)((long)local_708->ray_space + k * 4 + -0x20);
            auVar127._4_4_ = (fVar291 + fVar291) * fVar258;
            auVar127._0_4_ = (fVar289 + fVar289) * fVar258;
            auVar127._8_4_ = (fVar293 + fVar293) * fVar258;
            auVar127._12_4_ = (fVar261 + fVar261) * fVar258;
            auVar127._16_4_ = (fVar296 + fVar296) * fVar258;
            auVar127._20_4_ = (fVar298 + fVar298) * fVar258;
            auVar127._24_4_ = (fVar209 + fVar209) * fVar258;
            auVar127._28_4_ = fVar264 + fVar264;
            auVar320 = vcmpps_avx(local_580,auVar127,6);
            auVar26 = auVar241 & auVar320;
            auVar309 = ZEXT3264(_local_6a0);
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              local_3c0 = (float)local_4a0._0_4_ + (float)local_4a0._0_4_ + -1.0;
              fStack_3bc = (float)local_4a0._4_4_ + (float)local_4a0._4_4_ + -1.0;
              fStack_3b8 = (float)uStack_498 + (float)uStack_498 + -1.0;
              fStack_3b4 = uStack_498._4_4_ + uStack_498._4_4_ + -1.0;
              fStack_3b0 = (float)uStack_490 + (float)uStack_490 + -1.0;
              fStack_3ac = uStack_490._4_4_ + uStack_490._4_4_ + -1.0;
              fStack_3a8 = (float)uStack_488 + (float)uStack_488 + -1.0;
              fStack_3a4 = uStack_488._4_4_ + uStack_488._4_4_ + -1.0;
              local_3e0 = local_5e0;
              local_4a0._4_4_ = fStack_3bc;
              local_4a0._0_4_ = local_3c0;
              uStack_498._0_4_ = fStack_3b8;
              uStack_498._4_4_ = fStack_3b4;
              uStack_490._0_4_ = fStack_3b0;
              uStack_490._4_4_ = fStack_3ac;
              auVar138 = _local_4a0;
              uStack_488._0_4_ = fStack_3a8;
              uStack_488._4_4_ = fStack_3a4;
              auVar26 = _local_4a0;
              local_3a0 = local_580;
              uStack_368 = uStack_8e8;
              uStack_358 = uStack_838;
              uStack_348 = uStack_848;
              uStack_338 = uStack_858;
              pGVar22 = (context->scene->geometries).items[local_730].ptr;
              _local_4a0 = auVar26;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_640 = vandps_avx(auVar320,auVar241);
                auVar215._0_4_ = (float)(int)local_380;
                auVar215._4_12_ = auVar192._4_12_;
                auVar267 = vshufps_avx(auVar215,auVar215,0);
                local_300[0] = (auVar267._0_4_ + local_5e0._0_4_ + 0.0) * (float)local_140._0_4_;
                local_300[1] = (auVar267._4_4_ + local_5e0._4_4_ + 1.0) * (float)local_140._4_4_;
                local_300[2] = (auVar267._8_4_ + local_5e0._8_4_ + 2.0) * fStack_138;
                local_300[3] = (auVar267._12_4_ + local_5e0._12_4_ + 3.0) * fStack_134;
                fStack_2f0 = (auVar267._0_4_ + local_5e0._16_4_ + 4.0) * fStack_130;
                fStack_2ec = (auVar267._4_4_ + local_5e0._20_4_ + 5.0) * fStack_12c;
                fStack_2e8 = (auVar267._8_4_ + local_5e0._24_4_ + 6.0) * fStack_128;
                fStack_2e4 = auVar267._12_4_ + local_5e0._28_4_ + 7.0;
                uStack_490 = auVar138._16_8_;
                uStack_488 = auVar26._24_8_;
                local_2e0 = local_4a0;
                uStack_2d8 = uStack_498;
                uStack_2d0 = uStack_490;
                uStack_2c8 = uStack_488;
                local_2c0 = local_580;
                auVar200._8_4_ = 0x7f800000;
                auVar200._0_8_ = 0x7f8000007f800000;
                auVar200._12_4_ = 0x7f800000;
                auVar200._16_4_ = 0x7f800000;
                auVar200._20_4_ = 0x7f800000;
                auVar200._24_4_ = 0x7f800000;
                auVar200._28_4_ = 0x7f800000;
                auVar320 = vblendvps_avx(auVar200,local_580,local_640);
                auVar26 = vshufps_avx(auVar320,auVar320,0xb1);
                auVar26 = vminps_avx(auVar320,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar26 = vcmpps_avx(auVar320,auVar26,0);
                auVar27 = local_640 & auVar26;
                auVar320 = local_640;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  auVar320 = vandps_avx(auVar26,local_640);
                }
                uVar141 = vmovmskps_avx(auVar320);
                uVar139 = 0;
                if (uVar141 != 0) {
                  for (; (uVar141 >> uVar139 & 1) == 0; uVar139 = uVar139 + 1) {
                  }
                }
                uVar145 = (ulong)uVar139;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar258 = local_300[uVar145];
                  uVar149 = *(undefined4 *)((long)&local_2e0 + uVar145 * 4);
                  fVar291 = 1.0 - fVar258;
                  fVar289 = fVar258 * fVar291 * 4.0;
                  auVar286 = ZEXT464(0x3f000000);
                  auVar267 = ZEXT416((uint)(fVar258 * fVar258 * 0.5));
                  auVar267 = vshufps_avx(auVar267,auVar267,0);
                  auVar216 = ZEXT416((uint)((fVar291 * fVar291 + fVar289) * 0.5));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  auVar218 = ZEXT416((uint)((-fVar258 * fVar258 - fVar289) * 0.5));
                  auVar218 = vshufps_avx(auVar218,auVar218,0);
                  auVar231 = ZEXT416((uint)(fVar291 * -fVar291 * 0.5));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar217._0_4_ =
                       auVar231._0_4_ * fVar302 +
                       auVar218._0_4_ * fVar387 +
                       auVar267._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
                  auVar217._4_4_ =
                       auVar231._4_4_ * fVar310 +
                       auVar218._4_4_ * fVar392 +
                       auVar267._4_4_ * fVar378 + auVar216._4_4_ * fVar401;
                  auVar217._8_4_ =
                       auVar231._8_4_ * auVar303._8_4_ +
                       auVar218._8_4_ * auVar388._8_4_ +
                       auVar267._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
                  auVar217._12_4_ =
                       auVar231._12_4_ * auVar303._12_4_ +
                       auVar218._12_4_ * auVar388._12_4_ +
                       auVar267._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar145 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar217._0_4_;
                  uVar21 = vextractps_avx(auVar217,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
                  uVar21 = vextractps_avx(auVar217,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar258;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                  *(uint *)(ray + k * 4 + 0x220) = uVar19;
                  *(int *)(ray + k * 4 + 0x240) = (int)local_730;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_7c0 = auVar148;
                  stack0xfffffffffffff944 = auVar269._4_28_;
                  local_6c0._0_4_ = local_37c;
                  auVar267 = *local_718;
                  local_7e0._16_8_ = *(undefined8 *)(local_720 + 0x10);
                  local_7e0._24_8_ = *(undefined8 *)(local_720 + 0x18);
                  local_800._16_8_ = *(undefined8 *)(local_720 + 0x10);
                  local_800._0_16_ = *local_718;
                  local_800._24_8_ = *(undefined8 *)(local_720 + 0x18);
                  auVar205 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  auVar320 = vcmpps_avx(_local_6a0,_local_6a0,0xf);
                  auVar325 = ZEXT3264(auVar320);
                  _local_700 = auVar322;
                  local_370 = auVar303._0_8_;
                  local_360 = auVar388._0_8_;
                  local_350 = auVar395._0_8_;
                  local_340 = auVar368._0_8_;
                  while( true ) {
                    local_200 = local_300[uVar145];
                    local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar145 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar145 * 4);
                    fVar258 = 1.0 - local_200;
                    fVar278 = local_200 * fVar258 * 4.0;
                    auVar286 = ZEXT464(0x3f000000);
                    auVar216 = ZEXT416((uint)(local_200 * local_200 * 0.5));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar218 = ZEXT416((uint)((fVar258 * fVar258 + fVar278) * 0.5));
                    auVar218 = vshufps_avx(auVar218,auVar218,0);
                    auVar231 = ZEXT416((uint)((-local_200 * local_200 - fVar278) * 0.5));
                    auVar231 = vshufps_avx(auVar231,auVar231,0);
                    local_830.context = context->user;
                    auVar232 = ZEXT416((uint)(fVar258 * -fVar258 * 0.5));
                    auVar232 = vshufps_avx(auVar232,auVar232,0);
                    auVar219._0_4_ =
                         auVar232._0_4_ * fVar302 +
                         auVar231._0_4_ * fVar387 +
                         auVar216._0_4_ * fVar367 + auVar218._0_4_ * fVar393;
                    auVar219._4_4_ =
                         auVar232._4_4_ * fVar310 +
                         auVar231._4_4_ * fVar392 +
                         auVar216._4_4_ * fVar378 + auVar218._4_4_ * fVar401;
                    auVar219._8_4_ =
                         auVar232._8_4_ * auVar303._8_4_ +
                         auVar231._8_4_ * auVar388._8_4_ +
                         auVar216._8_4_ * auVar368._8_4_ + auVar218._8_4_ * auVar395._8_4_;
                    auVar219._12_4_ =
                         auVar232._12_4_ * auVar303._12_4_ +
                         auVar231._12_4_ * auVar388._12_4_ +
                         auVar216._12_4_ * auVar368._12_4_ + auVar218._12_4_ * auVar395._12_4_;
                    auStack_250 = vshufps_avx(auVar219,auVar219,0);
                    local_260[0] = (RTCHitN)auStack_250[0];
                    local_260[1] = (RTCHitN)auStack_250[1];
                    local_260[2] = (RTCHitN)auStack_250[2];
                    local_260[3] = (RTCHitN)auStack_250[3];
                    local_260[4] = (RTCHitN)auStack_250[4];
                    local_260[5] = (RTCHitN)auStack_250[5];
                    local_260[6] = (RTCHitN)auStack_250[6];
                    local_260[7] = (RTCHitN)auStack_250[7];
                    local_260[8] = (RTCHitN)auStack_250[8];
                    local_260[9] = (RTCHitN)auStack_250[9];
                    local_260[10] = (RTCHitN)auStack_250[10];
                    local_260[0xb] = (RTCHitN)auStack_250[0xb];
                    local_260[0xc] = (RTCHitN)auStack_250[0xc];
                    local_260[0xd] = (RTCHitN)auStack_250[0xd];
                    local_260[0xe] = (RTCHitN)auStack_250[0xe];
                    local_260[0xf] = (RTCHitN)auStack_250[0xf];
                    auStack_230 = vshufps_avx(auVar219,auVar219,0x55);
                    local_240 = auStack_230;
                    auStack_210 = vshufps_avx(auVar219,auVar219,0xaa);
                    local_220 = auStack_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_500._0_8_;
                    uStack_1b8 = local_500._8_8_;
                    uStack_1b0 = local_500._16_8_;
                    uStack_1a8 = local_500._24_8_;
                    local_1a0 = local_4e0._0_8_;
                    uStack_198 = local_4e0._8_8_;
                    uStack_190 = local_4e0._16_8_;
                    uStack_188 = local_4e0._24_8_;
                    local_710[1] = auVar325._0_32_;
                    *local_710 = auVar325._0_32_;
                    local_180 = (local_830.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_830.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_760 = local_800._0_8_;
                    uStack_758 = local_800._8_8_;
                    uStack_750 = local_800._16_8_;
                    uStack_748 = local_800._24_8_;
                    local_830.valid = (int *)&local_760;
                    local_830.geometryUserPtr = pGVar22->userPtr;
                    local_830.hit = local_260;
                    local_830.N = 8;
                    auVar154 = local_7e0._0_16_;
                    auVar190 = auVar267;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar286 = ZEXT1664(auVar286._0_16_);
                      auVar320 = ZEXT1632(auVar325._0_16_);
                      auVar386 = ZEXT1664(auVar386._0_16_);
                      (*pGVar22->intersectionFilterN)(&local_830);
                      auVar205 = ZEXT1664(auVar205._0_16_);
                      auVar320 = vcmpps_avx(auVar320,auVar320,0xf);
                      auVar325 = ZEXT3264(auVar320);
                      auVar190._8_8_ = uStack_758;
                      auVar190._0_8_ = local_760;
                      auVar154._8_8_ = uStack_748;
                      auVar154._0_8_ = uStack_750;
                    }
                    auVar216 = vpcmpeqd_avx(auVar190,ZEXT816(0) << 0x40);
                    auVar218 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
                    auVar226._16_16_ = auVar218;
                    auVar226._0_16_ = auVar216;
                    auVar320 = auVar325._0_32_ & ~auVar226;
                    if ((((((((auVar320 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar320 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar320 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar320 >> 0x7f,0) == '\0') &&
                          (auVar320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar320 >> 0xbf,0) == '\0') &&
                        (auVar320 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar320[0x1f]) {
                      auVar168._0_4_ = auVar216._0_4_ ^ auVar325._0_4_;
                      auVar168._4_4_ = auVar216._4_4_ ^ auVar325._4_4_;
                      auVar168._8_4_ = auVar216._8_4_ ^ auVar325._8_4_;
                      auVar168._12_4_ = auVar216._12_4_ ^ auVar325._12_4_;
                      auVar168._16_4_ = auVar218._0_4_ ^ auVar325._16_4_;
                      auVar168._20_4_ = auVar218._4_4_ ^ auVar325._20_4_;
                      auVar168._24_4_ = auVar218._8_4_ ^ auVar325._24_4_;
                      auVar168._28_4_ = auVar218._12_4_ ^ auVar325._28_4_;
                    }
                    else {
                      p_Var25 = context->args->filter;
                      if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        auVar320 = ZEXT1632(auVar325._0_16_);
                        auVar386 = ZEXT1664(auVar386._0_16_);
                        (*p_Var25)(&local_830);
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        auVar320 = vcmpps_avx(auVar320,auVar320,0xf);
                        auVar325 = ZEXT3264(auVar320);
                        auVar190._8_8_ = uStack_758;
                        auVar190._0_8_ = local_760;
                        auVar154._8_8_ = uStack_748;
                        auVar154._0_8_ = uStack_750;
                      }
                      auVar216 = vpcmpeqd_avx(auVar190,ZEXT816(0) << 0x40);
                      auVar218 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
                      auVar201._16_16_ = auVar218;
                      auVar201._0_16_ = auVar216;
                      auVar168._0_4_ = auVar216._0_4_ ^ auVar325._0_4_;
                      auVar168._4_4_ = auVar216._4_4_ ^ auVar325._4_4_;
                      auVar168._8_4_ = auVar216._8_4_ ^ auVar325._8_4_;
                      auVar168._12_4_ = auVar216._12_4_ ^ auVar325._12_4_;
                      auVar168._16_4_ = auVar218._0_4_ ^ auVar325._16_4_;
                      auVar168._20_4_ = auVar218._4_4_ ^ auVar325._20_4_;
                      auVar168._24_4_ = auVar218._8_4_ ^ auVar325._24_4_;
                      auVar168._28_4_ = auVar218._12_4_ ^ auVar325._28_4_;
                      auVar320 = auVar325._0_32_ & ~auVar201;
                      if ((((((((auVar320 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar320 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar320 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar320 >> 0x7f,0) != '\0') ||
                            (auVar320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar320 >> 0xbf,0) != '\0') ||
                          (auVar320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar320[0x1f] < '\0') {
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])local_830.hit);
                        *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x20));
                        *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x40));
                        *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x60));
                        *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x80));
                        *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xa0));
                        *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xc0));
                        *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xe0));
                        *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar320;
                        auVar320 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x100));
                        *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar320;
                      }
                    }
                    auVar320 = local_580;
                    if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar168 >> 0x7f,0) == '\0') &&
                          (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar168 >> 0xbf,0) == '\0') &&
                        (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar168[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar205._0_4_;
                    }
                    else {
                      auVar205 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_640 + uVar145 * 4) = 0;
                    auVar216 = vshufps_avx(auVar205._0_16_,auVar205._0_16_,0);
                    auVar169._16_16_ = auVar216;
                    auVar169._0_16_ = auVar216;
                    auVar322 = vcmpps_avx(auVar320,auVar169,2);
                    auVar26 = vandps_avx(auVar322,local_640);
                    local_640 = local_640 & auVar322;
                    if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_640 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_640 >> 0x7f,0) == '\0') &&
                          (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_640 >> 0xbf,0) == '\0') &&
                        (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_640[0x1f]) break;
                    auVar202._8_4_ = 0x7f800000;
                    auVar202._0_8_ = 0x7f8000007f800000;
                    auVar202._12_4_ = 0x7f800000;
                    auVar202._16_4_ = 0x7f800000;
                    auVar202._20_4_ = 0x7f800000;
                    auVar202._24_4_ = 0x7f800000;
                    auVar202._28_4_ = 0x7f800000;
                    auVar320 = vblendvps_avx(auVar202,auVar320,auVar26);
                    auVar322 = vshufps_avx(auVar320,auVar320,0xb1);
                    auVar322 = vminps_avx(auVar320,auVar322);
                    auVar27 = vshufpd_avx(auVar322,auVar322,5);
                    auVar322 = vminps_avx(auVar322,auVar27);
                    auVar27 = vperm2f128_avx(auVar322,auVar322,1);
                    auVar322 = vminps_avx(auVar322,auVar27);
                    auVar322 = vcmpps_avx(auVar320,auVar322,0);
                    auVar27 = auVar26 & auVar322;
                    auVar320 = auVar26;
                    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar27 >> 0x7f,0) != '\0') ||
                          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0xbf,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar27[0x1f] < '\0') {
                      auVar320 = vandps_avx(auVar322,auVar26);
                    }
                    uVar141 = vmovmskps_avx(auVar320);
                    uVar139 = 0;
                    if (uVar141 != 0) {
                      for (; (uVar141 >> uVar139 & 1) == 0; uVar139 = uVar139 + 1) {
                      }
                    }
                    uVar145 = (ulong)uVar139;
                    local_640 = auVar26;
                  }
                  auVar309 = ZEXT3264(_local_6a0);
                  auVar339 = ZEXT3264(local_7a0);
                  auVar148 = local_7c0;
                  fVar150 = (float)local_780._0_4_;
                  fVar172 = (float)local_780._4_4_;
                  fVar174 = fStack_778;
                  fVar177 = fStack_774;
                  fVar278 = fStack_770;
                  fVar287 = fStack_76c;
                  fVar260 = fStack_768;
                  local_37c = local_6c0._0_4_;
                }
              }
              auVar271 = ZEXT3264(auVar398);
              auVar205 = ZEXT3264(local_5e0);
              goto LAB_00ae73b8;
            }
          }
          auVar309 = ZEXT3264(_local_6a0);
          auVar205 = ZEXT3264(local_5e0);
          auVar271 = ZEXT3264(auVar398);
        }
LAB_00ae73b8:
        auVar325 = ZEXT3264(auVar163);
      }
    }
    uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar164._4_4_ = uVar149;
    auVar164._0_4_ = uVar149;
    auVar164._8_4_ = uVar149;
    auVar164._12_4_ = uVar149;
    auVar164._16_4_ = uVar149;
    auVar164._20_4_ = uVar149;
    auVar164._24_4_ = uVar149;
    auVar164._28_4_ = uVar149;
    auVar163 = vcmpps_avx(local_80,auVar164,2);
    uVar139 = vmovmskps_avx(auVar163);
    uVar143 = (ulong)((uint)uVar143 & (uint)uVar143 + 0xff & uVar139);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }